

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_fma::forward
          (Deconvolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *plVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  int *piVar9;
  _func_int **pp_Var10;
  size_t sVar11;
  size_t sVar12;
  _func_int **pp_Var13;
  _func_int *p_Var14;
  Layer *pLVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined4 uVar32;
  undefined4 uVar33;
  Allocator AVar34;
  Allocator AVar35;
  Allocator AVar36;
  Allocator AVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  long lVar40;
  Mat *pMVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  Allocator *pAVar46;
  long lVar47;
  uint uVar48;
  long lVar49;
  long lVar50;
  float *pfVar51;
  int iVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  _func_int *p_Var56;
  int v_2;
  int i;
  int iVar57;
  int iVar58;
  uint uVar59;
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  uint uVar63;
  ulong uVar64;
  ulong uVar65;
  void *pvVar66;
  int y;
  uint uVar67;
  ulong uVar68;
  int y_3;
  uint _elempack;
  int iVar69;
  float *pfVar70;
  void *pvVar71;
  void *pvVar72;
  Allocator *pAVar73;
  int i_1;
  ulong uVar74;
  long lVar75;
  int iVar76;
  undefined1 (*pauVar77) [16];
  int iVar78;
  int iVar79;
  float fVar80;
  float fVar81;
  undefined4 uVar82;
  __m128 one;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  __m128 pos;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [28];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar172 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar190 [16];
  undefined1 auVar252 [32];
  float fVar253;
  float fVar254;
  undefined1 auVar255 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar256 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [64];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [64];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [64];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [64];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [64];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [64];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [64];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [64];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [32];
  undefined1 auVar494 [32];
  undefined1 auVar495 [32];
  undefined1 auVar496 [32];
  undefined1 auVar497 [32];
  undefined1 auVar499 [36];
  undefined1 auVar498 [64];
  long lStackY_290;
  Allocator *local_220;
  Allocator *local_1f8;
  Allocator *local_1f0;
  Mat local_1a8;
  ulong local_160;
  int local_158;
  int local_154;
  _func_int **local_150;
  Option *local_148;
  long local_140;
  Mat *local_138;
  Allocator *local_130;
  long local_128;
  ulong local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined4 local_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  int local_90;
  size_t local_88;
  Option opt_b;
  undefined1 auVar98 [32];
  undefined1 auVar101 [32];
  undefined1 auVar143 [32];
  undefined1 auVar152 [32];
  undefined1 auVar166 [32];
  undefined1 auVar246 [32];
  
  iVar78 = bottom_blob->w;
  iVar79 = bottom_blob->h;
  uVar54 = bottom_blob->elemsize;
  local_160 = (ulong)bottom_blob->elempack;
  p_Var56 = this->_vptr_Deconvolution_x86_fma[-3];
  uVar7 = *(uint *)(&this->field_0xd0 + (long)p_Var56);
  if (opt->use_packing_layout == true) {
    _elempack = 8;
    if ((uVar7 & 7) != 0) {
      _elempack = (uint)((uVar7 & 3) == 0) * 3 + 1;
    }
  }
  else {
    _elempack = 1;
  }
  local_154 = (*(int *)(&this->field_0xd4 + (long)p_Var56) + -1) *
              *(int *)(&this->field_0xdc + (long)p_Var56);
  iVar57 = *(int *)(&this->field_0xe4 + (long)p_Var56);
  local_158 = (*(int *)(&this->field_0xd8 + (long)p_Var56) + -1) *
              *(int *)(&this->field_0xe0 + (long)p_Var56);
  iVar52 = *(int *)(&this->field_0xe8 + (long)p_Var56);
  iVar58 = *(int *)(&this->field_0xfc + (long)p_Var56);
  iVar69 = *(int *)(&this->field_0x100 + (long)p_Var56);
  uVar60 = (long)(int)uVar7 / (long)(int)_elempack & 0xffffffff;
  local_1a8.cstep = 0;
  local_1a8.data = (Allocator *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1a8.elempack = 0;
  local_1a8.h = 0;
  p_Var56 = this->_vptr_Deconvolution_x86_fma[-3];
  lStackY_290 = 0x10;
  local_1a8.allocator = (Allocator *)local_1a8.data;
  local_1a8.dims = (int)local_1a8.refcount;
  local_1a8.w = local_1a8.refcount._4_4_;
  local_1a8.d = (int)local_1a8.refcount;
  local_1a8.c = local_1a8.elempack;
  if ((((((*(int *)(&this->field_0xec + (long)p_Var56) < 1) &&
         (*(int *)(&this->field_0xf0 + (long)p_Var56) < 1)) &&
        (*(int *)(&this->field_0xf4 + (long)p_Var56) < 1)) &&
       (*(int *)(&this->field_0xf8 + (long)p_Var56) < 1)) &&
      ((*(int *)(&this->field_0x104 + (long)p_Var56) < 1 ||
       (*(int *)(&this->field_0x108 + (long)p_Var56) < 1)))) &&
     (lStackY_290 = 8, &local_1a8 != top_blob)) {
    piVar9 = top_blob->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    lStackY_290 = 8;
    local_1a8.data = top_blob->data;
    local_1a8.refcount._0_4_ = (int)top_blob->refcount;
    local_1a8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
    local_1a8.elemsize = top_blob->elemsize;
    local_1a8.elempack = top_blob->elempack;
    local_1a8.allocator = top_blob->allocator;
    uVar3 = top_blob->dims;
    uVar4 = top_blob->w;
    uVar5 = top_blob->h;
    uVar6 = top_blob->d;
    local_1a8.c = top_blob->c;
    local_1a8.cstep = top_blob->cstep;
    local_1a8.dims = uVar3;
    local_1a8.w = uVar4;
    local_1a8.h = uVar5;
    local_1a8.d = uVar6;
  }
  iVar76 = (iVar78 + -1) * iVar57 + local_154 + iVar58 + 1;
  iVar58 = (int)((long)(int)uVar7 / (long)(int)_elempack);
  local_148 = opt;
  local_138 = top_blob;
  Mat::create(&local_1a8,iVar76,iVar69 + (iVar79 + -1) * iVar52 + local_158 + 1,iVar58,
              (uVar54 / local_160) * (ulong)_elempack,_elempack,
              *(Allocator **)(&opt->lightmode + lStackY_290));
  iVar57 = -100;
  if (((Allocator *)local_1a8.data != (Allocator *)0x0) &&
     (local_1a8.cstep * (long)local_1a8.c != 0)) {
    local_150 = this->_vptr_Deconvolution_x86_fma;
    p_Var56 = local_150[-3];
    uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
    uVar8 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
    local_140 = (long)(int)(uVar8 * uVar7);
    if (local_148->use_sgemm_convolution == true) {
      piVar9 = bottom_blob->refcount;
      local_c8 = bottom_blob->data;
      piStack_c0 = bottom_blob->refcount;
      local_b8 = bottom_blob->elemsize;
      local_b0 = bottom_blob->elempack;
      local_a8 = bottom_blob->allocator;
      iVar57 = bottom_blob->h;
      iVar52 = bottom_blob->w;
      uVar32 = bottom_blob->dims;
      uVar33 = bottom_blob->d;
      local_90 = bottom_blob->c;
      local_88 = bottom_blob->cstep;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
        iVar52 = bottom_blob->w;
        iVar57 = bottom_blob->h;
      }
      local_d8 = 0;
      _local_a0 = CONCAT44(iVar57 * iVar52,uVar32);
      _uStack_98 = CONCAT44(uVar33,1);
      local_118 = (long *)0x0;
      uStack_110 = 0;
      iStack_10c = 0;
      local_108 = 0;
      uStack_100 = 0;
      auStack_e8 = SUB1612(ZEXT816(0),0);
      opt_b.lightmode = local_148->lightmode;
      opt_b._1_3_ = *(undefined3 *)&local_148->field_0x1;
      opt_b.num_threads = local_148->num_threads;
      opt_b.workspace_allocator = local_148->workspace_allocator;
      opt_b.openmp_blocktime = local_148->openmp_blocktime;
      opt_b.use_winograd_convolution = local_148->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_148->use_sgemm_convolution;
      opt_b.use_int8_inference = local_148->use_int8_inference;
      opt_b.use_vulkan_compute = local_148->use_vulkan_compute;
      opt_b.use_bf16_storage = local_148->use_bf16_storage;
      opt_b.use_fp16_packed = local_148->use_fp16_packed;
      opt_b.use_fp16_storage = local_148->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_148->use_fp16_arithmetic;
      opt_b.use_int8_packed = local_148->use_int8_packed;
      opt_b.use_int8_storage = local_148->use_int8_storage;
      opt_b.use_int8_arithmetic = local_148->use_int8_arithmetic;
      opt_b.use_packing_layout = local_148->use_packing_layout;
      opt_b.use_shader_pack8 = local_148->use_shader_pack8;
      opt_b.use_subgroup_basic = local_148->use_subgroup_basic;
      opt_b.use_subgroup_vote = local_148->use_subgroup_vote;
      opt_b.use_subgroup_ballot = local_148->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = local_148->use_subgroup_shuffle;
      opt_b.use_image_storage = local_148->use_image_storage;
      opt_b.use_tensor_storage = local_148->use_tensor_storage;
      opt_b.use_reserved_0 = local_148->use_reserved_0;
      opt_b.flush_denormals = local_148->flush_denormals;
      opt_b.use_local_pool_allocator = local_148->use_local_pool_allocator;
      opt_b.use_shader_local_memory = local_148->use_shader_local_memory;
      opt_b.use_cooperative_matrix = local_148->use_cooperative_matrix;
      opt_b.use_winograd23_convolution = local_148->use_winograd23_convolution;
      opt_b.use_winograd43_convolution = local_148->use_winograd43_convolution;
      opt_b.use_winograd63_convolution = local_148->use_winograd63_convolution;
      opt_b.use_a53_a55_optimized_kernel = local_148->use_a53_a55_optimized_kernel;
      opt_b.use_reserved_7 = local_148->use_reserved_7;
      opt_b.use_reserved_8 = local_148->use_reserved_8;
      opt_b.use_reserved_9 = local_148->use_reserved_9;
      opt_b.use_reserved_10 = local_148->use_reserved_10;
      opt_b.use_reserved_11 = local_148->use_reserved_11;
      opt_b.blob_allocator = local_1a8.allocator;
      local_f8 = local_118;
      uStack_f0 = uStack_110;
      iStack_ec = iStack_10c;
      (*this->gemm->_vptr_Layer[7])();
      pp_Var10 = this->_vptr_Deconvolution_x86_fma;
      p_Var56 = pp_Var10[-3];
      lVar61 = (long)(int)((iVar76 * *(int *)(&this->field_0xe8 + (long)p_Var56) -
                           *(int *)(&this->field_0xe4 + (long)p_Var56) * iVar78) * _elempack);
      if (_elempack == 1) {
        if (iVar78 < 1) {
          iVar78 = 0;
        }
        if (iVar79 < 1) {
          iVar79 = 0;
        }
        if (iVar58 < 1) {
          uVar60 = 0;
        }
        lVar49 = (long)local_1a8.h * (long)local_1a8.w;
        pp_Var10 = this->_vptr_Deconvolution_x86_fma;
        pAVar73 = (Allocator *)local_1a8.data;
        for (uVar54 = 0; uVar54 != uVar60; uVar54 = uVar54 + 1) {
          iVar57 = (int)((local_1a8.elemsize * lVar49 + 0xf & 0xfffffffffffffff0) /
                        local_1a8.elemsize);
          if (local_1a8.dims == 4) {
            iVar57 = (int)lVar49;
          }
          p_Var56 = pp_Var10[-3];
          uVar82 = 0;
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var56) != 0) &&
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var56) *
              *(long *)(&this->field_0x1e8 + (long)p_Var56) != 0)) {
            uVar82 = *(undefined4 *)(*(long *)(&this->field_0x1a8 + (long)p_Var56) + uVar54 * 4);
          }
          pfVar70 = (float *)(uVar54 * iStack_ec * local_108 * local_140 + (long)local_118);
          iVar57 = iVar57 * local_1a8.d;
          if (iVar57 < 1) {
            iVar57 = 0;
          }
          for (lVar50 = 0; iVar57 != (int)lVar50; lVar50 = lVar50 + 1) {
            *(undefined4 *)((long)&pAVar73->_vptr_Allocator + lVar50 * 4) = uVar82;
          }
          p_Var56 = pp_Var10[-3];
          for (iVar57 = 0; iVar57 < *(int *)(&this->field_0xd8 + (long)p_Var56); iVar57 = iVar57 + 1
              ) {
            for (iVar52 = 0; iVar52 < *(int *)(&this->field_0xd4 + (long)p_Var56);
                iVar52 = iVar52 + 1) {
              pfVar51 = (float *)((long)(_func_int ***)local_1a8.data +
                                 (long)iVar52 * (long)*(int *)(&this->field_0xdc + (long)p_Var56) *
                                 4 + (long)iVar57 *
                                     (long)*(int *)(&this->field_0xe0 + (long)p_Var56) *
                                     (long)local_1a8.w * local_1a8.elemsize +
                                     local_1a8.cstep * local_1a8.elemsize * uVar54);
              for (iVar58 = 0; iVar69 = iVar78, iVar58 != iVar79; iVar58 = iVar58 + 1) {
                while (iVar69 != 0) {
                  *pfVar51 = *pfVar51 + *pfVar70;
                  p_Var56 = pp_Var10[-3];
                  pfVar51 = pfVar51 + *(int *)(&this->field_0xe4 + (long)p_Var56);
                  pfVar70 = pfVar70 + 1;
                  iVar69 = iVar69 + -1;
                }
                pfVar51 = pfVar51 + lVar61;
              }
            }
          }
          pAVar73 = (Allocator *)
                    ((long)&pAVar73->_vptr_Allocator + local_1a8.cstep * local_1a8.elemsize);
        }
      }
      else if (_elempack == 4) {
        if (iVar78 < 1) {
          iVar78 = 0;
        }
        if (iVar79 < 1) {
          iVar79 = 0;
        }
        if (iVar58 < 1) {
          uVar60 = 0;
        }
        for (uVar54 = 0; uVar54 != uVar60; uVar54 = uVar54 + 1) {
          pfVar70 = (float *)((long)iStack_ec * uVar54 * local_140 * local_108 + (long)local_118);
          pAVar73 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * uVar54 * local_1a8.elemsize);
          uVar64 = (long)local_1a8.h * (long)local_1a8.w;
          uVar74 = (local_1a8.elemsize * uVar64 + 0xf & 0xfffffffffffffff0) / local_1a8.elemsize;
          if (local_1a8.dims == 4) {
            uVar74 = uVar64;
          }
          p_Var56 = pp_Var10[-3];
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var56) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var56) *
              *(long *)(&this->field_0x1e8 + (long)p_Var56) == 0)) {
            iVar57 = local_1a8.d * (int)uVar74;
            pAVar46 = pAVar73;
            if (iVar57 < 1) {
              iVar57 = 0;
            }
            while (iVar57 != 0) {
              pAVar46->_vptr_Allocator = (_func_int **)0x0;
              pAVar46[1]._vptr_Allocator = (_func_int **)0x0;
              pAVar46 = pAVar46 + 2;
              iVar57 = iVar57 + -1;
            }
          }
          else {
            auVar113 = *(undefined1 (*) [16])
                        (*(long *)(&this->field_0x1a8 + (long)p_Var56) + uVar54 * 0x10);
            iVar57 = local_1a8.d * (int)uVar74;
            pAVar46 = pAVar73;
            if (iVar57 < 1) {
              iVar57 = 0;
            }
            while (iVar57 != 0) {
              *(undefined1 (*) [16])pAVar46 = auVar113;
              pAVar46 = pAVar46 + 2;
              iVar57 = iVar57 + -1;
            }
          }
          p_Var56 = pp_Var10[-3];
          for (iVar57 = 0; iVar57 < *(int *)(&this->field_0xd8 + (long)p_Var56); iVar57 = iVar57 + 1
              ) {
            for (iVar52 = 0; iVar52 < *(int *)(&this->field_0xd4 + (long)p_Var56);
                iVar52 = iVar52 + 1) {
              pauVar77 = (undefined1 (*) [16])
                         ((long)&pAVar73->_vptr_Allocator +
                         (long)(*(int *)(&this->field_0xdc + (long)p_Var56) * iVar52 * 4) * 4 +
                         (long)iVar57 * (long)*(int *)(&this->field_0xe0 + (long)p_Var56) *
                         local_1a8.elemsize * (long)local_1a8.w);
              for (iVar58 = 0; iVar69 = iVar78, iVar58 != iVar79; iVar58 = iVar58 + 1) {
                while (iVar69 != 0) {
                  auVar140._0_4_ = *pfVar70 + *(float *)*pauVar77;
                  auVar140._4_4_ = pfVar70[1] + *(float *)(*pauVar77 + 4);
                  auVar140._8_4_ = pfVar70[2] + *(float *)(*pauVar77 + 8);
                  auVar140._12_4_ = pfVar70[3] + *(float *)(*pauVar77 + 0xc);
                  *pauVar77 = auVar140;
                  p_Var56 = pp_Var10[-3];
                  pauVar77 = pauVar77 + *(int *)(&this->field_0xe4 + (long)p_Var56);
                  pfVar70 = pfVar70 + 4;
                  iVar69 = iVar69 + -1;
                }
                pauVar77 = (undefined1 (*) [16])(*pauVar77 + lVar61 * 4);
              }
            }
          }
        }
      }
      else if (_elempack == 8) {
        if (iVar78 < 1) {
          iVar78 = 0;
        }
        if (iVar79 < 1) {
          iVar79 = 0;
        }
        if (iVar58 < 1) {
          uVar60 = 0;
        }
        for (uVar54 = 0; uVar54 != uVar60; uVar54 = uVar54 + 1) {
          pfVar70 = (float *)((long)iStack_ec * uVar54 * local_140 * local_108 + (long)local_118);
          pAVar73 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data +
                    local_1a8.cstep * uVar54 * local_1a8.elemsize);
          uVar64 = (long)local_1a8.h * (long)local_1a8.w;
          uVar74 = (local_1a8.elemsize * uVar64 + 0xf & 0xfffffffffffffff0) / local_1a8.elemsize;
          if (local_1a8.dims == 4) {
            uVar74 = uVar64;
          }
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var56) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var56) *
              *(long *)(&this->field_0x1e8 + (long)p_Var56) == 0)) {
            iVar57 = local_1a8.d * (int)uVar74;
            pAVar46 = pAVar73;
            if (iVar57 < 1) {
              iVar57 = 0;
            }
            while (iVar57 != 0) {
              pAVar46->_vptr_Allocator = (_func_int **)0x0;
              pAVar46[1]._vptr_Allocator = (_func_int **)0x0;
              pAVar46[2]._vptr_Allocator = (_func_int **)0x0;
              pAVar46[3]._vptr_Allocator = (_func_int **)0x0;
              pAVar46 = pAVar46 + 4;
              iVar57 = iVar57 + -1;
            }
          }
          else {
            plVar1 = (long *)(*(long *)(&this->field_0x1a8 + (long)p_Var56) + uVar54 * 0x20);
            AVar34._vptr_Allocator = (_func_int **)*plVar1;
            AVar35._vptr_Allocator = (_func_int **)plVar1[1];
            AVar36._vptr_Allocator = (_func_int **)plVar1[2];
            AVar37._vptr_Allocator = (_func_int **)plVar1[3];
            iVar57 = local_1a8.d * (int)uVar74;
            pAVar46 = pAVar73;
            if (iVar57 < 1) {
              iVar57 = 0;
            }
            while (iVar57 != 0) {
              pAVar46->_vptr_Allocator = AVar34._vptr_Allocator;
              pAVar46[1]._vptr_Allocator = AVar35._vptr_Allocator;
              pAVar46[2]._vptr_Allocator = AVar36._vptr_Allocator;
              pAVar46[3]._vptr_Allocator = AVar37._vptr_Allocator;
              pAVar46 = pAVar46 + 4;
              iVar57 = iVar57 + -1;
            }
          }
          p_Var56 = pp_Var10[-3];
          for (iVar57 = 0; iVar57 < *(int *)(&this->field_0xd8 + (long)p_Var56); iVar57 = iVar57 + 1
              ) {
            for (iVar52 = 0; iVar52 < *(int *)(&this->field_0xd4 + (long)p_Var56);
                iVar52 = iVar52 + 1) {
              pfVar51 = (float *)((long)&pAVar73->_vptr_Allocator +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var56) * iVar52 * 8) *
                                 4 + (long)iVar57 *
                                     (long)*(int *)(&this->field_0xe0 + (long)p_Var56) *
                                     local_1a8.elemsize * (long)local_1a8.w);
              for (iVar58 = 0; iVar69 = iVar78, iVar58 != iVar79; iVar58 = iVar58 + 1) {
                while (iVar69 != 0) {
                  fVar81 = pfVar70[1];
                  fVar80 = pfVar70[2];
                  fVar2 = pfVar70[3];
                  fVar253 = pfVar70[4];
                  fVar254 = pfVar70[5];
                  fVar16 = pfVar70[6];
                  fVar17 = pfVar70[7];
                  *pfVar51 = *pfVar70 + *pfVar51;
                  pfVar51[1] = fVar81 + pfVar51[1];
                  pfVar51[2] = fVar80 + pfVar51[2];
                  pfVar51[3] = fVar2 + pfVar51[3];
                  pfVar51[4] = fVar253 + pfVar51[4];
                  pfVar51[5] = fVar254 + pfVar51[5];
                  pfVar51[6] = fVar16 + pfVar51[6];
                  pfVar51[7] = fVar17 + pfVar51[7];
                  p_Var56 = pp_Var10[-3];
                  pfVar51 = pfVar51 + (long)*(int *)(&this->field_0xe4 + (long)p_Var56) * 8;
                  pfVar70 = pfVar70 + 8;
                  iVar69 = iVar69 + -1;
                }
                pfVar51 = pfVar51 + lVar61;
              }
            }
          }
        }
      }
      pLVar15 = this->activation;
      if (pLVar15 != (Layer *)0x0) {
        (*pLVar15->_vptr_Layer[9])(pLVar15,&local_1a8,local_148);
      }
      piVar9 = (int *)CONCAT44(iStack_10c,uStack_110);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_f8 == (long *)0x0) {
            free(local_118);
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      if (piStack_c0 != (int *)0x0) {
        LOCK();
        *piStack_c0 = *piStack_c0 + -1;
        UNLOCK();
        if (*piStack_c0 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            free(local_c8);
          }
          else {
            (*local_a8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      if (((int)local_160 == 8) && (_elempack == 8)) {
        iVar78 = *(int *)(&this->field_0xdc + (long)p_Var56);
        iVar79 = *(int *)(&this->field_0xe0 + (long)p_Var56);
        iVar57 = *(int *)(&this->field_0xe4 + (long)p_Var56);
        iVar52 = *(int *)(&this->field_0xe8 + (long)p_Var56);
        iVar58 = *(int *)(&this->field_0x114 + (long)p_Var56);
        lVar61 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
        uVar54 = 0;
        uVar60 = 0;
        if (0 < (int)uVar7) {
          uVar60 = (ulong)uVar7;
        }
        uVar74 = 0;
        if (0 < (int)uVar8) {
          uVar74 = (ulong)uVar8;
        }
        uVar64 = (ulong)(uint)local_1a8.c;
        if (local_1a8.c < 1) {
          uVar64 = uVar54;
        }
        auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar332 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar377 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar478._8_4_ = 0x3e2aaaaa;
        auVar478._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar478._12_4_ = 0x3e2aaaaa;
        auVar478._16_4_ = 0x3e2aaaaa;
        auVar478._20_4_ = 0x3e2aaaaa;
        auVar478._24_4_ = 0x3e2aaaaa;
        auVar478._28_4_ = 0x3e2aaaaa;
        auVar113._8_4_ = 0x3f800000;
        auVar113._0_8_ = 0x3f8000003f800000;
        auVar113._12_4_ = 0x3f800000;
        for (; uVar54 != uVar64; uVar54 = uVar54 + 1) {
          local_220 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * uVar54 * local_1a8.elemsize);
          iVar69 = bottom_blob->w;
          iVar76 = bottom_blob->h;
          uVar48 = 0;
          uVar53 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar53 = 0;
          }
          uVar59 = local_1a8.w;
          if (local_1a8.w < 1) {
            uVar59 = 0;
          }
          uVar63 = local_1a8.h;
          if (local_1a8.h < 1) {
            uVar63 = 0;
          }
          for (; uVar48 != uVar63; uVar48 = uVar48 + 1) {
            iVar45 = (1 - uVar7) * iVar78;
            for (uVar67 = 0; uVar67 != uVar59; uVar67 = uVar67 + 1) {
              if (lVar61 == 0) {
                auVar171 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar171 = ZEXT3264(*(undefined1 (*) [32])(lVar61 + uVar54 * 0x20));
              }
              pvVar71 = bottom_blob->data;
              lVar49 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar54 * (this->weight_data_tm).elemsize +
                       0xe0;
              for (uVar55 = 0; uVar55 != uVar53; uVar55 = uVar55 + 1) {
                lVar50 = lVar49;
                for (uVar68 = 0; uVar68 != uVar74; uVar68 = uVar68 + 1) {
                  iVar42 = (((int)uVar68 - uVar8) + 1) * iVar79 + uVar48;
                  if (((-1 < iVar42) && (iVar43 = iVar42 / iVar52, iVar42 % iVar52 == 0)) &&
                     (iVar43 < iVar76)) {
                    lVar40 = (long)iVar43 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar55;
                    iVar42 = iVar45;
                    for (lVar75 = 0; uVar60 * 0x100 != lVar75; lVar75 = lVar75 + 0x100) {
                      if (((-1 < iVar42) && (iVar43 = iVar42 / iVar57, iVar42 % iVar57 == 0)) &&
                         (iVar43 < iVar69)) {
                        lVar47 = (long)(iVar43 << 3);
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40);
                        auVar151._4_4_ = uVar82;
                        auVar151._0_4_ = uVar82;
                        auVar151._8_4_ = uVar82;
                        auVar151._12_4_ = uVar82;
                        auVar151._16_4_ = uVar82;
                        auVar151._20_4_ = uVar82;
                        auVar151._24_4_ = uVar82;
                        auVar151._28_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 4);
                        auVar142._4_4_ = uVar82;
                        auVar142._0_4_ = uVar82;
                        auVar142._8_4_ = uVar82;
                        auVar142._12_4_ = uVar82;
                        auVar142._16_4_ = uVar82;
                        auVar142._20_4_ = uVar82;
                        auVar142._24_4_ = uVar82;
                        auVar142._28_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 8);
                        auVar96._4_4_ = uVar82;
                        auVar96._0_4_ = uVar82;
                        auVar96._8_4_ = uVar82;
                        auVar96._12_4_ = uVar82;
                        auVar96._16_4_ = uVar82;
                        auVar96._20_4_ = uVar82;
                        auVar96._24_4_ = uVar82;
                        auVar96._28_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0xc);
                        auVar435._4_4_ = uVar82;
                        auVar435._0_4_ = uVar82;
                        auVar435._8_4_ = uVar82;
                        auVar435._12_4_ = uVar82;
                        auVar435._16_4_ = uVar82;
                        auVar435._20_4_ = uVar82;
                        auVar435._24_4_ = uVar82;
                        auVar435._28_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0x10);
                        auVar449._4_4_ = uVar82;
                        auVar449._0_4_ = uVar82;
                        auVar449._8_4_ = uVar82;
                        auVar449._12_4_ = uVar82;
                        auVar449._16_4_ = uVar82;
                        auVar449._20_4_ = uVar82;
                        auVar449._24_4_ = uVar82;
                        auVar449._28_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0x14);
                        auVar493._4_4_ = uVar82;
                        auVar493._0_4_ = uVar82;
                        auVar493._8_4_ = uVar82;
                        auVar493._12_4_ = uVar82;
                        auVar493._16_4_ = uVar82;
                        auVar493._20_4_ = uVar82;
                        auVar493._24_4_ = uVar82;
                        auVar493._28_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0x18);
                        auVar161._4_4_ = uVar82;
                        auVar161._0_4_ = uVar82;
                        auVar161._8_4_ = uVar82;
                        auVar161._12_4_ = uVar82;
                        auVar161._16_4_ = uVar82;
                        auVar161._20_4_ = uVar82;
                        auVar161._24_4_ = uVar82;
                        auVar161._28_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0x1c);
                        auVar471._4_4_ = uVar82;
                        auVar471._0_4_ = uVar82;
                        auVar471._8_4_ = uVar82;
                        auVar471._12_4_ = uVar82;
                        auVar471._16_4_ = uVar82;
                        auVar471._20_4_ = uVar82;
                        auVar471._24_4_ = uVar82;
                        auVar471._28_4_ = uVar82;
                        auVar255 = vfmadd231ps_fma(auVar171._0_32_,auVar151,
                                                   *(undefined1 (*) [32])(lVar50 + -0xe0 + lVar75));
                        auVar255 = vfmadd231ps_fma(ZEXT1632(auVar255),auVar142,
                                                   *(undefined1 (*) [32])(lVar50 + -0xc0 + lVar75));
                        auVar255 = vfmadd231ps_fma(ZEXT1632(auVar255),auVar96,
                                                   *(undefined1 (*) [32])(lVar50 + -0xa0 + lVar75));
                        auVar255 = vfmadd231ps_fma(ZEXT1632(auVar255),auVar435,
                                                   *(undefined1 (*) [32])(lVar50 + -0x80 + lVar75));
                        auVar255 = vfmadd231ps_fma(ZEXT1632(auVar255),auVar449,
                                                   *(undefined1 (*) [32])(lVar50 + -0x60 + lVar75));
                        auVar255 = vfmadd231ps_fma(ZEXT1632(auVar255),auVar493,
                                                   *(undefined1 (*) [32])(lVar50 + -0x40 + lVar75));
                        auVar255 = vfmadd231ps_fma(ZEXT1632(auVar255),auVar161,
                                                   *(undefined1 (*) [32])(lVar50 + -0x20 + lVar75));
                        auVar255 = vfmadd231ps_fma(ZEXT1632(auVar255),auVar471,
                                                   *(undefined1 (*) [32])(lVar50 + lVar75));
                        auVar171 = ZEXT1664(auVar255);
                      }
                      iVar42 = iVar42 + iVar78;
                    }
                  }
                  lVar50 = lVar50 + (long)(int)uVar7 * 0x100;
                }
                lVar49 = lVar49 + (long)(int)(uVar7 * uVar8 * 0x40) * 4;
              }
              auVar151 = auVar171._0_32_;
              if (5 < iVar58 - 1U) goto LAB_0025dd85;
              auVar96 = auVar103._0_32_;
              auVar142 = vmaxps_avx(auVar151,auVar96);
              auVar499 = ZEXT436(auVar142._28_4_);
              auVar449 = auVar377._0_32_;
              auVar435 = auVar332._0_32_;
              fVar81 = auVar377._0_4_;
              fVar80 = auVar377._4_4_;
              fVar2 = auVar377._8_4_;
              fVar253 = auVar377._12_4_;
              fVar254 = auVar377._16_4_;
              fVar16 = auVar377._20_4_;
              fVar17 = auVar377._24_4_;
              fVar18 = auVar377._28_4_;
              switch(iVar58) {
              case 2:
                auVar151 = vminps_avx(auVar151,auVar96);
                uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                auVar220._4_4_ = uVar82;
                auVar220._0_4_ = uVar82;
                auVar220._8_4_ = uVar82;
                auVar220._12_4_ = uVar82;
                auVar220._16_4_ = uVar82;
                auVar220._20_4_ = uVar82;
                auVar220._24_4_ = uVar82;
                auVar220._28_4_ = uVar82;
                auVar255 = vfmadd231ps_fma(auVar142,auVar151,auVar220);
                auVar142 = ZEXT1632(auVar255);
                break;
              case 3:
                uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                auVar227._4_4_ = uVar82;
                auVar227._0_4_ = uVar82;
                auVar227._8_4_ = uVar82;
                auVar227._12_4_ = uVar82;
                auVar227._16_4_ = uVar82;
                auVar227._20_4_ = uVar82;
                auVar227._24_4_ = uVar82;
                auVar227._28_4_ = uVar82;
                uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                auVar495._4_4_ = uVar82;
                auVar495._0_4_ = uVar82;
                auVar495._8_4_ = uVar82;
                auVar495._12_4_ = uVar82;
                auVar495._16_4_ = uVar82;
                auVar495._20_4_ = uVar82;
                auVar495._24_4_ = uVar82;
                auVar495._28_4_ = uVar82;
                auVar151 = vmaxps_avx(auVar151,auVar227);
                auVar142 = vminps_avx(auVar495,auVar151);
                break;
              case 4:
                auVar141._0_8_ = auVar171._0_8_ ^ 0x8000000080000000;
                auVar141._8_4_ = -auVar171._8_4_;
                auVar141._12_4_ = -auVar171._12_4_;
                auVar141._16_4_ = -auVar171._16_4_;
                auVar141._20_4_ = -auVar171._20_4_;
                auVar141._24_4_ = -auVar171._24_4_;
                auVar141._28_4_ = auVar171._28_4_ ^ 0x80000000;
                auVar228._8_4_ = 0x42b0c0a5;
                auVar228._0_8_ = 0x42b0c0a542b0c0a5;
                auVar228._12_4_ = 0x42b0c0a5;
                auVar228._16_4_ = 0x42b0c0a5;
                auVar228._20_4_ = 0x42b0c0a5;
                auVar228._24_4_ = 0x42b0c0a5;
                auVar228._28_4_ = 0x42b0c0a5;
                auVar151 = vminps_avx(auVar141,auVar228);
                auVar229._8_4_ = 0xc2b0c0a5;
                auVar229._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar229._12_4_ = 0xc2b0c0a5;
                auVar229._16_4_ = 0xc2b0c0a5;
                auVar229._20_4_ = 0xc2b0c0a5;
                auVar229._24_4_ = 0xc2b0c0a5;
                auVar229._28_4_ = 0xc2b0c0a5;
                auVar142 = vmaxps_avx(auVar151,auVar229);
                auVar230._8_4_ = 0x3fb8aa3b;
                auVar230._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar230._12_4_ = 0x3fb8aa3b;
                auVar230._16_4_ = 0x3fb8aa3b;
                auVar230._20_4_ = 0x3fb8aa3b;
                auVar230._24_4_ = 0x3fb8aa3b;
                auVar230._28_4_ = 0x3fb8aa3b;
                auVar255 = vfmadd213ps_fma(auVar230,auVar142,auVar435);
                auVar96 = vroundps_avx(ZEXT1632(auVar255),1);
                auVar151 = vcmpps_avx(ZEXT1632(auVar255),auVar96,1);
                auVar151 = vandps_avx(auVar151,auVar449);
                auVar151 = vsubps_avx(auVar96,auVar151);
                auVar267._8_4_ = 0x3f318000;
                auVar267._0_8_ = 0x3f3180003f318000;
                auVar267._12_4_ = 0x3f318000;
                auVar267._16_4_ = 0x3f318000;
                auVar267._20_4_ = 0x3f318000;
                auVar267._24_4_ = 0x3f318000;
                auVar267._28_4_ = 0x3f318000;
                auVar255 = vfmsub231ps_fma(auVar142,auVar151,auVar267);
                auVar268._8_4_ = 0x395e8083;
                auVar268._0_8_ = 0x395e8083395e8083;
                auVar268._12_4_ = 0x395e8083;
                auVar268._16_4_ = 0x395e8083;
                auVar268._20_4_ = 0x395e8083;
                auVar268._24_4_ = 0x395e8083;
                auVar268._28_4_ = 0x395e8083;
                auVar414 = vfmsub231ps_fma(ZEXT1632(auVar255),auVar151,auVar268);
                auVar142 = ZEXT1632(auVar414);
                auVar22._28_4_ = auVar96._28_4_;
                auVar22._0_28_ =
                     ZEXT1628(CONCAT412(auVar414._12_4_ * auVar414._12_4_,
                                        CONCAT48(auVar414._8_4_ * auVar414._8_4_,
                                                 CONCAT44(auVar414._4_4_ * auVar414._4_4_,
                                                          auVar414._0_4_ * auVar414._0_4_))));
                auVar439._8_4_ = 0x39506967;
                auVar439._0_8_ = 0x3950696739506967;
                auVar439._12_4_ = 0x39506967;
                auVar439._16_4_ = 0x39506967;
                auVar439._20_4_ = 0x39506967;
                auVar439._24_4_ = 0x39506967;
                auVar439._28_4_ = 0x39506967;
                auVar269._8_4_ = 0x3ab743ce;
                auVar269._0_8_ = 0x3ab743ce3ab743ce;
                auVar269._12_4_ = 0x3ab743ce;
                auVar269._16_4_ = 0x3ab743ce;
                auVar269._20_4_ = 0x3ab743ce;
                auVar269._24_4_ = 0x3ab743ce;
                auVar269._28_4_ = 0x3ab743ce;
                auVar255 = vfmadd213ps_fma(auVar439,auVar142,auVar269);
                auVar270._8_4_ = 0x3c088908;
                auVar270._0_8_ = 0x3c0889083c088908;
                auVar270._12_4_ = 0x3c088908;
                auVar270._16_4_ = 0x3c088908;
                auVar270._20_4_ = 0x3c088908;
                auVar270._24_4_ = 0x3c088908;
                auVar270._28_4_ = 0x3c088908;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar270);
                auVar271._8_4_ = 0x3d2aa9c1;
                auVar271._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar271._12_4_ = 0x3d2aa9c1;
                auVar271._16_4_ = 0x3d2aa9c1;
                auVar271._20_4_ = 0x3d2aa9c1;
                auVar271._24_4_ = 0x3d2aa9c1;
                auVar271._28_4_ = 0x3d2aa9c1;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar271);
                auVar272._8_4_ = 0x3e2aaaaa;
                auVar272._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar272._12_4_ = 0x3e2aaaaa;
                auVar272._16_4_ = 0x3e2aaaaa;
                auVar272._20_4_ = 0x3e2aaaaa;
                auVar272._24_4_ = 0x3e2aaaaa;
                auVar272._28_4_ = 0x3e2aaaaa;
                auVar142 = ZEXT1632(auVar414);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar272);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar435);
                auVar387 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar22,auVar142);
                auVar105._0_4_ = (int)auVar151._0_4_;
                auVar105._4_4_ = (int)auVar151._4_4_;
                auVar105._8_4_ = (int)auVar151._8_4_;
                auVar105._12_4_ = (int)auVar151._12_4_;
                auVar143._16_4_ = (int)auVar151._16_4_;
                auVar143._0_16_ = auVar105;
                auVar143._20_4_ = (int)auVar151._20_4_;
                auVar143._24_4_ = (int)auVar151._24_4_;
                auVar143._28_4_ = (int)auVar151._28_4_;
                auVar414 = vpslld_avx(auVar105,0x17);
                auVar255 = vpslld_avx(auVar143._16_16_,0x17);
                auVar256._8_4_ = 0x3f800000;
                auVar256._0_8_ = 0x3f8000003f800000;
                auVar256._12_4_ = 0x3f800000;
                auVar255 = vpaddd_avx(auVar255,auVar256);
                auVar414 = vpaddd_avx(auVar414,auVar256);
                auVar496._16_16_ = auVar255;
                auVar496._0_16_ = auVar414;
                auVar144._0_4_ = auVar387._0_4_ + fVar81;
                auVar144._4_4_ = auVar387._4_4_ + fVar80;
                auVar144._8_4_ = auVar387._8_4_ + fVar2;
                auVar144._12_4_ = auVar387._12_4_ + fVar253;
                auVar144._16_4_ = fVar254 + 0.0;
                auVar144._20_4_ = fVar16 + 0.0;
                auVar144._24_4_ = fVar17 + 0.0;
                auVar144._28_4_ = fVar18 + 0.0;
                auVar255 = vfmadd213ps_fma(auVar496,auVar144,auVar449);
                auVar151 = vrcpps_avx(ZEXT1632(auVar255));
                auVar255 = vfmsub213ps_fma(ZEXT1632(auVar255),auVar151,auVar449);
                auVar255 = vfnmadd132ps_fma(ZEXT1632(auVar255),auVar151,auVar151);
                auVar142 = ZEXT1632(auVar255);
                break;
              case 5:
                auVar465._8_4_ = 0x42b0c0a5;
                auVar465._0_8_ = 0x42b0c0a542b0c0a5;
                auVar465._12_4_ = 0x42b0c0a5;
                auVar465._16_4_ = 0x42b0c0a5;
                auVar465._20_4_ = 0x42b0c0a5;
                auVar465._24_4_ = 0x42b0c0a5;
                auVar465._28_4_ = 0x42b0c0a5;
                auVar151 = vminps_avx(auVar465,auVar151);
                auVar472._8_4_ = 0xc2b0c0a5;
                auVar472._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar472._12_4_ = 0xc2b0c0a5;
                auVar472._16_4_ = 0xc2b0c0a5;
                auVar472._20_4_ = 0xc2b0c0a5;
                auVar472._24_4_ = 0xc2b0c0a5;
                auVar472._28_4_ = 0xc2b0c0a5;
                auVar142 = vmaxps_avx(auVar472,auVar151);
                auVar436._8_4_ = 0x3fb8aa3b;
                auVar436._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar436._12_4_ = 0x3fb8aa3b;
                auVar436._16_4_ = 0x3fb8aa3b;
                auVar436._20_4_ = 0x3fb8aa3b;
                auVar436._24_4_ = 0x3fb8aa3b;
                auVar436._28_4_ = 0x3fb8aa3b;
                auVar255 = vfmadd213ps_fma(auVar436,auVar142,auVar435);
                auVar96 = vroundps_avx(ZEXT1632(auVar255),1);
                auVar151 = vcmpps_avx(ZEXT1632(auVar255),auVar96,1);
                auVar151 = vandps_avx(auVar151,auVar449);
                auVar151 = vsubps_avx(auVar96,auVar151);
                auVar473._8_4_ = 0x3f318000;
                auVar473._0_8_ = 0x3f3180003f318000;
                auVar473._12_4_ = 0x3f318000;
                auVar473._16_4_ = 0x3f318000;
                auVar473._20_4_ = 0x3f318000;
                auVar473._24_4_ = 0x3f318000;
                auVar473._28_4_ = 0x3f318000;
                auVar255 = vfmsub231ps_fma(auVar142,auVar151,auVar473);
                auVar466._8_4_ = 0xb95e8083;
                auVar466._0_8_ = 0xb95e8083b95e8083;
                auVar466._12_4_ = 0xb95e8083;
                auVar466._16_4_ = 0xb95e8083;
                auVar466._20_4_ = 0xb95e8083;
                auVar466._24_4_ = 0xb95e8083;
                auVar466._28_4_ = 0xb95e8083;
                auVar414 = vfnmsub231ps_fma(ZEXT1632(auVar255),auVar151,auVar466);
                auVar142 = ZEXT1632(auVar414);
                auVar19._28_4_ = auVar96._28_4_;
                auVar19._0_28_ =
                     ZEXT1628(CONCAT412(auVar414._12_4_ * auVar414._12_4_,
                                        CONCAT48(auVar414._8_4_ * auVar414._8_4_,
                                                 CONCAT44(auVar414._4_4_ * auVar414._4_4_,
                                                          auVar414._0_4_ * auVar414._0_4_))));
                auVar380._8_4_ = 0x39506967;
                auVar380._0_8_ = 0x3950696739506967;
                auVar380._12_4_ = 0x39506967;
                auVar380._16_4_ = 0x39506967;
                auVar380._20_4_ = 0x39506967;
                auVar380._24_4_ = 0x39506967;
                auVar380._28_4_ = 0x39506967;
                auVar405._8_4_ = 0x3ab743ce;
                auVar405._0_8_ = 0x3ab743ce3ab743ce;
                auVar405._12_4_ = 0x3ab743ce;
                auVar405._16_4_ = 0x3ab743ce;
                auVar405._20_4_ = 0x3ab743ce;
                auVar405._24_4_ = 0x3ab743ce;
                auVar405._28_4_ = 0x3ab743ce;
                auVar255 = vfmadd213ps_fma(auVar380,auVar142,auVar405);
                auVar322._8_4_ = 0x3c088908;
                auVar322._0_8_ = 0x3c0889083c088908;
                auVar322._12_4_ = 0x3c088908;
                auVar322._16_4_ = 0x3c088908;
                auVar322._20_4_ = 0x3c088908;
                auVar322._24_4_ = 0x3c088908;
                auVar322._28_4_ = 0x3c088908;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar322);
                auVar375._8_4_ = 0x3d2aa9c1;
                auVar375._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar375._12_4_ = 0x3d2aa9c1;
                auVar375._16_4_ = 0x3d2aa9c1;
                auVar375._20_4_ = 0x3d2aa9c1;
                auVar375._24_4_ = 0x3d2aa9c1;
                auVar375._28_4_ = 0x3d2aa9c1;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar375);
                auVar142 = ZEXT1632(auVar414);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar478);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar435);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar19,auVar142);
                auVar221._0_4_ = auVar255._0_4_ + fVar81;
                auVar221._4_4_ = auVar255._4_4_ + fVar80;
                auVar221._8_4_ = auVar255._8_4_ + fVar2;
                auVar221._12_4_ = auVar255._12_4_ + fVar253;
                auVar221._16_4_ = fVar254 + 0.0;
                auVar221._20_4_ = fVar16 + 0.0;
                auVar221._24_4_ = fVar17 + 0.0;
                auVar221._28_4_ = fVar18 + 0.0;
                auVar414._0_4_ = (int)auVar151._0_4_;
                auVar414._4_4_ = (int)auVar151._4_4_;
                auVar414._8_4_ = (int)auVar151._8_4_;
                auVar414._12_4_ = (int)auVar151._12_4_;
                auVar260._16_4_ = (int)auVar151._16_4_;
                auVar260._0_16_ = auVar414;
                auVar260._20_4_ = (int)auVar151._20_4_;
                auVar260._24_4_ = (int)auVar151._24_4_;
                auVar260._28_4_ = (int)auVar151._28_4_;
                auVar414 = vpslld_avx(auVar414,0x17);
                auVar255 = vpslld_avx(auVar260._16_16_,0x17);
                auVar255 = vpaddd_avx(auVar113,auVar255);
                auVar414 = vpaddd_avx(auVar414,auVar113);
                auVar494._16_16_ = auVar255;
                auVar494._0_16_ = auVar414;
                auVar387 = vfmadd213ps_fma(auVar494,auVar221,auVar449);
                auVar499 = (undefined1  [36])0x0;
                auVar222._8_4_ = 0x800000;
                auVar222._0_8_ = 0x80000000800000;
                auVar222._12_4_ = 0x800000;
                auVar222._16_4_ = 0x800000;
                auVar222._20_4_ = 0x800000;
                auVar222._24_4_ = 0x800000;
                auVar222._28_4_ = 0x800000;
                auVar151 = vmaxps_avx(ZEXT1632(auVar387),auVar222);
                auVar414 = vpsrld_avx(auVar151._0_16_,0x17);
                auVar255 = vpsrld_avx(auVar151._16_16_,0x17);
                auVar343._8_4_ = 0x807fffff;
                auVar343._0_8_ = 0x807fffff807fffff;
                auVar343._12_4_ = 0x807fffff;
                auVar343._16_4_ = 0x807fffff;
                auVar343._20_4_ = 0x807fffff;
                auVar343._24_4_ = 0x807fffff;
                auVar343._28_4_ = 0x807fffff;
                auVar151 = vandps_avx(auVar151,auVar343);
                auVar96 = vorps_avx(auVar151,auVar435);
                auVar344._8_4_ = 0x3f3504f3;
                auVar344._0_8_ = 0x3f3504f33f3504f3;
                auVar344._12_4_ = 0x3f3504f3;
                auVar344._16_4_ = 0x3f3504f3;
                auVar344._20_4_ = 0x3f3504f3;
                auVar344._24_4_ = 0x3f3504f3;
                auVar344._28_4_ = 0x3f3504f3;
                auVar142 = vcmpps_avx(auVar344,auVar96,2);
                auVar151 = vandnps_avx(auVar142,auVar96);
                auVar406._8_4_ = 0xbf800000;
                auVar406._0_8_ = 0xbf800000bf800000;
                auVar406._12_4_ = 0xbf800000;
                auVar406._16_4_ = 0xbf800000;
                auVar406._20_4_ = 0xbf800000;
                auVar406._24_4_ = 0xbf800000;
                auVar406._28_4_ = 0xbf800000;
                auVar223._0_4_ = auVar151._0_4_ + auVar96._0_4_ + -1.0;
                auVar223._4_4_ = auVar151._4_4_ + auVar96._4_4_ + -1.0;
                auVar223._8_4_ = auVar151._8_4_ + auVar96._8_4_ + -1.0;
                auVar223._12_4_ = auVar151._12_4_ + auVar96._12_4_ + -1.0;
                auVar223._16_4_ = auVar151._16_4_ + auVar96._16_4_ + -1.0;
                auVar223._20_4_ = auVar151._20_4_ + auVar96._20_4_ + -1.0;
                auVar223._24_4_ = auVar151._24_4_ + auVar96._24_4_ + -1.0;
                auVar223._28_4_ = auVar151._28_4_ + auVar96._28_4_ + -1.0;
                auVar255 = vpsubd_avx(auVar255,auVar142._16_16_);
                auVar122._8_4_ = 0xffffff81;
                auVar122._0_8_ = 0xffffff81ffffff81;
                auVar122._12_4_ = 0xffffff81;
                auVar255 = vpaddd_avx(auVar255,auVar122);
                auVar414 = vpsubd_avx(auVar414,auVar142._0_16_);
                auVar414 = vpaddd_avx(auVar122,auVar414);
                auVar261._16_16_ = auVar255;
                auVar261._0_16_ = auVar414;
                auVar20._4_4_ = auVar223._4_4_ * auVar223._4_4_;
                auVar20._0_4_ = auVar223._0_4_ * auVar223._0_4_;
                auVar20._8_4_ = auVar223._8_4_ * auVar223._8_4_;
                auVar20._12_4_ = auVar223._12_4_ * auVar223._12_4_;
                auVar20._16_4_ = auVar223._16_4_ * auVar223._16_4_;
                auVar20._20_4_ = auVar223._20_4_ * auVar223._20_4_;
                auVar20._24_4_ = auVar223._24_4_ * auVar223._24_4_;
                auVar20._28_4_ = auVar142._28_4_;
                auVar437._8_4_ = 0x3d9021bb;
                auVar437._0_8_ = 0x3d9021bb3d9021bb;
                auVar437._12_4_ = 0x3d9021bb;
                auVar437._16_4_ = 0x3d9021bb;
                auVar437._20_4_ = 0x3d9021bb;
                auVar437._24_4_ = 0x3d9021bb;
                auVar437._28_4_ = 0x3d9021bb;
                auVar450._8_4_ = 0xbdebd1b8;
                auVar450._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar450._12_4_ = 0xbdebd1b8;
                auVar450._16_4_ = 0xbdebd1b8;
                auVar450._20_4_ = 0xbdebd1b8;
                auVar450._24_4_ = 0xbdebd1b8;
                auVar450._28_4_ = 0xbdebd1b8;
                auVar255 = vfmadd213ps_fma(auVar437,auVar223,auVar450);
                auVar451._8_4_ = 0x3def251a;
                auVar451._0_8_ = 0x3def251a3def251a;
                auVar451._12_4_ = 0x3def251a;
                auVar451._16_4_ = 0x3def251a;
                auVar451._20_4_ = 0x3def251a;
                auVar451._24_4_ = 0x3def251a;
                auVar451._28_4_ = 0x3def251a;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar223,auVar451);
                auVar452._8_4_ = 0xbdfe5d4f;
                auVar452._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar452._12_4_ = 0xbdfe5d4f;
                auVar452._16_4_ = 0xbdfe5d4f;
                auVar452._20_4_ = 0xbdfe5d4f;
                auVar452._24_4_ = 0xbdfe5d4f;
                auVar452._28_4_ = 0xbdfe5d4f;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar223,auVar452);
                auVar453._8_4_ = 0x3e11e9bf;
                auVar453._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar453._12_4_ = 0x3e11e9bf;
                auVar453._16_4_ = 0x3e11e9bf;
                auVar453._20_4_ = 0x3e11e9bf;
                auVar453._24_4_ = 0x3e11e9bf;
                auVar453._28_4_ = 0x3e11e9bf;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar223,auVar453);
                auVar454._8_4_ = 0xbe2aae50;
                auVar454._0_8_ = 0xbe2aae50be2aae50;
                auVar454._12_4_ = 0xbe2aae50;
                auVar454._16_4_ = 0xbe2aae50;
                auVar454._20_4_ = 0xbe2aae50;
                auVar454._24_4_ = 0xbe2aae50;
                auVar454._28_4_ = 0xbe2aae50;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar223,auVar454);
                auVar455._8_4_ = 0x3e4cceac;
                auVar455._0_8_ = 0x3e4cceac3e4cceac;
                auVar455._12_4_ = 0x3e4cceac;
                auVar455._16_4_ = 0x3e4cceac;
                auVar455._20_4_ = 0x3e4cceac;
                auVar455._24_4_ = 0x3e4cceac;
                auVar455._28_4_ = 0x3e4cceac;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar223,auVar455);
                auVar456._8_4_ = 0xbe7ffffc;
                auVar456._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar456._12_4_ = 0xbe7ffffc;
                auVar456._16_4_ = 0xbe7ffffc;
                auVar456._20_4_ = 0xbe7ffffc;
                auVar456._24_4_ = 0xbe7ffffc;
                auVar456._28_4_ = 0xbe7ffffc;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar223,auVar456);
                auVar457._8_4_ = 0x3eaaaaaa;
                auVar457._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar457._12_4_ = 0x3eaaaaaa;
                auVar457._16_4_ = 0x3eaaaaaa;
                auVar457._20_4_ = 0x3eaaaaaa;
                auVar457._24_4_ = 0x3eaaaaaa;
                auVar457._28_4_ = 0x3eaaaaaa;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar223,auVar457);
                auVar438._0_4_ = auVar223._0_4_ * auVar223._0_4_ * auVar223._0_4_ * auVar255._0_4_;
                auVar438._4_4_ = auVar223._4_4_ * auVar223._4_4_ * auVar223._4_4_ * auVar255._4_4_;
                auVar438._8_4_ = auVar223._8_4_ * auVar223._8_4_ * auVar223._8_4_ * auVar255._8_4_;
                auVar438._12_4_ =
                     auVar223._12_4_ * auVar223._12_4_ * auVar223._12_4_ * auVar255._12_4_;
                auVar438._16_4_ = auVar223._16_4_ * auVar223._16_4_ * auVar223._16_4_ * 0.0;
                auVar438._20_4_ = auVar223._20_4_ * auVar223._20_4_ * auVar223._20_4_ * 0.0;
                auVar438._24_4_ = auVar223._24_4_ * auVar223._24_4_ * auVar223._24_4_ * 0.0;
                auVar438._28_4_ = 0;
                auVar142 = vcvtdq2ps_avx(auVar261);
                auVar255 = vfmadd231ps_fma(auVar438,auVar142,auVar466);
                auVar255 = vfmsub231ps_fma(ZEXT1632(auVar255),auVar435,auVar20);
                auVar151 = vcmpps_avx(ZEXT1632(auVar387),_DAT_004ef8c0,2);
                auVar96 = vsubps_avx(ZEXT1632(auVar255),auVar223);
                auVar255 = vfmsub231ps_fma(auVar96,auVar473,auVar142);
                auVar458._8_4_ = 0xc0000000;
                auVar458._0_8_ = 0xc0000000c0000000;
                auVar458._12_4_ = 0xc0000000;
                auVar458._16_4_ = 0xc0000000;
                auVar458._20_4_ = 0xc0000000;
                auVar458._24_4_ = 0xc0000000;
                auVar458._28_4_ = 0xc0000000;
                auVar224._0_4_ = auVar255._0_4_ * -2.0;
                auVar224._4_4_ = auVar255._4_4_ * -2.0;
                auVar224._8_4_ = auVar255._8_4_ * -2.0;
                auVar224._12_4_ = auVar255._12_4_ * -2.0;
                auVar224._16_4_ = 0x80000000;
                auVar224._20_4_ = 0x80000000;
                auVar224._24_4_ = 0x80000000;
                auVar224._28_4_ = 0;
                auVar262._8_4_ = 0x7fffffff;
                auVar262._0_8_ = 0x7fffffff7fffffff;
                auVar262._12_4_ = 0x7fffffff;
                auVar262._16_4_ = 0x7fffffff;
                auVar262._20_4_ = 0x7fffffff;
                auVar262._24_4_ = 0x7fffffff;
                auVar262._28_4_ = 0x7fffffff;
                auVar151 = vblendvps_avx(auVar224,auVar262,auVar151);
                auVar263._8_4_ = 0x42b0c0a5;
                auVar263._0_8_ = 0x42b0c0a542b0c0a5;
                auVar263._12_4_ = 0x42b0c0a5;
                auVar263._16_4_ = 0x42b0c0a5;
                auVar263._20_4_ = 0x42b0c0a5;
                auVar263._24_4_ = 0x42b0c0a5;
                auVar263._28_4_ = 0x42b0c0a5;
                auVar151 = vminps_avx(auVar151,auVar263);
                auVar264._8_4_ = 0xc2b0c0a5;
                auVar264._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar264._12_4_ = 0xc2b0c0a5;
                auVar264._16_4_ = 0xc2b0c0a5;
                auVar264._20_4_ = 0xc2b0c0a5;
                auVar264._24_4_ = 0xc2b0c0a5;
                auVar264._28_4_ = 0xc2b0c0a5;
                auVar142 = vmaxps_avx(auVar151,auVar264);
                auVar265._8_4_ = 0x3fb8aa3b;
                auVar265._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar265._12_4_ = 0x3fb8aa3b;
                auVar265._16_4_ = 0x3fb8aa3b;
                auVar265._20_4_ = 0x3fb8aa3b;
                auVar265._24_4_ = 0x3fb8aa3b;
                auVar265._28_4_ = 0x3fb8aa3b;
                auVar255 = vfmadd213ps_fma(auVar265,auVar142,auVar435);
                auVar96 = vroundps_avx(ZEXT1632(auVar255),1);
                auVar151 = vcmpps_avx(ZEXT1632(auVar255),auVar96,1);
                auVar151 = vandps_avx(auVar151,auVar449);
                auVar151 = vsubps_avx(auVar96,auVar151);
                auVar255 = vfmsub231ps_fma(auVar142,auVar151,auVar473);
                auVar414 = vfnmsub231ps_fma(ZEXT1632(auVar255),auVar151,auVar466);
                auVar142 = ZEXT1632(auVar414);
                auVar21._28_4_ = auVar96._28_4_;
                auVar21._0_28_ =
                     ZEXT1628(CONCAT412(auVar414._12_4_ * auVar414._12_4_,
                                        CONCAT48(auVar414._8_4_ * auVar414._8_4_,
                                                 CONCAT44(auVar414._4_4_ * auVar414._4_4_,
                                                          auVar414._0_4_ * auVar414._0_4_))));
                auVar381._8_4_ = 0x3ab743ce;
                auVar381._0_8_ = 0x3ab743ce3ab743ce;
                auVar381._12_4_ = 0x3ab743ce;
                auVar381._16_4_ = 0x3ab743ce;
                auVar381._20_4_ = 0x3ab743ce;
                auVar381._24_4_ = 0x3ab743ce;
                auVar381._28_4_ = 0x3ab743ce;
                auVar255 = vfmadd213ps_fma(auVar380,auVar142,auVar381);
                auVar382._8_4_ = 0x3c088908;
                auVar382._0_8_ = 0x3c0889083c088908;
                auVar382._12_4_ = 0x3c088908;
                auVar382._16_4_ = 0x3c088908;
                auVar382._20_4_ = 0x3c088908;
                auVar382._24_4_ = 0x3c088908;
                auVar382._28_4_ = 0x3c088908;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar382);
                auVar103 = ZEXT864(0) << 0x20;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar375);
                auVar377 = ZEXT3264(auVar449);
                auVar142 = ZEXT1632(auVar414);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar478);
                auVar332 = ZEXT3264(auVar435);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar142,auVar435);
                auVar387 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar21,auVar142);
                auVar255._0_4_ = (int)auVar151._0_4_;
                auVar255._4_4_ = (int)auVar151._4_4_;
                auVar255._8_4_ = (int)auVar151._8_4_;
                auVar255._12_4_ = (int)auVar151._12_4_;
                auVar225._16_4_ = (int)auVar151._16_4_;
                auVar225._0_16_ = auVar255;
                auVar225._20_4_ = (int)auVar151._20_4_;
                auVar225._24_4_ = (int)auVar151._24_4_;
                auVar225._28_4_ = (int)auVar151._28_4_;
                auVar414 = vpslld_avx(auVar255,0x17);
                auVar255 = vpslld_avx(auVar225._16_16_,0x17);
                auVar255 = vpaddd_avx(auVar113,auVar255);
                auVar414 = vpaddd_avx(auVar113,auVar414);
                auVar226._16_16_ = auVar255;
                auVar226._0_16_ = auVar414;
                auVar266._0_4_ = auVar387._0_4_ + fVar81;
                auVar266._4_4_ = auVar387._4_4_ + fVar80;
                auVar266._8_4_ = auVar387._8_4_ + fVar2;
                auVar266._12_4_ = auVar387._12_4_ + fVar253;
                auVar266._16_4_ = fVar254 + 0.0;
                auVar266._20_4_ = fVar16 + 0.0;
                auVar266._24_4_ = fVar17 + 0.0;
                auVar266._28_4_ = fVar18 + 0.0;
                auVar255 = vfmadd213ps_fma(auVar226,auVar266,auVar449);
                auVar151 = vrcpps_avx(ZEXT1632(auVar255));
                auVar255 = vfmsub213ps_fma(ZEXT1632(auVar255),auVar151,auVar449);
                auVar255 = vfnmadd132ps_fma(ZEXT1632(auVar255),auVar151,auVar151);
                auVar255 = vfnmadd213ps_fma(ZEXT1632(auVar255),auVar458,auVar406);
                auVar219 = ZEXT1628(auVar255);
                goto LAB_0025dd7d;
              case 6:
                uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                auVar231._4_4_ = uVar82;
                auVar231._0_4_ = uVar82;
                auVar231._8_4_ = uVar82;
                auVar231._12_4_ = uVar82;
                auVar231._16_4_ = uVar82;
                auVar231._20_4_ = uVar82;
                auVar231._24_4_ = uVar82;
                auVar231._28_4_ = uVar82;
                uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                auVar273._4_4_ = uVar82;
                auVar273._0_4_ = uVar82;
                auVar273._8_4_ = uVar82;
                auVar273._12_4_ = uVar82;
                auVar273._16_4_ = uVar82;
                auVar273._20_4_ = uVar82;
                auVar273._24_4_ = uVar82;
                auVar273._28_4_ = uVar82;
                auVar255 = vfmadd231ps_fma(auVar273,auVar151,auVar231);
                auVar151 = vmaxps_avx(ZEXT1632(auVar255),auVar96);
                auVar151 = vminps_avx(auVar151,auVar449);
                auVar219 = auVar151._0_28_;
LAB_0025dd7d:
                auVar384._0_4_ = auVar219._0_4_ * auVar171._0_4_;
                auVar384._4_4_ = auVar219._4_4_ * auVar171._4_4_;
                auVar384._8_4_ = auVar219._8_4_ * auVar171._8_4_;
                auVar384._12_4_ = auVar219._12_4_ * auVar171._12_4_;
                auVar384._16_4_ = auVar219._16_4_ * auVar171._16_4_;
                auVar384._20_4_ = auVar219._20_4_ * auVar171._20_4_;
                auVar384._24_4_ = auVar219._24_4_ * auVar171._24_4_;
                auVar384._28_36_ = auVar499;
                auVar142 = auVar384._0_32_;
              }
              auVar151 = auVar142;
LAB_0025dd85:
              *(undefined1 (*) [32])local_220 = auVar151;
              local_220 = local_220 + 4;
              iVar45 = iVar45 + 1;
            }
          }
        }
      }
      if (((int)local_160 == 4) && (_elempack == 8)) {
        p_Var56 = local_150[-3];
        uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
        uVar8 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
        iVar78 = *(int *)(&this->field_0xdc + (long)p_Var56);
        iVar79 = *(int *)(&this->field_0xe0 + (long)p_Var56);
        iVar57 = *(int *)(&this->field_0xe4 + (long)p_Var56);
        iVar52 = *(int *)(&this->field_0xe8 + (long)p_Var56);
        iVar58 = *(int *)(&this->field_0x114 + (long)p_Var56);
        lVar61 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
        uVar60 = 0;
        uVar54 = 0;
        if (0 < (int)uVar7) {
          uVar54 = (ulong)uVar7;
        }
        uVar74 = 0;
        if (0 < (int)uVar8) {
          uVar74 = (ulong)uVar8;
        }
        uVar64 = (ulong)(uint)local_1a8.c;
        if (local_1a8.c < 1) {
          uVar64 = uVar60;
        }
        auVar103 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar332 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar377 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        auVar113 = ZEXT816(0) << 0x40;
        auVar459._8_4_ = 0x42b0c0a5;
        auVar459._0_8_ = 0x42b0c0a542b0c0a5;
        auVar459._12_4_ = 0x42b0c0a5;
        auVar459._16_4_ = 0x42b0c0a5;
        auVar459._20_4_ = 0x42b0c0a5;
        auVar459._24_4_ = 0x42b0c0a5;
        auVar459._28_4_ = 0x42b0c0a5;
        auVar467._8_4_ = 0xc2b0c0a5;
        auVar467._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar467._12_4_ = 0xc2b0c0a5;
        auVar467._16_4_ = 0xc2b0c0a5;
        auVar467._20_4_ = 0xc2b0c0a5;
        auVar467._24_4_ = 0xc2b0c0a5;
        auVar467._28_4_ = 0xc2b0c0a5;
        auVar383._8_4_ = 0x3f318000;
        auVar383._0_8_ = 0x3f3180003f318000;
        auVar383._12_4_ = 0x3f318000;
        auVar383._16_4_ = 0x3f318000;
        auVar383._20_4_ = 0x3f318000;
        auVar383._24_4_ = 0x3f318000;
        auVar383._28_4_ = 0x3f318000;
        for (; uVar60 != uVar64; uVar60 = uVar60 + 1) {
          local_220 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * uVar60 * local_1a8.elemsize);
          iVar69 = bottom_blob->w;
          iVar76 = bottom_blob->h;
          uVar55 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar55 = 0;
          }
          uVar48 = 0;
          uVar53 = local_1a8.w;
          if (local_1a8.w < 1) {
            uVar53 = 0;
          }
          uVar59 = local_1a8.h;
          if (local_1a8.h < 1) {
            uVar59 = 0;
          }
          for (; uVar48 != uVar59; uVar48 = uVar48 + 1) {
            iVar45 = (1 - uVar7) * iVar78;
            for (uVar63 = 0; uVar63 != uVar53; uVar63 = uVar63 + 1) {
              if (lVar61 == 0) {
                auVar171 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar171 = ZEXT3264(*(undefined1 (*) [32])(lVar61 + uVar60 * 0x20));
              }
              pvVar71 = bottom_blob->data;
              lVar49 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar60 * (this->weight_data_tm).elemsize +
                       0x60;
              for (uVar68 = 0; uVar68 != uVar55; uVar68 = uVar68 + 1) {
                lVar50 = lVar49;
                for (uVar65 = 0; uVar65 != uVar74; uVar65 = uVar65 + 1) {
                  iVar42 = (((int)uVar65 - uVar8) + 1) * iVar79 + uVar48;
                  if (((-1 < iVar42) && (iVar43 = iVar42 / iVar52, iVar42 % iVar52 == 0)) &&
                     (iVar43 < iVar76)) {
                    lVar40 = (long)iVar43 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar68;
                    iVar42 = iVar45;
                    for (lVar75 = 0; uVar54 * 0x80 != lVar75; lVar75 = lVar75 + 0x80) {
                      if (((-1 < iVar42) && (iVar43 = iVar42 / iVar57, iVar42 % iVar57 == 0)) &&
                         (iVar43 < iVar69)) {
                        lVar47 = (long)(iVar43 << 2);
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40);
                        auVar145._4_4_ = uVar82;
                        auVar145._0_4_ = uVar82;
                        auVar145._8_4_ = uVar82;
                        auVar145._12_4_ = uVar82;
                        auVar145._16_4_ = uVar82;
                        auVar145._20_4_ = uVar82;
                        auVar145._24_4_ = uVar82;
                        auVar145._28_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 4);
                        auVar232._4_4_ = uVar82;
                        auVar232._0_4_ = uVar82;
                        auVar232._8_4_ = uVar82;
                        auVar232._12_4_ = uVar82;
                        auVar232._16_4_ = uVar82;
                        auVar232._20_4_ = uVar82;
                        auVar232._24_4_ = uVar82;
                        auVar232._28_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 8);
                        auVar323._4_4_ = uVar82;
                        auVar323._0_4_ = uVar82;
                        auVar323._8_4_ = uVar82;
                        auVar323._12_4_ = uVar82;
                        auVar323._16_4_ = uVar82;
                        auVar323._20_4_ = uVar82;
                        auVar323._24_4_ = uVar82;
                        auVar323._28_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0xc);
                        auVar407._4_4_ = uVar82;
                        auVar407._0_4_ = uVar82;
                        auVar407._8_4_ = uVar82;
                        auVar407._12_4_ = uVar82;
                        auVar407._16_4_ = uVar82;
                        auVar407._20_4_ = uVar82;
                        auVar407._24_4_ = uVar82;
                        auVar407._28_4_ = uVar82;
                        auVar255 = vfmadd231ps_fma(auVar171._0_32_,auVar145,
                                                   *(undefined1 (*) [32])(lVar50 + -0x60 + lVar75));
                        auVar255 = vfmadd231ps_fma(ZEXT1632(auVar255),auVar232,
                                                   *(undefined1 (*) [32])(lVar50 + -0x40 + lVar75));
                        auVar255 = vfmadd231ps_fma(ZEXT1632(auVar255),auVar323,
                                                   *(undefined1 (*) [32])(lVar50 + -0x20 + lVar75));
                        auVar255 = vfmadd231ps_fma(ZEXT1632(auVar255),auVar407,
                                                   *(undefined1 (*) [32])(lVar50 + lVar75));
                        auVar171 = ZEXT1664(auVar255);
                      }
                      iVar42 = iVar42 + iVar78;
                    }
                  }
                  lVar50 = lVar50 + (long)(int)uVar7 * 0x80;
                }
                lVar49 = lVar49 + (long)(int)(uVar7 * uVar8 * 0x20) * 4;
              }
              auVar478 = auVar171._0_32_;
              if (5 < iVar58 - 1U) goto LAB_0025e5b3;
              auVar480 = vmaxps_avx(ZEXT1632(auVar113),auVar478);
              auVar151 = auVar103._0_32_;
              auVar142 = auVar332._0_32_;
              switch(iVar58) {
              case 2:
                auVar478 = vminps_avx(ZEXT1632(auVar113),auVar478);
                uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                auVar146._4_4_ = uVar82;
                auVar146._0_4_ = uVar82;
                auVar146._8_4_ = uVar82;
                auVar146._12_4_ = uVar82;
                auVar146._16_4_ = uVar82;
                auVar146._20_4_ = uVar82;
                auVar146._24_4_ = uVar82;
                auVar146._28_4_ = uVar82;
                auVar255 = vfmadd231ps_fma(auVar480,auVar478,auVar146);
                auVar480 = ZEXT1632(auVar255);
                break;
              case 3:
                uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                auVar154._4_4_ = uVar82;
                auVar154._0_4_ = uVar82;
                auVar154._8_4_ = uVar82;
                auVar154._12_4_ = uVar82;
                auVar154._16_4_ = uVar82;
                auVar154._20_4_ = uVar82;
                auVar154._24_4_ = uVar82;
                auVar154._28_4_ = uVar82;
                uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                auVar481._4_4_ = uVar82;
                auVar481._0_4_ = uVar82;
                auVar481._8_4_ = uVar82;
                auVar481._12_4_ = uVar82;
                auVar481._16_4_ = uVar82;
                auVar481._20_4_ = uVar82;
                auVar481._24_4_ = uVar82;
                auVar481._28_4_ = uVar82;
                auVar478 = vmaxps_avx(auVar478,auVar154);
                auVar480 = vminps_avx(auVar481,auVar478);
                break;
              case 4:
                auVar97._0_8_ = auVar171._0_8_ ^ 0x8000000080000000;
                auVar97._8_4_ = -auVar171._8_4_;
                auVar97._12_4_ = -auVar171._12_4_;
                auVar97._16_4_ = -auVar171._16_4_;
                auVar97._20_4_ = -auVar171._20_4_;
                auVar97._24_4_ = -auVar171._24_4_;
                auVar97._28_4_ = auVar171._28_4_ ^ 0x80000000;
                auVar155._8_4_ = 0x42b0c0a5;
                auVar155._0_8_ = 0x42b0c0a542b0c0a5;
                auVar155._12_4_ = 0x42b0c0a5;
                auVar155._16_4_ = 0x42b0c0a5;
                auVar155._20_4_ = 0x42b0c0a5;
                auVar155._24_4_ = 0x42b0c0a5;
                auVar155._28_4_ = 0x42b0c0a5;
                auVar478 = vminps_avx(auVar97,auVar155);
                auVar156._8_4_ = 0xc2b0c0a5;
                auVar156._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar156._12_4_ = 0xc2b0c0a5;
                auVar156._16_4_ = 0xc2b0c0a5;
                auVar156._20_4_ = 0xc2b0c0a5;
                auVar156._24_4_ = 0xc2b0c0a5;
                auVar156._28_4_ = 0xc2b0c0a5;
                auVar96 = vmaxps_avx(auVar478,auVar156);
                auVar157._8_4_ = 0x3fb8aa3b;
                auVar157._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar157._12_4_ = 0x3fb8aa3b;
                auVar157._16_4_ = 0x3fb8aa3b;
                auVar157._20_4_ = 0x3fb8aa3b;
                auVar157._24_4_ = 0x3fb8aa3b;
                auVar157._28_4_ = 0x3fb8aa3b;
                auVar255 = vfmadd213ps_fma(auVar157,auVar96,auVar151);
                auVar435 = vroundps_avx(ZEXT1632(auVar255),1);
                auVar478 = vcmpps_avx(ZEXT1632(auVar255),auVar435,1);
                auVar478 = vandps_avx(auVar478,auVar142);
                auVar478 = vsubps_avx(auVar435,auVar478);
                auVar239._8_4_ = 0x3f318000;
                auVar239._0_8_ = 0x3f3180003f318000;
                auVar239._12_4_ = 0x3f318000;
                auVar239._16_4_ = 0x3f318000;
                auVar239._20_4_ = 0x3f318000;
                auVar239._24_4_ = 0x3f318000;
                auVar239._28_4_ = 0x3f318000;
                auVar255 = vfmsub231ps_fma(auVar96,auVar478,auVar239);
                auVar240._8_4_ = 0x395e8083;
                auVar240._0_8_ = 0x395e8083395e8083;
                auVar240._12_4_ = 0x395e8083;
                auVar240._16_4_ = 0x395e8083;
                auVar240._20_4_ = 0x395e8083;
                auVar240._24_4_ = 0x395e8083;
                auVar240._28_4_ = 0x395e8083;
                auVar414 = vfmsub231ps_fma(ZEXT1632(auVar255),auVar478,auVar240);
                auVar96 = ZEXT1632(auVar414);
                auVar26._28_4_ = auVar435._28_4_;
                auVar26._0_28_ =
                     ZEXT1628(CONCAT412(auVar414._12_4_ * auVar414._12_4_,
                                        CONCAT48(auVar414._8_4_ * auVar414._8_4_,
                                                 CONCAT44(auVar414._4_4_ * auVar414._4_4_,
                                                          auVar414._0_4_ * auVar414._0_4_))));
                auVar410._8_4_ = 0x39506967;
                auVar410._0_8_ = 0x3950696739506967;
                auVar410._12_4_ = 0x39506967;
                auVar410._16_4_ = 0x39506967;
                auVar410._20_4_ = 0x39506967;
                auVar410._24_4_ = 0x39506967;
                auVar410._28_4_ = 0x39506967;
                auVar241._8_4_ = 0x3ab743ce;
                auVar241._0_8_ = 0x3ab743ce3ab743ce;
                auVar241._12_4_ = 0x3ab743ce;
                auVar241._16_4_ = 0x3ab743ce;
                auVar241._20_4_ = 0x3ab743ce;
                auVar241._24_4_ = 0x3ab743ce;
                auVar241._28_4_ = 0x3ab743ce;
                auVar255 = vfmadd213ps_fma(auVar410,auVar96,auVar241);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar96,auVar377._0_32_);
                auVar242._8_4_ = 0x3d2aa9c1;
                auVar242._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar242._12_4_ = 0x3d2aa9c1;
                auVar242._16_4_ = 0x3d2aa9c1;
                auVar242._20_4_ = 0x3d2aa9c1;
                auVar242._24_4_ = 0x3d2aa9c1;
                auVar242._28_4_ = 0x3d2aa9c1;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar96,auVar242);
                auVar243._8_4_ = 0x3e2aaaaa;
                auVar243._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar243._12_4_ = 0x3e2aaaaa;
                auVar243._16_4_ = 0x3e2aaaaa;
                auVar243._20_4_ = 0x3e2aaaaa;
                auVar243._24_4_ = 0x3e2aaaaa;
                auVar243._28_4_ = 0x3e2aaaaa;
                auVar96 = ZEXT1632(auVar414);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar96,auVar243);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar96,auVar151);
                auVar387 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar26,auVar96);
                auVar83._0_4_ = (int)auVar478._0_4_;
                auVar83._4_4_ = (int)auVar478._4_4_;
                auVar83._8_4_ = (int)auVar478._8_4_;
                auVar83._12_4_ = (int)auVar478._12_4_;
                auVar98._16_4_ = (int)auVar478._16_4_;
                auVar98._0_16_ = auVar83;
                auVar98._20_4_ = (int)auVar478._20_4_;
                auVar98._24_4_ = (int)auVar478._24_4_;
                auVar98._28_4_ = (int)auVar478._28_4_;
                auVar414 = vpslld_avx(auVar83,0x17);
                auVar255 = vpslld_avx(auVar98._16_16_,0x17);
                auVar172._8_4_ = 0x3f800000;
                auVar172._0_8_ = 0x3f8000003f800000;
                auVar172._12_4_ = 0x3f800000;
                auVar255 = vpaddd_avx(auVar255,auVar172);
                auVar414 = vpaddd_avx(auVar414,auVar172);
                auVar482._16_16_ = auVar255;
                auVar482._0_16_ = auVar414;
                auVar99._0_4_ = auVar387._0_4_ + auVar332._0_4_;
                auVar99._4_4_ = auVar387._4_4_ + auVar332._4_4_;
                auVar99._8_4_ = auVar387._8_4_ + auVar332._8_4_;
                auVar99._12_4_ = auVar387._12_4_ + auVar332._12_4_;
                auVar99._16_4_ = auVar332._16_4_ + 0.0;
                auVar99._20_4_ = auVar332._20_4_ + 0.0;
                auVar99._24_4_ = auVar332._24_4_ + 0.0;
                auVar99._28_4_ = auVar332._28_4_ + 0.0;
                auVar255 = vfmadd213ps_fma(auVar482,auVar99,auVar142);
                auVar478 = vrcpps_avx(ZEXT1632(auVar255));
                auVar255 = vfmsub213ps_fma(ZEXT1632(auVar255),auVar478,auVar142);
                auVar255 = vfnmadd132ps_fma(ZEXT1632(auVar255),auVar478,auVar478);
                auVar480 = ZEXT1632(auVar255);
                break;
              case 5:
                auVar478 = vminps_avx(auVar459,auVar478);
                auVar96 = vmaxps_avx(auVar467,auVar478);
                auVar474._8_4_ = 0x3fb8aa3b;
                auVar474._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar474._12_4_ = 0x3fb8aa3b;
                auVar474._16_4_ = 0x3fb8aa3b;
                auVar474._20_4_ = 0x3fb8aa3b;
                auVar474._24_4_ = 0x3fb8aa3b;
                auVar474._28_4_ = 0x3fb8aa3b;
                auVar255 = vfmadd213ps_fma(auVar474,auVar96,auVar151);
                auVar435 = vroundps_avx(ZEXT1632(auVar255),1);
                auVar478 = vcmpps_avx(ZEXT1632(auVar255),auVar435,1);
                auVar478 = vandps_avx(auVar478,auVar142);
                auVar478 = vsubps_avx(auVar435,auVar478);
                auVar255 = vfmsub231ps_fma(auVar96,auVar478,auVar383);
                auVar233._8_4_ = 0xb95e8083;
                auVar233._0_8_ = 0xb95e8083b95e8083;
                auVar233._12_4_ = 0xb95e8083;
                auVar233._16_4_ = 0xb95e8083;
                auVar233._20_4_ = 0xb95e8083;
                auVar233._24_4_ = 0xb95e8083;
                auVar233._28_4_ = 0xb95e8083;
                auVar414 = vfnmsub231ps_fma(ZEXT1632(auVar255),auVar478,auVar233);
                auVar96 = ZEXT1632(auVar414);
                auVar23._28_4_ = auVar435._28_4_;
                auVar23._0_28_ =
                     ZEXT1628(CONCAT412(auVar414._12_4_ * auVar414._12_4_,
                                        CONCAT48(auVar414._8_4_ * auVar414._8_4_,
                                                 CONCAT44(auVar414._4_4_ * auVar414._4_4_,
                                                          auVar414._0_4_ * auVar414._0_4_))));
                auVar376._8_4_ = 0x39506967;
                auVar376._0_8_ = 0x3950696739506967;
                auVar376._12_4_ = 0x39506967;
                auVar376._16_4_ = 0x39506967;
                auVar376._20_4_ = 0x39506967;
                auVar376._24_4_ = 0x39506967;
                auVar376._28_4_ = 0x39506967;
                auVar398._8_4_ = 0x3ab743ce;
                auVar398._0_8_ = 0x3ab743ce3ab743ce;
                auVar398._12_4_ = 0x3ab743ce;
                auVar398._16_4_ = 0x3ab743ce;
                auVar398._20_4_ = 0x3ab743ce;
                auVar398._24_4_ = 0x3ab743ce;
                auVar398._28_4_ = 0x3ab743ce;
                auVar255 = vfmadd213ps_fma(auVar376,auVar96,auVar398);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar96,auVar377._0_32_);
                auVar324._8_4_ = 0x3d2aa9c1;
                auVar324._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar324._12_4_ = 0x3d2aa9c1;
                auVar324._16_4_ = 0x3d2aa9c1;
                auVar324._20_4_ = 0x3d2aa9c1;
                auVar324._24_4_ = 0x3d2aa9c1;
                auVar324._28_4_ = 0x3d2aa9c1;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar96,auVar324);
                auVar325._8_4_ = 0x3e2aaaaa;
                auVar325._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar325._12_4_ = 0x3e2aaaaa;
                auVar325._16_4_ = 0x3e2aaaaa;
                auVar325._20_4_ = 0x3e2aaaaa;
                auVar325._24_4_ = 0x3e2aaaaa;
                auVar325._28_4_ = 0x3e2aaaaa;
                auVar96 = ZEXT1632(auVar414);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar96,auVar325);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar96,auVar151);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar23,auVar96);
                auVar147._0_4_ = auVar255._0_4_ + auVar332._0_4_;
                auVar147._4_4_ = auVar255._4_4_ + auVar332._4_4_;
                auVar147._8_4_ = auVar255._8_4_ + auVar332._8_4_;
                auVar147._12_4_ = auVar255._12_4_ + auVar332._12_4_;
                auVar147._16_4_ = auVar332._16_4_ + 0.0;
                auVar147._20_4_ = auVar332._20_4_ + 0.0;
                auVar147._24_4_ = auVar332._24_4_ + 0.0;
                auVar147._28_4_ = auVar332._28_4_ + 0.0;
                auVar387._0_4_ = (int)auVar478._0_4_;
                auVar387._4_4_ = (int)auVar478._4_4_;
                auVar387._8_4_ = (int)auVar478._8_4_;
                auVar387._12_4_ = (int)auVar478._12_4_;
                auVar234._16_4_ = (int)auVar478._16_4_;
                auVar234._0_16_ = auVar387;
                auVar234._20_4_ = (int)auVar478._20_4_;
                auVar234._24_4_ = (int)auVar478._24_4_;
                auVar234._28_4_ = (int)auVar478._28_4_;
                auVar414 = vpslld_avx(auVar387,0x17);
                auVar255 = vpslld_avx(auVar234._16_16_,0x17);
                auVar277._8_4_ = 0x3f800000;
                auVar277._0_8_ = 0x3f8000003f800000;
                auVar277._12_4_ = 0x3f800000;
                auVar255 = vpaddd_avx(auVar255,auVar277);
                auVar414 = vpaddd_avx(auVar414,auVar277);
                auVar479._16_16_ = auVar255;
                auVar479._0_16_ = auVar414;
                auVar387 = vfmadd213ps_fma(auVar479,auVar147,auVar142);
                auVar148._8_4_ = 0x800000;
                auVar148._0_8_ = 0x80000000800000;
                auVar148._12_4_ = 0x800000;
                auVar148._16_4_ = 0x800000;
                auVar148._20_4_ = 0x800000;
                auVar148._24_4_ = 0x800000;
                auVar148._28_4_ = 0x800000;
                auVar478 = vmaxps_avx(ZEXT1632(auVar387),auVar148);
                auVar414 = vpsrld_avx(auVar478._0_16_,0x17);
                auVar255 = vpsrld_avx(auVar478._16_16_,0x17);
                auVar326._8_4_ = 0x807fffff;
                auVar326._0_8_ = 0x807fffff807fffff;
                auVar326._12_4_ = 0x807fffff;
                auVar326._16_4_ = 0x807fffff;
                auVar326._20_4_ = 0x807fffff;
                auVar326._24_4_ = 0x807fffff;
                auVar326._28_4_ = 0x807fffff;
                auVar478 = vandps_avx(auVar478,auVar326);
                auVar142 = vorps_avx(auVar478,auVar151);
                auVar327._8_4_ = 0x3f3504f3;
                auVar327._0_8_ = 0x3f3504f33f3504f3;
                auVar327._12_4_ = 0x3f3504f3;
                auVar327._16_4_ = 0x3f3504f3;
                auVar327._20_4_ = 0x3f3504f3;
                auVar327._24_4_ = 0x3f3504f3;
                auVar327._28_4_ = 0x3f3504f3;
                auVar151 = vcmpps_avx(auVar327,auVar142,2);
                auVar478 = vandnps_avx(auVar151,auVar142);
                auVar149._0_4_ = auVar478._0_4_ + auVar142._0_4_ + -1.0;
                auVar149._4_4_ = auVar478._4_4_ + auVar142._4_4_ + -1.0;
                auVar149._8_4_ = auVar478._8_4_ + auVar142._8_4_ + -1.0;
                auVar149._12_4_ = auVar478._12_4_ + auVar142._12_4_ + -1.0;
                auVar149._16_4_ = auVar478._16_4_ + auVar142._16_4_ + -1.0;
                auVar149._20_4_ = auVar478._20_4_ + auVar142._20_4_ + -1.0;
                auVar149._24_4_ = auVar478._24_4_ + auVar142._24_4_ + -1.0;
                auVar149._28_4_ = auVar478._28_4_ + auVar142._28_4_ + -1.0;
                auVar255 = vpsubd_avx(auVar255,auVar151._16_16_);
                auVar415._8_4_ = 0xffffff81;
                auVar415._0_8_ = 0xffffff81ffffff81;
                auVar415._12_4_ = 0xffffff81;
                auVar255 = vpaddd_avx(auVar255,auVar415);
                auVar414 = vpsubd_avx(auVar414,auVar151._0_16_);
                auVar414 = vpaddd_avx(auVar415,auVar414);
                auVar235._16_16_ = auVar255;
                auVar235._0_16_ = auVar414;
                auVar24._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                auVar24._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                auVar24._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                auVar24._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                auVar24._16_4_ = auVar149._16_4_ * auVar149._16_4_;
                auVar24._20_4_ = auVar149._20_4_ * auVar149._20_4_;
                auVar24._24_4_ = auVar149._24_4_ * auVar149._24_4_;
                auVar24._28_4_ = auVar151._28_4_;
                auVar408._8_4_ = 0x3d9021bb;
                auVar408._0_8_ = 0x3d9021bb3d9021bb;
                auVar408._12_4_ = 0x3d9021bb;
                auVar408._16_4_ = 0x3d9021bb;
                auVar408._20_4_ = 0x3d9021bb;
                auVar408._24_4_ = 0x3d9021bb;
                auVar408._28_4_ = 0x3d9021bb;
                auVar345._8_4_ = 0xbdebd1b8;
                auVar345._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar345._12_4_ = 0xbdebd1b8;
                auVar345._16_4_ = 0xbdebd1b8;
                auVar345._20_4_ = 0xbdebd1b8;
                auVar345._24_4_ = 0xbdebd1b8;
                auVar345._28_4_ = 0xbdebd1b8;
                auVar255 = vfmadd213ps_fma(auVar408,auVar149,auVar345);
                auVar346._8_4_ = 0x3def251a;
                auVar346._0_8_ = 0x3def251a3def251a;
                auVar346._12_4_ = 0x3def251a;
                auVar346._16_4_ = 0x3def251a;
                auVar346._20_4_ = 0x3def251a;
                auVar346._24_4_ = 0x3def251a;
                auVar346._28_4_ = 0x3def251a;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar149,auVar346);
                auVar347._8_4_ = 0xbdfe5d4f;
                auVar347._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar347._12_4_ = 0xbdfe5d4f;
                auVar347._16_4_ = 0xbdfe5d4f;
                auVar347._20_4_ = 0xbdfe5d4f;
                auVar347._24_4_ = 0xbdfe5d4f;
                auVar347._28_4_ = 0xbdfe5d4f;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar149,auVar347);
                auVar348._8_4_ = 0x3e11e9bf;
                auVar348._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar348._12_4_ = 0x3e11e9bf;
                auVar348._16_4_ = 0x3e11e9bf;
                auVar348._20_4_ = 0x3e11e9bf;
                auVar348._24_4_ = 0x3e11e9bf;
                auVar348._28_4_ = 0x3e11e9bf;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar149,auVar348);
                auVar349._8_4_ = 0xbe2aae50;
                auVar349._0_8_ = 0xbe2aae50be2aae50;
                auVar349._12_4_ = 0xbe2aae50;
                auVar349._16_4_ = 0xbe2aae50;
                auVar349._20_4_ = 0xbe2aae50;
                auVar349._24_4_ = 0xbe2aae50;
                auVar349._28_4_ = 0xbe2aae50;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar149,auVar349);
                auVar350._8_4_ = 0x3e4cceac;
                auVar350._0_8_ = 0x3e4cceac3e4cceac;
                auVar350._12_4_ = 0x3e4cceac;
                auVar350._16_4_ = 0x3e4cceac;
                auVar350._20_4_ = 0x3e4cceac;
                auVar350._24_4_ = 0x3e4cceac;
                auVar350._28_4_ = 0x3e4cceac;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar149,auVar350);
                auVar351._8_4_ = 0xbe7ffffc;
                auVar351._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar351._12_4_ = 0xbe7ffffc;
                auVar351._16_4_ = 0xbe7ffffc;
                auVar351._20_4_ = 0xbe7ffffc;
                auVar351._24_4_ = 0xbe7ffffc;
                auVar351._28_4_ = 0xbe7ffffc;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar149,auVar351);
                auVar352._8_4_ = 0x3eaaaaaa;
                auVar352._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar352._12_4_ = 0x3eaaaaaa;
                auVar352._16_4_ = 0x3eaaaaaa;
                auVar352._20_4_ = 0x3eaaaaaa;
                auVar352._24_4_ = 0x3eaaaaaa;
                auVar352._28_4_ = 0x3eaaaaaa;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar149,auVar352);
                auVar409._0_4_ = auVar149._0_4_ * auVar149._0_4_ * auVar149._0_4_ * auVar255._0_4_;
                auVar409._4_4_ = auVar149._4_4_ * auVar149._4_4_ * auVar149._4_4_ * auVar255._4_4_;
                auVar409._8_4_ = auVar149._8_4_ * auVar149._8_4_ * auVar149._8_4_ * auVar255._8_4_;
                auVar409._12_4_ =
                     auVar149._12_4_ * auVar149._12_4_ * auVar149._12_4_ * auVar255._12_4_;
                auVar409._16_4_ = auVar149._16_4_ * auVar149._16_4_ * auVar149._16_4_ * 0.0;
                auVar409._20_4_ = auVar149._20_4_ * auVar149._20_4_ * auVar149._20_4_ * 0.0;
                auVar409._24_4_ = auVar149._24_4_ * auVar149._24_4_ * auVar149._24_4_ * 0.0;
                auVar409._28_4_ = 0;
                auVar399._8_4_ = 0x3f000000;
                auVar399._0_8_ = 0x3f0000003f000000;
                auVar399._12_4_ = 0x3f000000;
                auVar399._16_4_ = 0x3f000000;
                auVar399._20_4_ = 0x3f000000;
                auVar399._24_4_ = 0x3f000000;
                auVar399._28_4_ = 0x3f000000;
                auVar353._8_4_ = 0x3f800000;
                auVar353._0_8_ = 0x3f8000003f800000;
                auVar353._12_4_ = 0x3f800000;
                auVar353._16_4_ = 0x3f800000;
                auVar353._20_4_ = 0x3f800000;
                auVar353._24_4_ = 0x3f800000;
                auVar353._28_4_ = 0x3f800000;
                auVar151 = vcvtdq2ps_avx(auVar235);
                auVar440._8_4_ = 0xb95e8083;
                auVar440._0_8_ = 0xb95e8083b95e8083;
                auVar440._12_4_ = 0xb95e8083;
                auVar440._16_4_ = 0xb95e8083;
                auVar440._20_4_ = 0xb95e8083;
                auVar440._24_4_ = 0xb95e8083;
                auVar440._28_4_ = 0xb95e8083;
                auVar255 = vfmadd231ps_fma(auVar409,auVar151,auVar440);
                auVar255 = vfmsub231ps_fma(ZEXT1632(auVar255),auVar399,auVar24);
                auVar478 = vcmpps_avx(ZEXT1632(auVar387),ZEXT1632(auVar113),2);
                auVar142 = vsubps_avx(ZEXT1632(auVar255),auVar149);
                auVar255 = vfmsub231ps_fma(auVar142,auVar383,auVar151);
                auVar480._8_4_ = 0xc0000000;
                auVar480._0_8_ = 0xc0000000c0000000;
                auVar480._12_4_ = 0xc0000000;
                auVar480._16_4_ = 0xc0000000;
                auVar480._20_4_ = 0xc0000000;
                auVar480._24_4_ = 0xc0000000;
                auVar480._28_4_ = 0xc0000000;
                auVar150._0_4_ = auVar255._0_4_ * -2.0;
                auVar150._4_4_ = auVar255._4_4_ * -2.0;
                auVar150._8_4_ = auVar255._8_4_ * -2.0;
                auVar150._12_4_ = auVar255._12_4_ * -2.0;
                auVar150._16_4_ = 0x80000000;
                auVar150._20_4_ = 0x80000000;
                auVar150._24_4_ = 0x80000000;
                auVar150._28_4_ = 0;
                auVar236._8_4_ = 0x7fffffff;
                auVar236._0_8_ = 0x7fffffff7fffffff;
                auVar236._12_4_ = 0x7fffffff;
                auVar236._16_4_ = 0x7fffffff;
                auVar236._20_4_ = 0x7fffffff;
                auVar236._24_4_ = 0x7fffffff;
                auVar236._28_4_ = 0x7fffffff;
                auVar478 = vblendvps_avx(auVar150,auVar236,auVar478);
                auVar478 = vminps_avx(auVar459,auVar478);
                auVar151 = vmaxps_avx(auVar467,auVar478);
                auVar255 = vfmadd213ps_fma(auVar474,auVar151,auVar399);
                auVar142 = vroundps_avx(ZEXT1632(auVar255),1);
                auVar478 = vcmpps_avx(ZEXT1632(auVar255),auVar142,1);
                auVar478 = vandps_avx(auVar478,auVar353);
                auVar478 = vsubps_avx(auVar142,auVar478);
                auVar255 = vfmsub231ps_fma(auVar151,auVar478,auVar383);
                auVar328._8_4_ = 0xb95e8083;
                auVar328._0_8_ = 0xb95e8083b95e8083;
                auVar328._12_4_ = 0xb95e8083;
                auVar328._16_4_ = 0xb95e8083;
                auVar328._20_4_ = 0xb95e8083;
                auVar328._24_4_ = 0xb95e8083;
                auVar328._28_4_ = 0xb95e8083;
                auVar414 = vfnmsub231ps_fma(ZEXT1632(auVar255),auVar478,auVar328);
                auVar151 = ZEXT1632(auVar414);
                auVar25._28_4_ = 0xb95e8083;
                auVar25._0_28_ =
                     ZEXT1628(CONCAT412(auVar414._12_4_ * auVar414._12_4_,
                                        CONCAT48(auVar414._8_4_ * auVar414._8_4_,
                                                 CONCAT44(auVar414._4_4_ * auVar414._4_4_,
                                                          auVar414._0_4_ * auVar414._0_4_))));
                auVar255 = vfmadd213ps_fma(auVar376,auVar151,auVar398);
                auVar274._8_4_ = 0x3c088908;
                auVar274._0_8_ = 0x3c0889083c088908;
                auVar274._12_4_ = 0x3c088908;
                auVar274._16_4_ = 0x3c088908;
                auVar274._20_4_ = 0x3c088908;
                auVar274._24_4_ = 0x3c088908;
                auVar274._28_4_ = 0x3c088908;
                auVar377 = ZEXT3264(auVar274);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar151,auVar274);
                auVar275._8_4_ = 0x3d2aa9c1;
                auVar275._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar275._12_4_ = 0x3d2aa9c1;
                auVar275._16_4_ = 0x3d2aa9c1;
                auVar275._20_4_ = 0x3d2aa9c1;
                auVar275._24_4_ = 0x3d2aa9c1;
                auVar275._28_4_ = 0x3d2aa9c1;
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar151,auVar275);
                auVar276._8_4_ = 0x3e2aaaaa;
                auVar276._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar276._12_4_ = 0x3e2aaaaa;
                auVar276._16_4_ = 0x3e2aaaaa;
                auVar276._20_4_ = 0x3e2aaaaa;
                auVar276._24_4_ = 0x3e2aaaaa;
                auVar276._28_4_ = 0x3e2aaaaa;
                auVar151 = ZEXT1632(auVar414);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar151,auVar276);
                auVar103 = ZEXT3264(auVar399);
                auVar255 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar151,auVar399);
                auVar387 = vfmadd213ps_fma(ZEXT1632(auVar255),auVar25,auVar151);
                auVar106._0_4_ = (int)auVar478._0_4_;
                auVar106._4_4_ = (int)auVar478._4_4_;
                auVar106._8_4_ = (int)auVar478._8_4_;
                auVar106._12_4_ = (int)auVar478._12_4_;
                auVar152._16_4_ = (int)auVar478._16_4_;
                auVar152._0_16_ = auVar106;
                auVar152._20_4_ = (int)auVar478._20_4_;
                auVar152._24_4_ = (int)auVar478._24_4_;
                auVar152._28_4_ = (int)auVar478._28_4_;
                auVar414 = vpslld_avx(auVar106,0x17);
                auVar255 = vpslld_avx(auVar152._16_16_,0x17);
                auVar392._8_4_ = 0x3f800000;
                auVar392._0_8_ = 0x3f8000003f800000;
                auVar392._12_4_ = 0x3f800000;
                auVar255 = vpaddd_avx(auVar255,auVar392);
                auVar414 = vpaddd_avx(auVar414,auVar392);
                auVar153._16_16_ = auVar255;
                auVar153._0_16_ = auVar414;
                auVar237._0_4_ = auVar387._0_4_ + 1.0;
                auVar237._4_4_ = auVar387._4_4_ + 1.0;
                auVar237._8_4_ = auVar387._8_4_ + 1.0;
                auVar237._12_4_ = auVar387._12_4_ + 1.0;
                auVar237._16_4_ = 0x3f800000;
                auVar237._20_4_ = 0x3f800000;
                auVar237._24_4_ = 0x3f800000;
                auVar237._28_4_ = 0x3f800000;
                auVar255 = vfmadd213ps_fma(auVar153,auVar237,auVar353);
                auVar478 = vrcpps_avx(ZEXT1632(auVar255));
                auVar332 = ZEXT3264(auVar353);
                auVar255 = vfmsub213ps_fma(ZEXT1632(auVar255),auVar478,auVar353);
                auVar255 = vfnmadd132ps_fma(ZEXT1632(auVar255),auVar478,auVar478);
                auVar238._8_4_ = 0xbf800000;
                auVar238._0_8_ = 0xbf800000bf800000;
                auVar238._12_4_ = 0xbf800000;
                auVar238._16_4_ = 0xbf800000;
                auVar238._20_4_ = 0xbf800000;
                auVar238._24_4_ = 0xbf800000;
                auVar238._28_4_ = 0xbf800000;
                auVar255 = vfnmadd213ps_fma(ZEXT1632(auVar255),auVar480,auVar238);
                auVar219 = ZEXT1628(auVar255);
                goto LAB_0025e5ab;
              case 6:
                uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                auVar158._4_4_ = uVar82;
                auVar158._0_4_ = uVar82;
                auVar158._8_4_ = uVar82;
                auVar158._12_4_ = uVar82;
                auVar158._16_4_ = uVar82;
                auVar158._20_4_ = uVar82;
                auVar158._24_4_ = uVar82;
                auVar158._28_4_ = uVar82;
                uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                auVar244._4_4_ = uVar82;
                auVar244._0_4_ = uVar82;
                auVar244._8_4_ = uVar82;
                auVar244._12_4_ = uVar82;
                auVar244._16_4_ = uVar82;
                auVar244._20_4_ = uVar82;
                auVar244._24_4_ = uVar82;
                auVar244._28_4_ = uVar82;
                auVar255 = vfmadd231ps_fma(auVar244,auVar478,auVar158);
                auVar478 = vmaxps_avx(ZEXT1632(auVar113),ZEXT1632(auVar255));
                auVar478 = vminps_avx(auVar478,auVar142);
                auVar219 = auVar478._0_28_;
LAB_0025e5ab:
                auVar39._4_4_ = auVar219._4_4_ * auVar171._4_4_;
                auVar39._0_4_ = auVar219._0_4_ * auVar171._0_4_;
                auVar39._8_4_ = auVar219._8_4_ * auVar171._8_4_;
                auVar39._12_4_ = auVar219._12_4_ * auVar171._12_4_;
                auVar39._16_4_ = auVar219._16_4_ * auVar171._16_4_;
                auVar39._20_4_ = auVar219._20_4_ * auVar171._20_4_;
                auVar39._24_4_ = auVar219._24_4_ * auVar171._24_4_;
                auVar39._28_4_ = auVar480._28_4_;
                auVar480 = auVar39;
              }
              auVar478 = auVar480;
LAB_0025e5b3:
              *(undefined1 (*) [32])local_220 = auVar478;
              local_220 = local_220 + 4;
              iVar45 = iVar45 + 1;
            }
          }
        }
      }
      if (((int)local_160 == 8) && (_elempack == 4)) {
        p_Var56 = local_150[-3];
        uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
        uVar8 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
        iVar78 = *(int *)(&this->field_0xdc + (long)p_Var56);
        iVar79 = *(int *)(&this->field_0xe0 + (long)p_Var56);
        iVar57 = *(int *)(&this->field_0xe4 + (long)p_Var56);
        iVar52 = *(int *)(&this->field_0xe8 + (long)p_Var56);
        iVar58 = *(int *)(&this->field_0x114 + (long)p_Var56);
        lVar61 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
        uVar60 = 0;
        uVar54 = 0;
        if (0 < (int)uVar7) {
          uVar54 = (ulong)uVar7;
        }
        uVar74 = 0;
        if (0 < (int)uVar8) {
          uVar74 = (ulong)uVar8;
        }
        uVar64 = (ulong)(uint)local_1a8.c;
        if (local_1a8.c < 1) {
          uVar64 = uVar60;
        }
        auVar332 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar103 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar84._8_4_ = 0x3f800000;
        auVar84._0_8_ = 0x3f8000003f800000;
        auVar84._12_4_ = 0x3f800000;
        auVar476._8_4_ = 0x3ab743ce;
        auVar476._0_8_ = 0x3ab743ce3ab743ce;
        auVar476._12_4_ = 0x3ab743ce;
        for (; uVar60 != uVar64; uVar60 = uVar60 + 1) {
          local_220 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * uVar60 * local_1a8.elemsize);
          iVar69 = bottom_blob->w;
          iVar76 = bottom_blob->h;
          uVar55 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar55 = 0;
          }
          uVar48 = 0;
          uVar53 = local_1a8.w;
          if (local_1a8.w < 1) {
            uVar53 = 0;
          }
          uVar59 = local_1a8.h;
          if (local_1a8.h < 1) {
            uVar59 = 0;
          }
          for (; uVar48 != uVar59; uVar48 = uVar48 + 1) {
            iVar45 = (1 - uVar7) * iVar78;
            for (uVar63 = 0; uVar63 != uVar53; uVar63 = uVar63 + 1) {
              if (lVar61 == 0) {
                auVar113 = ZEXT816(0) << 0x40;
              }
              else {
                auVar113 = *(undefined1 (*) [16])(lVar61 + uVar60 * 0x10);
              }
              auVar377 = ZEXT1664(auVar113);
              pvVar71 = bottom_blob->data;
              lVar49 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar60 * (this->weight_data_tm).elemsize +
                       0x70;
              for (uVar68 = 0; uVar68 != uVar55; uVar68 = uVar68 + 1) {
                lVar50 = lVar49;
                for (uVar65 = 0; uVar65 != uVar74; uVar65 = uVar65 + 1) {
                  iVar42 = (((int)uVar65 - uVar8) + 1) * iVar79 + uVar48;
                  if (((-1 < iVar42) && (iVar43 = iVar42 / iVar52, iVar42 % iVar52 == 0)) &&
                     (iVar43 < iVar76)) {
                    lVar40 = (long)iVar43 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar68;
                    iVar42 = iVar45;
                    for (lVar75 = 0; uVar54 * 0x80 != lVar75; lVar75 = lVar75 + 0x80) {
                      if (((-1 < iVar42) && (iVar43 = iVar42 / iVar57, iVar42 % iVar57 == 0)) &&
                         (iVar43 < iVar69)) {
                        lVar47 = (long)(iVar43 << 3);
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40);
                        auVar107._4_4_ = uVar82;
                        auVar107._0_4_ = uVar82;
                        auVar107._8_4_ = uVar82;
                        auVar107._12_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 4);
                        auVar173._4_4_ = uVar82;
                        auVar173._0_4_ = uVar82;
                        auVar173._8_4_ = uVar82;
                        auVar173._12_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 8);
                        auVar278._4_4_ = uVar82;
                        auVar278._0_4_ = uVar82;
                        auVar278._8_4_ = uVar82;
                        auVar278._12_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0xc);
                        auVar385._4_4_ = uVar82;
                        auVar385._0_4_ = uVar82;
                        auVar385._8_4_ = uVar82;
                        auVar385._12_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0x10);
                        auVar401._4_4_ = uVar82;
                        auVar401._0_4_ = uVar82;
                        auVar401._8_4_ = uVar82;
                        auVar401._12_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0x14);
                        auVar416._4_4_ = uVar82;
                        auVar416._0_4_ = uVar82;
                        auVar416._8_4_ = uVar82;
                        auVar416._12_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0x18);
                        auVar443._4_4_ = uVar82;
                        auVar443._0_4_ = uVar82;
                        auVar443._8_4_ = uVar82;
                        auVar443._12_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0x1c);
                        auVar461._4_4_ = uVar82;
                        auVar461._0_4_ = uVar82;
                        auVar461._8_4_ = uVar82;
                        auVar461._12_4_ = uVar82;
                        auVar113 = vfmadd231ps_fma(auVar377._0_16_,auVar107,
                                                   *(undefined1 (*) [16])(lVar50 + -0x70 + lVar75));
                        auVar113 = vfmadd231ps_fma(auVar113,auVar173,
                                                   *(undefined1 (*) [16])(lVar50 + -0x60 + lVar75));
                        auVar113 = vfmadd231ps_fma(auVar113,auVar278,
                                                   *(undefined1 (*) [16])(lVar50 + -0x50 + lVar75));
                        auVar113 = vfmadd231ps_fma(auVar113,auVar385,
                                                   *(undefined1 (*) [16])(lVar50 + -0x40 + lVar75));
                        auVar113 = vfmadd231ps_fma(auVar113,auVar401,
                                                   *(undefined1 (*) [16])(lVar50 + -0x30 + lVar75));
                        auVar113 = vfmadd231ps_fma(auVar113,auVar416,
                                                   *(undefined1 (*) [16])(lVar50 + -0x20 + lVar75));
                        auVar113 = vfmadd231ps_fma(auVar113,auVar443,
                                                   *(undefined1 (*) [16])(lVar50 + -0x10 + lVar75));
                        auVar113 = vfmadd231ps_fma(auVar113,auVar461,
                                                   *(undefined1 (*) [16])(lVar50 + lVar75));
                        auVar377 = ZEXT1664(auVar113);
                      }
                      iVar42 = iVar42 + iVar78;
                    }
                  }
                  lVar50 = lVar50 + (long)(int)uVar7 * 0x80;
                }
                lVar49 = lVar49 + (long)(int)(uVar7 * uVar8 * 0x20) * 4;
              }
              auVar113 = auVar377._0_16_;
              if (iVar58 - 1U < 6) {
                auVar414 = auVar332._0_16_;
                auVar115 = vmaxps_avx(auVar113,auVar414);
                auVar255 = auVar103._0_16_;
                switch(iVar58) {
                case 2:
                  auVar113 = vminps_avx(auVar113,auVar414);
                  uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                  auVar386._4_4_ = uVar82;
                  auVar386._0_4_ = uVar82;
                  auVar386._8_4_ = uVar82;
                  auVar386._12_4_ = uVar82;
                  auVar115 = vfmadd231ps_fma(auVar115,auVar113,auVar386);
                  break;
                case 3:
                  uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                  auVar110._4_4_ = uVar82;
                  auVar110._0_4_ = uVar82;
                  auVar110._8_4_ = uVar82;
                  auVar110._12_4_ = uVar82;
                  uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                  auVar388._4_4_ = uVar82;
                  auVar388._0_4_ = uVar82;
                  auVar388._8_4_ = uVar82;
                  auVar388._12_4_ = uVar82;
                  auVar113 = vmaxps_avx(auVar113,auVar110);
                  auVar115 = vminps_avx(auVar388,auVar113);
                  break;
                case 4:
                  auVar111._0_8_ = auVar377._0_8_ ^ 0x8000000080000000;
                  auVar111._8_4_ = -auVar377._8_4_;
                  auVar111._12_4_ = -auVar377._12_4_;
                  auVar180._8_4_ = 0x42b0c0a5;
                  auVar180._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar180._12_4_ = 0x42b0c0a5;
                  auVar113 = vminps_avx(auVar111,auVar180);
                  auVar181._8_4_ = 0xc2b0c0a5;
                  auVar181._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar181._12_4_ = 0xc2b0c0a5;
                  auVar387 = vmaxps_avx(auVar113,auVar181);
                  auVar389._8_4_ = 0x3fb8aa3b;
                  auVar389._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar389._12_4_ = 0x3fb8aa3b;
                  auVar113 = vfmadd213ps_fma(auVar389,auVar387,auVar255);
                  auVar487._0_4_ = (int)auVar113._0_4_;
                  auVar487._4_4_ = (int)auVar113._4_4_;
                  auVar487._8_4_ = (int)auVar113._8_4_;
                  auVar487._12_4_ = (int)auVar113._12_4_;
                  auVar414 = vcvtdq2ps_avx(auVar487);
                  auVar113 = vcmpps_avx(auVar113,auVar414,1);
                  auVar113 = vandps_avx(auVar113,auVar84);
                  auVar113 = vsubps_avx(auVar414,auVar113);
                  auVar182._8_4_ = 0x3f318000;
                  auVar182._0_8_ = 0x3f3180003f318000;
                  auVar182._12_4_ = 0x3f318000;
                  auVar414 = vfmsub231ps_fma(auVar387,auVar113,auVar182);
                  auVar183._8_4_ = 0x395e8083;
                  auVar183._0_8_ = 0x395e8083395e8083;
                  auVar183._12_4_ = 0x395e8083;
                  auVar387 = vfmsub231ps_fma(auVar414,auVar113,auVar183);
                  auVar488._0_4_ = auVar387._0_4_ * auVar387._0_4_;
                  auVar488._4_4_ = auVar387._4_4_ * auVar387._4_4_;
                  auVar488._8_4_ = auVar387._8_4_ * auVar387._8_4_;
                  auVar488._12_4_ = auVar387._12_4_ * auVar387._12_4_;
                  auVar420._8_4_ = 0x39506967;
                  auVar420._0_8_ = 0x3950696739506967;
                  auVar420._12_4_ = 0x39506967;
                  auVar184._8_4_ = 0x3ab743ce;
                  auVar184._0_8_ = 0x3ab743ce3ab743ce;
                  auVar184._12_4_ = 0x3ab743ce;
                  auVar414 = vfmadd213ps_fma(auVar420,auVar387,auVar184);
                  auVar185._8_4_ = 0x3c088908;
                  auVar185._0_8_ = 0x3c0889083c088908;
                  auVar185._12_4_ = 0x3c088908;
                  auVar414 = vfmadd213ps_fma(auVar414,auVar387,auVar185);
                  auVar186._8_4_ = 0x3d2aa9c1;
                  auVar186._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar186._12_4_ = 0x3d2aa9c1;
                  auVar414 = vfmadd213ps_fma(auVar414,auVar387,auVar186);
                  auVar187._8_4_ = 0x3e2aaaaa;
                  auVar187._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar187._12_4_ = 0x3e2aaaaa;
                  auVar414 = vfmadd213ps_fma(auVar414,auVar387,auVar187);
                  auVar255 = vfmadd213ps_fma(auVar414,auVar387,auVar255);
                  auVar255 = vfmadd213ps_fma(auVar255,auVar488,auVar387);
                  auVar421._0_4_ = auVar255._0_4_ + 1.0;
                  auVar421._4_4_ = auVar255._4_4_ + 1.0;
                  auVar421._8_4_ = auVar255._8_4_ + 1.0;
                  auVar421._12_4_ = auVar255._12_4_ + 1.0;
                  auVar112._0_4_ = (int)auVar113._0_4_;
                  auVar112._4_4_ = (int)auVar113._4_4_;
                  auVar112._8_4_ = (int)auVar113._8_4_;
                  auVar112._12_4_ = (int)auVar113._12_4_;
                  auVar113 = vpslld_avx(auVar112,0x17);
                  auVar113 = vpaddd_avx(auVar113,auVar84);
                  auVar255 = vfmadd213ps_fma(auVar113,auVar421,auVar84);
                  auVar113 = vrcpps_avx(auVar255);
                  auVar255 = vfmsub213ps_fma(auVar255,auVar113,auVar84);
                  auVar115 = vfnmadd132ps_fma(auVar255,auVar113,auVar113);
                  break;
                case 5:
                  auVar444._8_4_ = 0x42b0c0a5;
                  auVar444._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar444._12_4_ = 0x42b0c0a5;
                  auVar414 = vminps_avx(auVar113,auVar444);
                  auVar462._8_4_ = 0xc2b0c0a5;
                  auVar462._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar462._12_4_ = 0xc2b0c0a5;
                  auVar122 = vmaxps_avx(auVar462,auVar414);
                  auVar469._8_4_ = 0x3fb8aa3b;
                  auVar469._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar469._12_4_ = 0x3fb8aa3b;
                  auVar414 = vfmadd213ps_fma(auVar469,auVar122,auVar255);
                  auVar417._0_4_ = (int)auVar414._0_4_;
                  auVar417._4_4_ = (int)auVar414._4_4_;
                  auVar417._8_4_ = (int)auVar414._8_4_;
                  auVar417._12_4_ = (int)auVar414._12_4_;
                  auVar387 = vcvtdq2ps_avx(auVar417);
                  auVar414 = vcmpps_avx(auVar414,auVar387,1);
                  auVar414 = vandps_avx(auVar414,auVar84);
                  auVar414 = vsubps_avx(auVar387,auVar414);
                  auVar445._8_4_ = 0x3f318000;
                  auVar445._0_8_ = 0x3f3180003f318000;
                  auVar445._12_4_ = 0x3f318000;
                  auVar387 = vfmsub231ps_fma(auVar122,auVar414,auVar445);
                  auVar463._8_4_ = 0xb95e8083;
                  auVar463._0_8_ = 0xb95e8083b95e8083;
                  auVar463._12_4_ = 0xb95e8083;
                  auVar122 = vfnmsub231ps_fma(auVar387,auVar414,auVar463);
                  auVar418._0_4_ = auVar122._0_4_ * auVar122._0_4_;
                  auVar418._4_4_ = auVar122._4_4_ * auVar122._4_4_;
                  auVar418._8_4_ = auVar122._8_4_ * auVar122._8_4_;
                  auVar418._12_4_ = auVar122._12_4_ * auVar122._12_4_;
                  auVar378._8_4_ = 0x39506967;
                  auVar378._0_8_ = 0x3950696739506967;
                  auVar378._12_4_ = 0x39506967;
                  auVar387 = vfmadd213ps_fma(auVar378,auVar122,auVar476);
                  auVar257._8_4_ = 0x3c088908;
                  auVar257._0_8_ = 0x3c0889083c088908;
                  auVar257._12_4_ = 0x3c088908;
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar257);
                  auVar364._8_4_ = 0x3d2aa9c1;
                  auVar364._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar364._12_4_ = 0x3d2aa9c1;
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar364);
                  auVar365._8_4_ = 0x3e2aaaaa;
                  auVar365._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar365._12_4_ = 0x3e2aaaaa;
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar365);
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar255);
                  auVar387 = vfmadd213ps_fma(auVar387,auVar418,auVar122);
                  auVar174._0_4_ = auVar387._0_4_ + 1.0;
                  auVar174._4_4_ = auVar387._4_4_ + 1.0;
                  auVar174._8_4_ = auVar387._8_4_ + 1.0;
                  auVar174._12_4_ = auVar387._12_4_ + 1.0;
                  auVar108._0_4_ = (int)auVar414._0_4_;
                  auVar108._4_4_ = (int)auVar414._4_4_;
                  auVar108._8_4_ = (int)auVar414._8_4_;
                  auVar108._12_4_ = (int)auVar414._12_4_;
                  auVar414 = vpslld_avx(auVar108,0x17);
                  auVar414 = vpaddd_avx(auVar414,auVar84);
                  auVar256 = vfmadd213ps_fma(auVar414,auVar174,auVar84);
                  auVar175._8_4_ = 0x800000;
                  auVar175._0_8_ = 0x80000000800000;
                  auVar175._12_4_ = 0x800000;
                  auVar414 = vmaxps_avx(auVar256,auVar175);
                  auVar387 = vpsrld_avx(auVar414,0x17);
                  auVar279._8_4_ = 0xffffff82;
                  auVar279._0_8_ = 0xffffff82ffffff82;
                  auVar279._12_4_ = 0xffffff82;
                  auVar387 = vpaddd_avx(auVar387,auVar279);
                  auVar280._8_4_ = 0x807fffff;
                  auVar280._0_8_ = 0x807fffff807fffff;
                  auVar280._12_4_ = 0x807fffff;
                  auVar414 = vandps_avx(auVar414,auVar280);
                  auVar105 = vorps_avx(auVar414,auVar255);
                  auVar122 = vcvtdq2ps_avx(auVar387);
                  auVar281._8_4_ = 0x3f3504f3;
                  auVar281._0_8_ = 0x3f3504f33f3504f3;
                  auVar281._12_4_ = 0x3f3504f3;
                  auVar387 = vcmpps_avx(auVar105,auVar281,1);
                  auVar414 = vandps_avx(auVar387,auVar105);
                  auVar176._0_4_ = auVar414._0_4_ + auVar105._0_4_ + -1.0;
                  auVar176._4_4_ = auVar414._4_4_ + auVar105._4_4_ + -1.0;
                  auVar176._8_4_ = auVar414._8_4_ + auVar105._8_4_ + -1.0;
                  auVar176._12_4_ = auVar414._12_4_ + auVar105._12_4_ + -1.0;
                  auVar414 = vandps_avx(auVar387,auVar84);
                  auVar387 = vsubps_avx(auVar122,auVar414);
                  auVar402._0_4_ = auVar176._0_4_ * auVar176._0_4_;
                  auVar402._4_4_ = auVar176._4_4_ * auVar176._4_4_;
                  auVar402._8_4_ = auVar176._8_4_ * auVar176._8_4_;
                  auVar402._12_4_ = auVar176._12_4_ * auVar176._12_4_;
                  auVar419._8_4_ = 0x3d9021bb;
                  auVar419._0_8_ = 0x3d9021bb3d9021bb;
                  auVar419._12_4_ = 0x3d9021bb;
                  auVar282._8_4_ = 0xbdebd1b8;
                  auVar282._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar282._12_4_ = 0xbdebd1b8;
                  auVar414 = vfmadd213ps_fma(auVar419,auVar176,auVar282);
                  auVar283._8_4_ = 0x3def251a;
                  auVar283._0_8_ = 0x3def251a3def251a;
                  auVar283._12_4_ = 0x3def251a;
                  auVar414 = vfmadd213ps_fma(auVar414,auVar176,auVar283);
                  auVar284._8_4_ = 0xbdfe5d4f;
                  auVar284._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar284._12_4_ = 0xbdfe5d4f;
                  auVar414 = vfmadd213ps_fma(auVar414,auVar176,auVar284);
                  auVar285._8_4_ = 0x3e11e9bf;
                  auVar285._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar285._12_4_ = 0x3e11e9bf;
                  auVar414 = vfmadd213ps_fma(auVar414,auVar176,auVar285);
                  auVar286._8_4_ = 0xbe2aae50;
                  auVar286._0_8_ = 0xbe2aae50be2aae50;
                  auVar286._12_4_ = 0xbe2aae50;
                  auVar414 = vfmadd213ps_fma(auVar414,auVar176,auVar286);
                  auVar287._8_4_ = 0x3e4cceac;
                  auVar287._0_8_ = 0x3e4cceac3e4cceac;
                  auVar287._12_4_ = 0x3e4cceac;
                  auVar414 = vfmadd213ps_fma(auVar414,auVar176,auVar287);
                  auVar288._8_4_ = 0xbe7ffffc;
                  auVar288._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar288._12_4_ = 0xbe7ffffc;
                  auVar414 = vfmadd213ps_fma(auVar414,auVar176,auVar288);
                  auVar289._8_4_ = 0x3eaaaaaa;
                  auVar289._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar289._12_4_ = 0x3eaaaaaa;
                  auVar414 = vfmadd213ps_fma(auVar414,auVar176,auVar289);
                  auVar290._0_4_ = auVar414._0_4_ * auVar402._0_4_ * auVar176._0_4_;
                  auVar290._4_4_ = auVar414._4_4_ * auVar402._4_4_ * auVar176._4_4_;
                  auVar290._8_4_ = auVar414._8_4_ * auVar402._8_4_ * auVar176._8_4_;
                  auVar290._12_4_ = auVar414._12_4_ * auVar402._12_4_ * auVar176._12_4_;
                  auVar414 = vfmadd231ps_fma(auVar290,auVar387,auVar463);
                  auVar122 = vfmsub231ps_fma(auVar414,auVar255,auVar402);
                  auVar414 = vcmpps_avx(auVar256,_DAT_004eb480,2);
                  auVar122 = vsubps_avx(auVar122,auVar176);
                  auVar387 = vfnmadd231ps_fma(auVar122,auVar445,auVar387);
                  auVar177._0_4_ = auVar387._0_4_ + auVar387._0_4_;
                  auVar177._4_4_ = auVar387._4_4_ + auVar387._4_4_;
                  auVar177._8_4_ = auVar387._8_4_ + auVar387._8_4_;
                  auVar177._12_4_ = auVar387._12_4_ + auVar387._12_4_;
                  auVar291._8_4_ = 0x7fffffff;
                  auVar291._0_8_ = 0x7fffffff7fffffff;
                  auVar291._12_4_ = 0x7fffffff;
                  auVar414 = vblendvps_avx(auVar177,auVar291,auVar414);
                  auVar178._8_4_ = 0x42b0c0a5;
                  auVar178._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar178._12_4_ = 0x42b0c0a5;
                  auVar414 = vminps_avx(auVar414,auVar178);
                  auVar179._8_4_ = 0xc2b0c0a5;
                  auVar179._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar179._12_4_ = 0xc2b0c0a5;
                  auVar122 = vmaxps_avx(auVar414,auVar179);
                  auVar414 = vfmadd213ps_fma(auVar469,auVar122,auVar255);
                  auVar292._0_4_ = (int)auVar414._0_4_;
                  auVar292._4_4_ = (int)auVar414._4_4_;
                  auVar292._8_4_ = (int)auVar414._8_4_;
                  auVar292._12_4_ = (int)auVar414._12_4_;
                  auVar387 = vcvtdq2ps_avx(auVar292);
                  auVar414 = vcmpps_avx(auVar414,auVar387,1);
                  auVar414 = vandps_avx(auVar414,auVar84);
                  auVar414 = vsubps_avx(auVar387,auVar414);
                  auVar387 = vfmsub231ps_fma(auVar122,auVar414,auVar445);
                  auVar122 = vfnmsub231ps_fma(auVar387,auVar414,auVar463);
                  auVar293._0_4_ = auVar122._0_4_ * auVar122._0_4_;
                  auVar293._4_4_ = auVar122._4_4_ * auVar122._4_4_;
                  auVar293._8_4_ = auVar122._8_4_ * auVar122._8_4_;
                  auVar293._12_4_ = auVar122._12_4_ * auVar122._12_4_;
                  auVar387 = vfmadd213ps_fma(auVar378,auVar122,auVar476);
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar257);
                  auVar103 = ZEXT1664(auVar255);
                  auVar332 = ZEXT864(0);
                  auVar379._8_4_ = 0x3d2aa9c1;
                  auVar379._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar379._12_4_ = 0x3d2aa9c1;
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar379);
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar365);
                  auVar255 = vfmadd213ps_fma(auVar387,auVar122,auVar255);
                  auVar255 = vfmadd213ps_fma(auVar255,auVar293,auVar122);
                  auVar294._0_4_ = auVar255._0_4_ + 1.0;
                  auVar294._4_4_ = auVar255._4_4_ + 1.0;
                  auVar294._8_4_ = auVar255._8_4_ + 1.0;
                  auVar294._12_4_ = auVar255._12_4_ + 1.0;
                  auVar109._0_4_ = (int)auVar414._0_4_;
                  auVar109._4_4_ = (int)auVar414._4_4_;
                  auVar109._8_4_ = (int)auVar414._8_4_;
                  auVar109._12_4_ = (int)auVar414._12_4_;
                  auVar255 = vpslld_avx(auVar109,0x17);
                  auVar255 = vpaddd_avx(auVar255,auVar84);
                  auVar414 = vfmadd213ps_fma(auVar255,auVar294,auVar84);
                  auVar255 = vrcpps_avx(auVar414);
                  auVar295._0_4_ = auVar255._0_4_ + auVar255._0_4_;
                  auVar295._4_4_ = auVar255._4_4_ + auVar255._4_4_;
                  auVar295._8_4_ = auVar255._8_4_ + auVar255._8_4_;
                  auVar295._12_4_ = auVar255._12_4_ + auVar255._12_4_;
                  auVar366._8_4_ = 0x40000000;
                  auVar366._0_8_ = 0x4000000040000000;
                  auVar366._12_4_ = 0x40000000;
                  auVar414 = vfmsub213ps_fma(auVar414,auVar295,auVar366);
                  auVar255 = vfnmadd213ps_fma(auVar414,auVar255,auVar295);
                  auVar115 = vfmsub213ps_fma(auVar255,auVar113,auVar113);
                  break;
                case 6:
                  uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                  auVar114._4_4_ = uVar82;
                  auVar114._0_4_ = uVar82;
                  auVar114._8_4_ = uVar82;
                  auVar114._12_4_ = uVar82;
                  uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                  auVar188._4_4_ = uVar82;
                  auVar188._0_4_ = uVar82;
                  auVar188._8_4_ = uVar82;
                  auVar188._12_4_ = uVar82;
                  auVar113 = vfmadd231ps_fma(auVar188,auVar113,auVar114);
                  auVar113 = vmaxps_avx(auVar113,auVar414);
                  auVar113 = vminps_avx(auVar113,auVar84);
                  auVar115._0_4_ = auVar377._0_4_ * auVar113._0_4_;
                  auVar115._4_4_ = auVar377._4_4_ * auVar113._4_4_;
                  auVar115._8_4_ = auVar377._8_4_ * auVar113._8_4_;
                  auVar115._12_4_ = auVar377._12_4_ * auVar113._12_4_;
                }
                auVar113 = auVar115;
              }
              *(undefined1 (*) [16])local_220 = auVar113;
              local_220 = local_220 + 2;
              iVar45 = iVar45 + 1;
            }
          }
        }
      }
      if (((int)local_160 == 1) && (_elempack == 8)) {
        p_Var56 = local_150[-3];
        uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
        uVar8 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
        iVar78 = *(int *)(&this->field_0xdc + (long)p_Var56);
        iVar79 = *(int *)(&this->field_0xe0 + (long)p_Var56);
        iVar57 = *(int *)(&this->field_0xe4 + (long)p_Var56);
        iVar52 = *(int *)(&this->field_0xe8 + (long)p_Var56);
        iVar58 = *(int *)(&this->field_0x114 + (long)p_Var56);
        lVar61 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
        uVar60 = 0;
        uVar54 = 0;
        if (0 < (int)uVar7) {
          uVar54 = (ulong)uVar7;
        }
        uVar74 = 0;
        if (0 < (int)uVar8) {
          uVar74 = (ulong)uVar8;
        }
        uVar64 = (ulong)(uint)local_1a8.c;
        if (local_1a8.c < 1) {
          uVar64 = uVar60;
        }
        auVar460 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar103 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar468 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar332 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar171 = ZEXT3264(CONCAT428(0x3f318000,
                                      CONCAT424(0x3f318000,
                                                CONCAT420(0x3f318000,
                                                          CONCAT416(0x3f318000,
                                                                    CONCAT412(0x3f318000,
                                                                              CONCAT48(0x3f318000,
                                                                                                                                                                              
                                                  0x3f3180003f318000)))))));
        auVar475 = ZEXT3264(CONCAT428(0x3ab743ce,
                                      CONCAT424(0x3ab743ce,
                                                CONCAT420(0x3ab743ce,
                                                          CONCAT416(0x3ab743ce,
                                                                    CONCAT412(0x3ab743ce,
                                                                              CONCAT48(0x3ab743ce,
                                                                                                                                                                              
                                                  0x3ab743ce3ab743ce)))))));
        auVar400 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar384 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        auVar498 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                      CONCAT424(0x3d2aa9c1,
                                                CONCAT420(0x3d2aa9c1,
                                                          CONCAT416(0x3d2aa9c1,
                                                                    CONCAT412(0x3d2aa9c1,
                                                                              CONCAT48(0x3d2aa9c1,
                                                                                                                                                                              
                                                  0x3d2aa9c13d2aa9c1)))))));
        auVar377 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                      CONCAT424(0x3e2aaaaa,
                                                CONCAT420(0x3e2aaaaa,
                                                          CONCAT416(0x3e2aaaaa,
                                                                    CONCAT412(0x3e2aaaaa,
                                                                              CONCAT48(0x3e2aaaaa,
                                                                                                                                                                              
                                                  0x3e2aaaaa3e2aaaaa)))))));
        auVar413 = ZEXT1664(ZEXT816(0) << 0x40);
        for (; uVar60 != uVar64; uVar60 = uVar60 + 1) {
          local_220 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * uVar60 * local_1a8.elemsize);
          iVar69 = bottom_blob->w;
          iVar76 = bottom_blob->h;
          uVar48 = 0;
          uVar53 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar53 = uVar48;
          }
          uVar59 = local_1a8.w;
          if (local_1a8.w < 1) {
            uVar59 = 0;
          }
          uVar63 = local_1a8.h;
          if (local_1a8.h < 1) {
            uVar63 = 0;
          }
          for (; uVar48 != uVar63; uVar48 = uVar48 + 1) {
            iVar45 = (1 - uVar7) * iVar78;
            for (uVar67 = 0; uVar67 != uVar59; uVar67 = uVar67 + 1) {
              if (lVar61 == 0) {
                auVar104 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar104 = ZEXT3264(*(undefined1 (*) [32])(lVar61 + uVar60 * 0x20));
              }
              pvVar71 = (void *)((this->weight_data_tm).cstep * uVar60 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
              for (uVar55 = 0; uVar55 != uVar53; uVar55 = uVar55 + 1) {
                pvVar66 = pvVar71;
                for (uVar68 = 0; uVar68 != uVar74; uVar68 = uVar68 + 1) {
                  iVar42 = (((int)uVar68 - uVar8) + 1) * iVar79 + uVar48;
                  if (((-1 < iVar42) && (iVar43 = iVar42 / iVar52, iVar42 % iVar52 == 0)) &&
                     (iVar43 < iVar76)) {
                    iVar42 = iVar45;
                    for (lVar49 = 0; uVar54 * 0x20 != lVar49; lVar49 = lVar49 + 0x20) {
                      if (((-1 < iVar42) && (iVar44 = iVar42 / iVar57, iVar42 % iVar57 == 0)) &&
                         (iVar44 < iVar69)) {
                        uVar82 = *(undefined4 *)
                                  ((long)bottom_blob->data +
                                  (long)iVar44 * 4 +
                                  (long)iVar43 * (long)bottom_blob->w * bottom_blob->elemsize +
                                  bottom_blob->cstep * bottom_blob->elemsize * uVar55);
                        auVar159._4_4_ = uVar82;
                        auVar159._0_4_ = uVar82;
                        auVar159._8_4_ = uVar82;
                        auVar159._12_4_ = uVar82;
                        auVar159._16_4_ = uVar82;
                        auVar159._20_4_ = uVar82;
                        auVar159._24_4_ = uVar82;
                        auVar159._28_4_ = uVar82;
                        auVar113 = vfmadd231ps_fma(auVar104._0_32_,auVar159,
                                                   *(undefined1 (*) [32])((long)pvVar66 + lVar49));
                        auVar104 = ZEXT1664(auVar113);
                      }
                      iVar42 = iVar42 + iVar78;
                    }
                  }
                  pvVar66 = (void *)((long)pvVar66 + (long)(int)uVar7 * 0x20);
                }
                pvVar71 = (void *)((long)pvVar71 + (long)(int)(uVar7 * uVar8 * 8) * 4);
              }
              auVar478 = auVar104._0_32_;
              auVar484 = auVar478;
              if (5 < iVar58 - 1U) goto switchD_0025f14f_caseD_1;
              auVar161 = auVar413._0_32_;
              auVar484 = vmaxps_avx(auVar161,auVar478);
              auVar142 = auVar332._0_32_;
              auVar96 = auVar171._0_32_;
              auVar471 = auVar460._0_32_;
              auVar493 = auVar468._0_32_;
              auVar151 = auVar103._0_32_;
              auVar449 = auVar400._0_32_;
              auVar231 = auVar475._0_32_;
              auVar435 = auVar384._0_32_;
              switch(iVar58) {
              case 2:
                auVar478 = vminps_avx(auVar161,auVar478);
                uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                auVar160._4_4_ = uVar82;
                auVar160._0_4_ = uVar82;
                auVar160._8_4_ = uVar82;
                auVar160._12_4_ = uVar82;
                auVar160._16_4_ = uVar82;
                auVar160._20_4_ = uVar82;
                auVar160._24_4_ = uVar82;
                auVar160._28_4_ = uVar82;
                auVar113 = vfmadd231ps_fma(auVar484,auVar478,auVar160);
                auVar484 = ZEXT1632(auVar113);
                break;
              case 3:
                uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                auVar168._4_4_ = uVar82;
                auVar168._0_4_ = uVar82;
                auVar168._8_4_ = uVar82;
                auVar168._12_4_ = uVar82;
                auVar168._16_4_ = uVar82;
                auVar168._20_4_ = uVar82;
                auVar168._24_4_ = uVar82;
                auVar168._28_4_ = uVar82;
                uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                auVar485._4_4_ = uVar82;
                auVar485._0_4_ = uVar82;
                auVar485._8_4_ = uVar82;
                auVar485._12_4_ = uVar82;
                auVar485._16_4_ = uVar82;
                auVar485._20_4_ = uVar82;
                auVar485._24_4_ = uVar82;
                auVar485._28_4_ = uVar82;
                auVar478 = vmaxps_avx(auVar478,auVar168);
                auVar484 = vminps_avx(auVar485,auVar478);
                break;
              case 4:
                auVar100._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
                auVar100._8_4_ = -auVar104._8_4_;
                auVar100._12_4_ = -auVar104._12_4_;
                auVar100._16_4_ = -auVar104._16_4_;
                auVar100._20_4_ = -auVar104._20_4_;
                auVar100._24_4_ = -auVar104._24_4_;
                auVar100._28_4_ = auVar104._28_4_ ^ 0x80000000;
                auVar169._8_4_ = 0x42b0c0a5;
                auVar169._0_8_ = 0x42b0c0a542b0c0a5;
                auVar169._12_4_ = 0x42b0c0a5;
                auVar169._16_4_ = 0x42b0c0a5;
                auVar169._20_4_ = 0x42b0c0a5;
                auVar169._24_4_ = 0x42b0c0a5;
                auVar169._28_4_ = 0x42b0c0a5;
                auVar478 = vminps_avx(auVar100,auVar169);
                auVar161 = vmaxps_avx(auVar471,auVar478);
                auVar113 = vfmadd213ps_fma(auVar493,auVar161,auVar151);
                auVar471 = vroundps_avx(ZEXT1632(auVar113),1);
                auVar478 = vcmpps_avx(ZEXT1632(auVar113),auVar471,1);
                auVar478 = vandps_avx(auVar478,auVar142);
                auVar478 = vsubps_avx(auVar471,auVar478);
                auVar113 = vfmsub231ps_fma(auVar161,auVar478,auVar96);
                auVar251._8_4_ = 0x395e8083;
                auVar251._0_8_ = 0x395e8083395e8083;
                auVar251._12_4_ = 0x395e8083;
                auVar251._16_4_ = 0x395e8083;
                auVar251._20_4_ = 0x395e8083;
                auVar251._24_4_ = 0x395e8083;
                auVar251._28_4_ = 0x395e8083;
                auVar255 = vfmsub231ps_fma(ZEXT1632(auVar113),auVar478,auVar251);
                auVar96 = ZEXT1632(auVar255);
                auVar30._28_4_ = auVar471._28_4_;
                auVar30._0_28_ =
                     ZEXT1628(CONCAT412(auVar255._12_4_ * auVar255._12_4_,
                                        CONCAT48(auVar255._8_4_ * auVar255._8_4_,
                                                 CONCAT44(auVar255._4_4_ * auVar255._4_4_,
                                                          auVar255._0_4_ * auVar255._0_4_))));
                auVar113 = vfmadd213ps_fma(auVar449,auVar96,auVar231);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar96,auVar435);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar96,auVar498._0_32_);
                auVar96 = ZEXT1632(auVar255);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar96,auVar377._0_32_);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar96,auVar151);
                auVar414 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar30,auVar96);
                auVar85._0_4_ = (int)auVar478._0_4_;
                auVar85._4_4_ = (int)auVar478._4_4_;
                auVar85._8_4_ = (int)auVar478._8_4_;
                auVar85._12_4_ = (int)auVar478._12_4_;
                auVar101._16_4_ = (int)auVar478._16_4_;
                auVar101._0_16_ = auVar85;
                auVar101._20_4_ = (int)auVar478._20_4_;
                auVar101._24_4_ = (int)auVar478._24_4_;
                auVar101._28_4_ = (int)auVar478._28_4_;
                auVar255 = vpslld_avx(auVar85,0x17);
                auVar113 = vpslld_avx(auVar101._16_16_,0x17);
                auVar190._8_4_ = 0x3f800000;
                auVar190._0_8_ = 0x3f8000003f800000;
                auVar190._12_4_ = 0x3f800000;
                auVar113 = vpaddd_avx(auVar113,auVar190);
                auVar255 = vpaddd_avx(auVar255,auVar190);
                auVar486._16_16_ = auVar113;
                auVar486._0_16_ = auVar255;
                auVar102._0_4_ = auVar414._0_4_ + auVar332._0_4_;
                auVar102._4_4_ = auVar414._4_4_ + auVar332._4_4_;
                auVar102._8_4_ = auVar414._8_4_ + auVar332._8_4_;
                auVar102._12_4_ = auVar414._12_4_ + auVar332._12_4_;
                auVar102._16_4_ = auVar332._16_4_ + 0.0;
                auVar102._20_4_ = auVar332._20_4_ + 0.0;
                auVar102._24_4_ = auVar332._24_4_ + 0.0;
                auVar102._28_4_ = auVar332._28_4_ + 0.0;
                auVar413 = ZEXT864(0) << 0x20;
                auVar113 = vfmadd213ps_fma(auVar486,auVar102,auVar142);
                auVar478 = vrcpps_avx(ZEXT1632(auVar113));
                auVar113 = vfmsub213ps_fma(ZEXT1632(auVar113),auVar478,auVar142);
                auVar113 = vfnmadd132ps_fma(ZEXT1632(auVar113),auVar478,auVar478);
                auVar484 = ZEXT1632(auVar113);
                break;
              case 5:
                auVar441._8_4_ = 0x42b0c0a5;
                auVar441._0_8_ = 0x42b0c0a542b0c0a5;
                auVar441._12_4_ = 0x42b0c0a5;
                auVar441._16_4_ = 0x42b0c0a5;
                auVar441._20_4_ = 0x42b0c0a5;
                auVar441._24_4_ = 0x42b0c0a5;
                auVar441._28_4_ = 0x42b0c0a5;
                auVar478 = vminps_avx(auVar441,auVar478);
                auVar161 = vmaxps_avx(auVar471,auVar478);
                auVar113 = vfmadd213ps_fma(auVar493,auVar161,auVar151);
                auVar273 = vroundps_avx(ZEXT1632(auVar113),1);
                auVar478 = vcmpps_avx(ZEXT1632(auVar113),auVar273,1);
                auVar478 = vandps_avx(auVar478,auVar142);
                auVar478 = vsubps_avx(auVar273,auVar478);
                auVar113 = vfmsub231ps_fma(auVar161,auVar478,auVar96);
                auVar245._8_4_ = 0xb95e8083;
                auVar245._0_8_ = 0xb95e8083b95e8083;
                auVar245._12_4_ = 0xb95e8083;
                auVar245._16_4_ = 0xb95e8083;
                auVar245._20_4_ = 0xb95e8083;
                auVar245._24_4_ = 0xb95e8083;
                auVar245._28_4_ = 0xb95e8083;
                auVar255 = vfnmsub231ps_fma(ZEXT1632(auVar113),auVar478,auVar245);
                auVar161 = ZEXT1632(auVar255);
                auVar27._28_4_ = auVar273._28_4_;
                auVar27._0_28_ =
                     ZEXT1628(CONCAT412(auVar255._12_4_ * auVar255._12_4_,
                                        CONCAT48(auVar255._8_4_ * auVar255._8_4_,
                                                 CONCAT44(auVar255._4_4_ * auVar255._4_4_,
                                                          auVar255._0_4_ * auVar255._0_4_))));
                auVar113 = vfmadd213ps_fma(auVar449,auVar161,auVar231);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar161,auVar435);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar161,auVar498._0_32_);
                auVar161 = ZEXT1632(auVar255);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar161,auVar377._0_32_);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar161,auVar151);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar27,auVar161);
                auVar162._0_4_ = auVar113._0_4_ + auVar332._0_4_;
                auVar162._4_4_ = auVar113._4_4_ + auVar332._4_4_;
                auVar162._8_4_ = auVar113._8_4_ + auVar332._8_4_;
                auVar162._12_4_ = auVar113._12_4_ + auVar332._12_4_;
                auVar162._16_4_ = auVar332._16_4_ + 0.0;
                auVar162._20_4_ = auVar332._20_4_ + 0.0;
                auVar162._24_4_ = auVar332._24_4_ + 0.0;
                auVar162._28_4_ = auVar332._28_4_ + 0.0;
                auVar189._0_4_ = (int)auVar478._0_4_;
                auVar189._4_4_ = (int)auVar478._4_4_;
                auVar189._8_4_ = (int)auVar478._8_4_;
                auVar189._12_4_ = (int)auVar478._12_4_;
                auVar246._16_4_ = (int)auVar478._16_4_;
                auVar246._0_16_ = auVar189;
                auVar246._20_4_ = (int)auVar478._20_4_;
                auVar246._24_4_ = (int)auVar478._24_4_;
                auVar246._28_4_ = (int)auVar478._28_4_;
                auVar255 = vpslld_avx(auVar189,0x17);
                auVar113 = vpslld_avx(auVar246._16_16_,0x17);
                auVar333._8_4_ = 0x3f800000;
                auVar333._0_8_ = 0x3f8000003f800000;
                auVar333._12_4_ = 0x3f800000;
                auVar113 = vpaddd_avx(auVar113,auVar333);
                auVar255 = vpaddd_avx(auVar255,auVar333);
                auVar483._16_16_ = auVar113;
                auVar483._0_16_ = auVar255;
                auVar414 = vfmadd213ps_fma(auVar483,auVar162,auVar142);
                auVar163._8_4_ = 0x800000;
                auVar163._0_8_ = 0x80000000800000;
                auVar163._12_4_ = 0x800000;
                auVar163._16_4_ = 0x800000;
                auVar163._20_4_ = 0x800000;
                auVar163._24_4_ = 0x800000;
                auVar163._28_4_ = 0x800000;
                auVar478 = vmaxps_avx(ZEXT1632(auVar414),auVar163);
                auVar255 = vpsrld_avx(auVar478._0_16_,0x17);
                auVar113 = vpsrld_avx(auVar478._16_16_,0x17);
                auVar329._8_4_ = 0x807fffff;
                auVar329._0_8_ = 0x807fffff807fffff;
                auVar329._12_4_ = 0x807fffff;
                auVar329._16_4_ = 0x807fffff;
                auVar329._20_4_ = 0x807fffff;
                auVar329._24_4_ = 0x807fffff;
                auVar329._28_4_ = 0x807fffff;
                auVar478 = vandps_avx(auVar478,auVar329);
                auVar161 = vorps_avx(auVar478,auVar151);
                auVar330._8_4_ = 0x3f3504f3;
                auVar330._0_8_ = 0x3f3504f33f3504f3;
                auVar330._12_4_ = 0x3f3504f3;
                auVar330._16_4_ = 0x3f3504f3;
                auVar330._20_4_ = 0x3f3504f3;
                auVar330._24_4_ = 0x3f3504f3;
                auVar330._28_4_ = 0x3f3504f3;
                auVar142 = vcmpps_avx(auVar330,auVar161,2);
                auVar478 = vandnps_avx(auVar142,auVar161);
                auVar164._0_4_ = auVar478._0_4_ + auVar161._0_4_ + -1.0;
                auVar164._4_4_ = auVar478._4_4_ + auVar161._4_4_ + -1.0;
                auVar164._8_4_ = auVar478._8_4_ + auVar161._8_4_ + -1.0;
                auVar164._12_4_ = auVar478._12_4_ + auVar161._12_4_ + -1.0;
                auVar164._16_4_ = auVar478._16_4_ + auVar161._16_4_ + -1.0;
                auVar164._20_4_ = auVar478._20_4_ + auVar161._20_4_ + -1.0;
                auVar164._24_4_ = auVar478._24_4_ + auVar161._24_4_ + -1.0;
                auVar164._28_4_ = auVar478._28_4_ + auVar161._28_4_ + -1.0;
                auVar113 = vpsubd_avx(auVar113,auVar142._16_16_);
                auVar422._8_4_ = 0xffffff81;
                auVar422._0_8_ = 0xffffff81ffffff81;
                auVar422._12_4_ = 0xffffff81;
                auVar113 = vpaddd_avx(auVar113,auVar422);
                auVar255 = vpsubd_avx(auVar255,auVar142._0_16_);
                auVar255 = vpaddd_avx(auVar422,auVar255);
                auVar247._16_16_ = auVar113;
                auVar247._0_16_ = auVar255;
                auVar28._4_4_ = auVar164._4_4_ * auVar164._4_4_;
                auVar28._0_4_ = auVar164._0_4_ * auVar164._0_4_;
                auVar28._8_4_ = auVar164._8_4_ * auVar164._8_4_;
                auVar28._12_4_ = auVar164._12_4_ * auVar164._12_4_;
                auVar28._16_4_ = auVar164._16_4_ * auVar164._16_4_;
                auVar28._20_4_ = auVar164._20_4_ * auVar164._20_4_;
                auVar28._24_4_ = auVar164._24_4_ * auVar164._24_4_;
                auVar28._28_4_ = auVar142._28_4_;
                auVar411._8_4_ = 0x3d9021bb;
                auVar411._0_8_ = 0x3d9021bb3d9021bb;
                auVar411._12_4_ = 0x3d9021bb;
                auVar411._16_4_ = 0x3d9021bb;
                auVar411._20_4_ = 0x3d9021bb;
                auVar411._24_4_ = 0x3d9021bb;
                auVar411._28_4_ = 0x3d9021bb;
                auVar354._8_4_ = 0xbdebd1b8;
                auVar354._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar354._12_4_ = 0xbdebd1b8;
                auVar354._16_4_ = 0xbdebd1b8;
                auVar354._20_4_ = 0xbdebd1b8;
                auVar354._24_4_ = 0xbdebd1b8;
                auVar354._28_4_ = 0xbdebd1b8;
                auVar113 = vfmadd213ps_fma(auVar411,auVar164,auVar354);
                auVar355._8_4_ = 0x3def251a;
                auVar355._0_8_ = 0x3def251a3def251a;
                auVar355._12_4_ = 0x3def251a;
                auVar355._16_4_ = 0x3def251a;
                auVar355._20_4_ = 0x3def251a;
                auVar355._24_4_ = 0x3def251a;
                auVar355._28_4_ = 0x3def251a;
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar164,auVar355);
                auVar356._8_4_ = 0xbdfe5d4f;
                auVar356._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar356._12_4_ = 0xbdfe5d4f;
                auVar356._16_4_ = 0xbdfe5d4f;
                auVar356._20_4_ = 0xbdfe5d4f;
                auVar356._24_4_ = 0xbdfe5d4f;
                auVar356._28_4_ = 0xbdfe5d4f;
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar164,auVar356);
                auVar357._8_4_ = 0x3e11e9bf;
                auVar357._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar357._12_4_ = 0x3e11e9bf;
                auVar357._16_4_ = 0x3e11e9bf;
                auVar357._20_4_ = 0x3e11e9bf;
                auVar357._24_4_ = 0x3e11e9bf;
                auVar357._28_4_ = 0x3e11e9bf;
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar164,auVar357);
                auVar358._8_4_ = 0xbe2aae50;
                auVar358._0_8_ = 0xbe2aae50be2aae50;
                auVar358._12_4_ = 0xbe2aae50;
                auVar358._16_4_ = 0xbe2aae50;
                auVar358._20_4_ = 0xbe2aae50;
                auVar358._24_4_ = 0xbe2aae50;
                auVar358._28_4_ = 0xbe2aae50;
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar164,auVar358);
                auVar359._8_4_ = 0x3e4cceac;
                auVar359._0_8_ = 0x3e4cceac3e4cceac;
                auVar359._12_4_ = 0x3e4cceac;
                auVar359._16_4_ = 0x3e4cceac;
                auVar359._20_4_ = 0x3e4cceac;
                auVar359._24_4_ = 0x3e4cceac;
                auVar359._28_4_ = 0x3e4cceac;
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar164,auVar359);
                auVar360._8_4_ = 0xbe7ffffc;
                auVar360._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar360._12_4_ = 0xbe7ffffc;
                auVar360._16_4_ = 0xbe7ffffc;
                auVar360._20_4_ = 0xbe7ffffc;
                auVar360._24_4_ = 0xbe7ffffc;
                auVar360._28_4_ = 0xbe7ffffc;
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar164,auVar360);
                auVar361._8_4_ = 0x3eaaaaaa;
                auVar361._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar361._12_4_ = 0x3eaaaaaa;
                auVar361._16_4_ = 0x3eaaaaaa;
                auVar361._20_4_ = 0x3eaaaaaa;
                auVar361._24_4_ = 0x3eaaaaaa;
                auVar361._28_4_ = 0x3eaaaaaa;
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar164,auVar361);
                auVar412._0_4_ = auVar164._0_4_ * auVar164._0_4_ * auVar164._0_4_ * auVar113._0_4_;
                auVar412._4_4_ = auVar164._4_4_ * auVar164._4_4_ * auVar164._4_4_ * auVar113._4_4_;
                auVar412._8_4_ = auVar164._8_4_ * auVar164._8_4_ * auVar164._8_4_ * auVar113._8_4_;
                auVar412._12_4_ =
                     auVar164._12_4_ * auVar164._12_4_ * auVar164._12_4_ * auVar113._12_4_;
                auVar412._16_4_ = auVar164._16_4_ * auVar164._16_4_ * auVar164._16_4_ * 0.0;
                auVar412._20_4_ = auVar164._20_4_ * auVar164._20_4_ * auVar164._20_4_ * 0.0;
                auVar412._24_4_ = auVar164._24_4_ * auVar164._24_4_ * auVar164._24_4_ * 0.0;
                auVar412._28_4_ = 0;
                auVar460 = ZEXT3264(auVar471);
                auVar468 = ZEXT3264(auVar493);
                auVar475 = ZEXT3264(auVar231);
                auVar400 = ZEXT3264(auVar449);
                auVar171 = ZEXT3264(auVar96);
                auVar384 = ZEXT3264(auVar435);
                auVar103 = ZEXT3264(auVar151);
                auVar497._8_4_ = 0x3d2aa9c1;
                auVar497._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar497._12_4_ = 0x3d2aa9c1;
                auVar497._16_4_ = 0x3d2aa9c1;
                auVar497._20_4_ = 0x3d2aa9c1;
                auVar497._24_4_ = 0x3d2aa9c1;
                auVar497._28_4_ = 0x3d2aa9c1;
                auVar498 = ZEXT3264(auVar497);
                auVar142 = vcvtdq2ps_avx(auVar247);
                auVar442._8_4_ = 0xb95e8083;
                auVar442._0_8_ = 0xb95e8083b95e8083;
                auVar442._12_4_ = 0xb95e8083;
                auVar442._16_4_ = 0xb95e8083;
                auVar442._20_4_ = 0xb95e8083;
                auVar442._24_4_ = 0xb95e8083;
                auVar442._28_4_ = 0xb95e8083;
                auVar113 = vfmadd231ps_fma(auVar412,auVar142,auVar442);
                auVar113 = vfmsub231ps_fma(ZEXT1632(auVar113),auVar151,auVar28);
                auVar478 = vcmpps_avx(ZEXT1632(auVar414),_DAT_004ef8c0,2);
                auVar161 = vsubps_avx(ZEXT1632(auVar113),auVar164);
                auVar113 = vfmsub231ps_fma(auVar161,auVar96,auVar142);
                auVar484._8_4_ = 0xc0000000;
                auVar484._0_8_ = 0xc0000000c0000000;
                auVar484._12_4_ = 0xc0000000;
                auVar484._16_4_ = 0xc0000000;
                auVar484._20_4_ = 0xc0000000;
                auVar484._24_4_ = 0xc0000000;
                auVar484._28_4_ = 0xc0000000;
                auVar165._0_4_ = auVar113._0_4_ * -2.0;
                auVar165._4_4_ = auVar113._4_4_ * -2.0;
                auVar165._8_4_ = auVar113._8_4_ * -2.0;
                auVar165._12_4_ = auVar113._12_4_ * -2.0;
                auVar165._16_4_ = 0x80000000;
                auVar165._20_4_ = 0x80000000;
                auVar165._24_4_ = 0x80000000;
                auVar165._28_4_ = 0;
                auVar248._8_4_ = 0x7fffffff;
                auVar248._0_8_ = 0x7fffffff7fffffff;
                auVar248._12_4_ = 0x7fffffff;
                auVar248._16_4_ = 0x7fffffff;
                auVar248._20_4_ = 0x7fffffff;
                auVar248._24_4_ = 0x7fffffff;
                auVar248._28_4_ = 0x7fffffff;
                auVar478 = vblendvps_avx(auVar165,auVar248,auVar478);
                auVar478 = vminps_avx(auVar478,auVar441);
                auVar142 = vmaxps_avx(auVar471,auVar478);
                auVar113 = vfmadd213ps_fma(auVar493,auVar142,auVar151);
                auVar161 = vroundps_avx(ZEXT1632(auVar113),1);
                auVar478 = vcmpps_avx(ZEXT1632(auVar113),auVar161,1);
                auVar362._8_4_ = 0x3f800000;
                auVar362._0_8_ = 0x3f8000003f800000;
                auVar362._12_4_ = 0x3f800000;
                auVar362._16_4_ = 0x3f800000;
                auVar362._20_4_ = 0x3f800000;
                auVar362._24_4_ = 0x3f800000;
                auVar362._28_4_ = 0x3f800000;
                auVar478 = vandps_avx(auVar478,auVar362);
                auVar363._8_4_ = 0x3e2aaaaa;
                auVar363._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar363._12_4_ = 0x3e2aaaaa;
                auVar363._16_4_ = 0x3e2aaaaa;
                auVar363._20_4_ = 0x3e2aaaaa;
                auVar363._24_4_ = 0x3e2aaaaa;
                auVar363._28_4_ = 0x3e2aaaaa;
                auVar377 = ZEXT3264(auVar363);
                auVar478 = vsubps_avx(auVar161,auVar478);
                auVar113 = vfmsub231ps_fma(auVar142,auVar478,auVar96);
                auVar255 = vfnmsub231ps_fma(ZEXT1632(auVar113),auVar478,auVar442);
                auVar142 = ZEXT1632(auVar255);
                auVar29._28_4_ = auVar161._28_4_;
                auVar29._0_28_ =
                     ZEXT1628(CONCAT412(auVar255._12_4_ * auVar255._12_4_,
                                        CONCAT48(auVar255._8_4_ * auVar255._8_4_,
                                                 CONCAT44(auVar255._4_4_ * auVar255._4_4_,
                                                          auVar255._0_4_ * auVar255._0_4_))));
                auVar113 = vfmadd213ps_fma(auVar449,auVar142,auVar231);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar142,auVar435);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar142,auVar497);
                auVar142 = ZEXT1632(auVar255);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar142,auVar363);
                auVar113 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar142,auVar151);
                auVar414 = vfmadd213ps_fma(ZEXT1632(auVar113),auVar29,auVar142);
                auVar331._8_4_ = 0x3f800000;
                auVar331._0_8_ = 0x3f8000003f800000;
                auVar331._12_4_ = 0x3f800000;
                auVar331._16_4_ = 0x3f800000;
                auVar331._20_4_ = 0x3f800000;
                auVar331._24_4_ = 0x3f800000;
                auVar331._28_4_ = 0x3f800000;
                auVar332 = ZEXT3264(auVar331);
                auVar116._0_4_ = (int)auVar478._0_4_;
                auVar116._4_4_ = (int)auVar478._4_4_;
                auVar116._8_4_ = (int)auVar478._8_4_;
                auVar116._12_4_ = (int)auVar478._12_4_;
                auVar166._16_4_ = (int)auVar478._16_4_;
                auVar166._0_16_ = auVar116;
                auVar166._20_4_ = (int)auVar478._20_4_;
                auVar166._24_4_ = (int)auVar478._24_4_;
                auVar166._28_4_ = (int)auVar478._28_4_;
                auVar255 = vpslld_avx(auVar116,0x17);
                auVar113 = vpslld_avx(auVar166._16_16_,0x17);
                auVar423._8_4_ = 0x3f800000;
                auVar423._0_8_ = 0x3f8000003f800000;
                auVar423._12_4_ = 0x3f800000;
                auVar113 = vpaddd_avx(auVar423,auVar113);
                auVar255 = vpaddd_avx(auVar423,auVar255);
                auVar167._16_16_ = auVar113;
                auVar167._0_16_ = auVar255;
                auVar249._0_4_ = auVar414._0_4_ + 1.0;
                auVar249._4_4_ = auVar414._4_4_ + 1.0;
                auVar249._8_4_ = auVar414._8_4_ + 1.0;
                auVar249._12_4_ = auVar414._12_4_ + 1.0;
                auVar249._16_4_ = 0x3f800000;
                auVar249._20_4_ = 0x3f800000;
                auVar249._24_4_ = 0x3f800000;
                auVar249._28_4_ = 0x3f800000;
                auVar413 = ZEXT864(0) << 0x20;
                auVar113 = vfmadd213ps_fma(auVar167,auVar249,auVar331);
                auVar478 = vrcpps_avx(ZEXT1632(auVar113));
                auVar113 = vfmsub213ps_fma(ZEXT1632(auVar113),auVar478,auVar331);
                auVar113 = vfnmadd132ps_fma(ZEXT1632(auVar113),auVar478,auVar478);
                auVar250._8_4_ = 0xbf800000;
                auVar250._0_8_ = 0xbf800000bf800000;
                auVar250._12_4_ = 0xbf800000;
                auVar250._16_4_ = 0xbf800000;
                auVar250._20_4_ = 0xbf800000;
                auVar250._24_4_ = 0xbf800000;
                auVar250._28_4_ = 0xbf800000;
                auVar113 = vfnmadd213ps_fma(ZEXT1632(auVar113),auVar484,auVar250);
                auVar219 = ZEXT1628(auVar113);
                goto LAB_0025f576;
              case 6:
                uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                auVar170._4_4_ = uVar82;
                auVar170._0_4_ = uVar82;
                auVar170._8_4_ = uVar82;
                auVar170._12_4_ = uVar82;
                auVar170._16_4_ = uVar82;
                auVar170._20_4_ = uVar82;
                auVar170._24_4_ = uVar82;
                auVar170._28_4_ = uVar82;
                uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                auVar252._4_4_ = uVar82;
                auVar252._0_4_ = uVar82;
                auVar252._8_4_ = uVar82;
                auVar252._12_4_ = uVar82;
                auVar252._16_4_ = uVar82;
                auVar252._20_4_ = uVar82;
                auVar252._24_4_ = uVar82;
                auVar252._28_4_ = uVar82;
                auVar113 = vfmadd231ps_fma(auVar252,auVar478,auVar170);
                auVar478 = vmaxps_avx(auVar161,ZEXT1632(auVar113));
                auVar478 = vminps_avx(auVar478,auVar142);
                auVar219 = auVar478._0_28_;
LAB_0025f576:
                auVar38._4_4_ = auVar219._4_4_ * auVar104._4_4_;
                auVar38._0_4_ = auVar219._0_4_ * auVar104._0_4_;
                auVar38._8_4_ = auVar219._8_4_ * auVar104._8_4_;
                auVar38._12_4_ = auVar219._12_4_ * auVar104._12_4_;
                auVar38._16_4_ = auVar219._16_4_ * auVar104._16_4_;
                auVar38._20_4_ = auVar219._20_4_ * auVar104._20_4_;
                auVar38._24_4_ = auVar219._24_4_ * auVar104._24_4_;
                auVar38._28_4_ = auVar484._28_4_;
                auVar484 = auVar38;
              }
switchD_0025f14f_caseD_1:
              *(undefined1 (*) [32])local_220 = auVar484;
              local_220 = local_220 + 4;
              iVar45 = iVar45 + 1;
            }
          }
        }
      }
      if (((int)local_160 == 8) && (_elempack == 1)) {
        p_Var56 = local_150[-3];
        uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
        uVar8 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
        iVar78 = *(int *)(&this->field_0xdc + (long)p_Var56);
        iVar79 = *(int *)(&this->field_0x114 + (long)p_Var56);
        local_128 = local_1a8.elemsize * local_1a8.cstep;
        uVar60 = 0;
        uVar54 = 0;
        if (0 < (int)uVar7) {
          uVar54 = (ulong)uVar7;
        }
        uVar74 = 0;
        if (0 < (int)uVar8) {
          uVar74 = (ulong)uVar8;
        }
        uVar64 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar64 = uVar60;
        }
        uVar53 = local_1a8.w;
        if (local_1a8.w < 1) {
          uVar53 = 0;
        }
        uVar48 = local_1a8.h;
        if (local_1a8.h < 1) {
          uVar48 = 0;
        }
        local_120 = (ulong)(uint)local_1a8.c;
        if (local_1a8.c < 1) {
          local_120 = uVar60;
        }
        iVar57 = *(int *)(&this->field_0xe0 + (long)p_Var56);
        iVar52 = *(int *)(&this->field_0xe4 + (long)p_Var56);
        iVar58 = *(int *)(&this->field_0xe8 + (long)p_Var56);
        lVar61 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
        local_130 = (Allocator *)local_1a8.data;
        iVar69 = bottom_blob->w;
        iVar76 = bottom_blob->h;
        for (; uVar60 != local_120; uVar60 = uVar60 + 1) {
          local_1f0 = (Allocator *)((long)&local_130->_vptr_Allocator + local_128 * uVar60);
          for (uVar59 = 0; uVar59 != uVar48; uVar59 = uVar59 + 1) {
            pfVar70 = *(float **)(&this->field_0x118 + (long)p_Var56);
            sVar11 = (this->weight_data_tm).cstep;
            sVar12 = (this->weight_data_tm).elemsize;
            pvVar71 = (this->weight_data_tm).data;
            iVar45 = (1 - uVar7) * iVar78;
            for (uVar63 = 0; uVar63 != uVar53; uVar63 = uVar63 + 1) {
              if (lVar61 == 0) {
                fVar81 = 0.0;
              }
              else {
                fVar81 = *(float *)(lVar61 + uVar60 * 4);
              }
              auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
              pvVar66 = (void *)(sVar11 * uVar60 * sVar12 + (long)pvVar71);
              for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
                pvVar72 = pvVar66;
                for (uVar68 = 0; uVar68 != uVar74; uVar68 = uVar68 + 1) {
                  iVar42 = (((int)uVar68 - uVar8) + 1) * iVar57 + uVar59;
                  if (((-1 < iVar42) && (iVar43 = iVar42 / iVar58, iVar42 % iVar58 == 0)) &&
                     (iVar43 < iVar76)) {
                    iVar42 = iVar45;
                    for (lVar49 = 0; uVar54 * 0x20 != lVar49; lVar49 = lVar49 + 0x20) {
                      if (((-1 < iVar42) && (iVar44 = iVar42 / iVar52, iVar42 % iVar52 == 0)) &&
                         (iVar44 < iVar69)) {
                        auVar113 = vfmadd231ps_fma(auVar103._0_32_,
                                                   *(undefined1 (*) [32])
                                                    ((long)bottom_blob->data +
                                                    (long)(iVar44 << 3) * 4 +
                                                    (long)iVar43 *
                                                    (long)bottom_blob->w * bottom_blob->elemsize +
                                                    bottom_blob->cstep * bottom_blob->elemsize *
                                                    uVar55),*(undefined1 (*) [32])
                                                             ((long)pvVar72 + lVar49));
                        auVar103 = ZEXT1664(auVar113);
                      }
                      iVar42 = iVar42 + iVar78;
                    }
                  }
                  pvVar72 = (void *)((long)pvVar72 + (long)(int)uVar7 * 0x20);
                }
                pvVar66 = (void *)((long)pvVar66 + (long)(int)(uVar7 * uVar8 * 8) * 4);
              }
              auVar117._0_4_ = auVar103._16_4_ + auVar103._0_4_;
              auVar117._4_4_ = auVar103._20_4_ + auVar103._4_4_;
              auVar117._8_4_ = auVar103._24_4_ + auVar103._8_4_;
              auVar117._12_4_ = auVar103._28_4_ + auVar103._12_4_;
              auVar113 = vshufpd_avx(auVar117,auVar117,1);
              auVar118._0_4_ = auVar113._0_4_ + auVar117._0_4_;
              auVar118._4_4_ = auVar113._4_4_ + auVar117._4_4_;
              auVar118._8_4_ = auVar113._8_4_ + auVar117._8_4_;
              auVar118._12_4_ = auVar113._12_4_ + auVar117._12_4_;
              auVar113 = vmovshdup_avx(auVar118);
              fVar81 = auVar113._0_4_ + fVar81 + auVar118._0_4_;
              auVar113 = ZEXT416((uint)fVar81);
              fVar80 = fVar81;
              if (iVar79 - 1U < 6) {
                switch(iVar79) {
                case 1:
                  auVar113 = vmaxss_avx(ZEXT416((uint)fVar81),ZEXT416(0));
                  fVar80 = auVar113._0_4_;
                  break;
                case 2:
                  auVar86._0_12_ = ZEXT812(0);
                  auVar86._12_4_ = 0;
                  auVar113 = vcmpss_avx(auVar86,ZEXT416((uint)fVar81),1);
                  auVar192._8_4_ = 0x3f800000;
                  auVar192._0_8_ = 0x3f8000003f800000;
                  auVar192._12_4_ = 0x3f800000;
                  auVar113 = vblendvps_avx(ZEXT416((uint)*pfVar70),auVar192,auVar113);
                  fVar80 = auVar113._0_4_ * fVar81;
                  break;
                case 3:
                  auVar113 = vmaxss_avx(auVar113,ZEXT416((uint)*pfVar70));
                  fVar80 = auVar113._0_4_;
                  if (pfVar70[1] < auVar113._0_4_) {
                    fVar80 = pfVar70[1];
                  }
                  break;
                case 4:
                  auVar113 = vminss_avx(auVar113,ZEXT416(0x42b0c0a5));
                  auVar119._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
                  auVar119._8_4_ = auVar113._8_4_ ^ 0x80000000;
                  auVar119._12_4_ = auVar113._12_4_ ^ 0x80000000;
                  auVar113 = vcmpss_avx(auVar113,ZEXT416(0xc2b0c0a5),1);
                  auVar191._8_4_ = 0x42b0c0a5;
                  auVar191._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar191._12_4_ = 0x42b0c0a5;
                  auVar113 = vblendvps_avx(auVar119,auVar191,auVar113);
                  fVar81 = expf(auVar113._0_4_);
                  fVar80 = 1.0 / (fVar81 + 1.0);
                  break;
                case 5:
                  fVar80 = expf(fVar81);
                  fVar80 = logf(fVar80 + 1.0);
                  fVar80 = tanhf(fVar80);
                  fVar80 = fVar80 * fVar81;
                  break;
                case 6:
                  fVar2 = *pfVar70;
                  fVar253 = -pfVar70[1] / fVar2;
                  fVar80 = 0.0;
                  if ((fVar253 <= fVar81) && (fVar80 = fVar81, fVar81 <= fVar253 + 1.0 / fVar2)) {
                    auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar113,
                                               ZEXT416((uint)pfVar70[1]));
                    fVar80 = auVar113._0_4_ * fVar81;
                  }
                }
              }
              *(float *)&local_1f0->_vptr_Allocator = fVar80;
              local_1f0 = (Allocator *)((long)&local_1f0->_vptr_Allocator + 4);
              iVar45 = iVar45 + 1;
            }
          }
        }
      }
      if (((int)local_160 == 4) && (_elempack == 4)) {
        p_Var56 = local_150[-3];
        uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
        uVar8 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
        iVar78 = *(int *)(&this->field_0xdc + (long)p_Var56);
        iVar79 = *(int *)(&this->field_0xe0 + (long)p_Var56);
        iVar57 = *(int *)(&this->field_0xe4 + (long)p_Var56);
        iVar52 = *(int *)(&this->field_0xe8 + (long)p_Var56);
        iVar58 = *(int *)(&this->field_0x114 + (long)p_Var56);
        lVar61 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
        uVar60 = 0;
        uVar54 = 0;
        if (0 < (int)uVar7) {
          uVar54 = (ulong)uVar7;
        }
        uVar74 = 0;
        if (0 < (int)uVar8) {
          uVar74 = (ulong)uVar8;
        }
        uVar64 = (ulong)(uint)local_1a8.c;
        if (local_1a8.c < 1) {
          uVar64 = uVar60;
        }
        auVar171 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar384 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar400 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar334._8_4_ = 0x3f000000;
        auVar334._0_8_ = 0x3f0000003f000000;
        auVar334._12_4_ = 0x3f000000;
        auVar332 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar377 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
        auVar413 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
        auVar103 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
        auVar460 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
        for (; uVar60 != uVar64; uVar60 = uVar60 + 1) {
          local_220 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * uVar60 * local_1a8.elemsize);
          iVar69 = bottom_blob->w;
          iVar76 = bottom_blob->h;
          uVar55 = (ulong)(uint)bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar55 = 0;
          }
          uVar48 = 0;
          uVar53 = local_1a8.w;
          if (local_1a8.w < 1) {
            uVar53 = 0;
          }
          uVar59 = local_1a8.h;
          if (local_1a8.h < 1) {
            uVar59 = 0;
          }
          for (; uVar48 != uVar59; uVar48 = uVar48 + 1) {
            iVar45 = (1 - uVar7) * iVar78;
            for (uVar63 = 0; uVar63 != uVar53; uVar63 = uVar63 + 1) {
              if (lVar61 == 0) {
                auVar113 = ZEXT816(0) << 0x40;
              }
              else {
                auVar113 = *(undefined1 (*) [16])(lVar61 + uVar60 * 0x10);
              }
              auVar468 = ZEXT1664(auVar113);
              pvVar71 = bottom_blob->data;
              lVar49 = (long)(this->weight_data_tm).data +
                       (this->weight_data_tm).cstep * uVar60 * (this->weight_data_tm).elemsize +
                       0x30;
              for (uVar68 = 0; uVar68 != uVar55; uVar68 = uVar68 + 1) {
                lVar50 = lVar49;
                for (uVar65 = 0; uVar65 != uVar74; uVar65 = uVar65 + 1) {
                  iVar42 = (((int)uVar65 - uVar8) + 1) * iVar79 + uVar48;
                  if (((-1 < iVar42) && (iVar43 = iVar42 / iVar52, iVar42 % iVar52 == 0)) &&
                     (iVar43 < iVar76)) {
                    lVar40 = (long)iVar43 * (long)bottom_blob->w * bottom_blob->elemsize +
                             bottom_blob->cstep * bottom_blob->elemsize * uVar68;
                    iVar42 = iVar45;
                    for (lVar75 = 0; uVar54 * 0x40 != lVar75; lVar75 = lVar75 + 0x40) {
                      if (((-1 < iVar42) && (iVar43 = iVar42 / iVar57, iVar42 % iVar57 == 0)) &&
                         (iVar43 < iVar69)) {
                        lVar47 = (long)(iVar43 << 2);
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40);
                        auVar120._4_4_ = uVar82;
                        auVar120._0_4_ = uVar82;
                        auVar120._8_4_ = uVar82;
                        auVar120._12_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 4);
                        auVar193._4_4_ = uVar82;
                        auVar193._0_4_ = uVar82;
                        auVar193._8_4_ = uVar82;
                        auVar193._12_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 8);
                        auVar296._4_4_ = uVar82;
                        auVar296._0_4_ = uVar82;
                        auVar296._8_4_ = uVar82;
                        auVar296._12_4_ = uVar82;
                        uVar82 = *(undefined4 *)((long)pvVar71 + lVar47 * 4 + lVar40 + 0xc);
                        auVar390._4_4_ = uVar82;
                        auVar390._0_4_ = uVar82;
                        auVar390._8_4_ = uVar82;
                        auVar390._12_4_ = uVar82;
                        auVar113 = vfmadd231ps_fma(auVar468._0_16_,auVar120,
                                                   *(undefined1 (*) [16])(lVar50 + -0x30 + lVar75));
                        auVar113 = vfmadd231ps_fma(auVar113,auVar193,
                                                   *(undefined1 (*) [16])(lVar50 + -0x20 + lVar75));
                        auVar113 = vfmadd231ps_fma(auVar113,auVar296,
                                                   *(undefined1 (*) [16])(lVar50 + -0x10 + lVar75));
                        auVar113 = vfmadd231ps_fma(auVar113,auVar390,
                                                   *(undefined1 (*) [16])(lVar50 + lVar75));
                        auVar468 = ZEXT1664(auVar113);
                      }
                      iVar42 = iVar42 + iVar78;
                    }
                  }
                  lVar50 = lVar50 + (long)(int)uVar7 * 0x40;
                }
                lVar49 = lVar49 + (long)(int)(uVar7 * uVar8 * 0x10) * 4;
              }
              auVar113 = auVar468._0_16_;
              if (iVar58 - 1U < 6) {
                auVar122 = auVar171._0_16_;
                auVar128 = vmaxps_avx(auVar113,auVar122);
                auVar414 = auVar332._0_16_;
                auVar387 = auVar377._0_16_;
                auVar255 = auVar103._0_16_;
                auVar277 = auVar460._0_16_;
                auVar106 = auVar413._0_16_;
                auVar256 = auVar400._0_16_;
                auVar105 = auVar384._0_16_;
                fVar81 = auVar332._0_4_;
                fVar80 = auVar332._4_4_;
                fVar2 = auVar332._8_4_;
                fVar253 = auVar332._12_4_;
                switch(iVar58) {
                case 2:
                  auVar113 = vminps_avx(auVar113,auVar122);
                  uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                  auVar391._4_4_ = uVar82;
                  auVar391._0_4_ = uVar82;
                  auVar391._8_4_ = uVar82;
                  auVar391._12_4_ = uVar82;
                  auVar128 = vfmadd231ps_fma(auVar128,auVar113,auVar391);
                  break;
                case 3:
                  uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                  auVar124._4_4_ = uVar82;
                  auVar124._0_4_ = uVar82;
                  auVar124._8_4_ = uVar82;
                  auVar124._12_4_ = uVar82;
                  uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                  auVar393._4_4_ = uVar82;
                  auVar393._0_4_ = uVar82;
                  auVar393._8_4_ = uVar82;
                  auVar393._12_4_ = uVar82;
                  auVar113 = vmaxps_avx(auVar113,auVar124);
                  auVar128 = vminps_avx(auVar393,auVar113);
                  break;
                case 4:
                  auVar125._0_8_ = auVar468._0_8_ ^ 0x8000000080000000;
                  auVar125._8_4_ = -auVar468._8_4_;
                  auVar125._12_4_ = -auVar468._12_4_;
                  auVar90._8_4_ = 0x42b0c0a5;
                  auVar90._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar90._12_4_ = 0x42b0c0a5;
                  auVar113 = vminps_avx(auVar125,auVar90);
                  auVar105 = vmaxps_avx(auVar105,auVar113);
                  auVar113 = vfmadd213ps_fma(auVar256,auVar105,auVar334);
                  auVar489._0_4_ = (int)auVar113._0_4_;
                  auVar489._4_4_ = (int)auVar113._4_4_;
                  auVar489._8_4_ = (int)auVar113._8_4_;
                  auVar489._12_4_ = (int)auVar113._12_4_;
                  auVar122 = vcvtdq2ps_avx(auVar489);
                  auVar113 = vcmpps_avx(auVar113,auVar122,1);
                  auVar113 = vandps_avx(auVar113,auVar414);
                  auVar113 = vsubps_avx(auVar122,auVar113);
                  auVar387 = vfmsub231ps_fma(auVar105,auVar113,auVar387);
                  auVar198._8_4_ = 0x395e8083;
                  auVar198._0_8_ = 0x395e8083395e8083;
                  auVar198._12_4_ = 0x395e8083;
                  auVar387 = vfmsub231ps_fma(auVar387,auVar113,auVar198);
                  auVar490._0_4_ = auVar387._0_4_ * auVar387._0_4_;
                  auVar490._4_4_ = auVar387._4_4_ * auVar387._4_4_;
                  auVar490._8_4_ = auVar387._8_4_ * auVar387._8_4_;
                  auVar490._12_4_ = auVar387._12_4_ * auVar387._12_4_;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar387,auVar106);
                  auVar255 = vfmadd213ps_fma(auVar255,auVar387,auVar277);
                  auVar199._8_4_ = 0x3d2aa9c1;
                  auVar199._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar199._12_4_ = 0x3d2aa9c1;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar387,auVar199);
                  auVar91._8_4_ = 0x3e2aaaaa;
                  auVar91._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar91._12_4_ = 0x3e2aaaaa;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar387,auVar91);
                  auVar255 = vfmadd213ps_fma(auVar255,auVar387,auVar334);
                  auVar255 = vfmadd213ps_fma(auVar255,auVar490,auVar387);
                  auVar428._0_4_ = auVar255._0_4_ + fVar81;
                  auVar428._4_4_ = auVar255._4_4_ + fVar80;
                  auVar428._8_4_ = auVar255._8_4_ + fVar2;
                  auVar428._12_4_ = auVar255._12_4_ + fVar253;
                  auVar126._0_4_ = (int)auVar113._0_4_;
                  auVar126._4_4_ = (int)auVar113._4_4_;
                  auVar126._8_4_ = (int)auVar113._8_4_;
                  auVar126._12_4_ = (int)auVar113._12_4_;
                  auVar113 = vpslld_avx(auVar126,0x17);
                  auVar113 = vpaddd_avx(auVar113,auVar414);
                  auVar255 = vfmadd213ps_fma(auVar113,auVar428,auVar414);
                  auVar113 = vrcpps_avx(auVar255);
                  auVar255 = vfmsub213ps_fma(auVar255,auVar113,auVar414);
                  auVar128 = vfnmadd132ps_fma(auVar255,auVar113,auVar113);
                  break;
                case 5:
                  auVar297._8_4_ = 0x42b0c0a5;
                  auVar297._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar297._12_4_ = 0x42b0c0a5;
                  auVar122 = vminps_avx(auVar113,auVar297);
                  auVar415 = vmaxps_avx(auVar105,auVar122);
                  auVar122 = vfmadd213ps_fma(auVar256,auVar415,auVar334);
                  auVar424._0_4_ = (int)auVar122._0_4_;
                  auVar424._4_4_ = (int)auVar122._4_4_;
                  auVar424._8_4_ = (int)auVar122._8_4_;
                  auVar424._12_4_ = (int)auVar122._12_4_;
                  auVar392 = vcvtdq2ps_avx(auVar424);
                  auVar122 = vcmpps_avx(auVar122,auVar392,1);
                  auVar122 = vandps_avx(auVar122,auVar414);
                  auVar122 = vsubps_avx(auVar392,auVar122);
                  auVar392 = vfmsub231ps_fma(auVar415,auVar122,auVar387);
                  auVar87._8_4_ = 0xb95e8083;
                  auVar87._0_8_ = 0xb95e8083b95e8083;
                  auVar87._12_4_ = 0xb95e8083;
                  auVar415 = vfnmsub231ps_fma(auVar392,auVar122,auVar87);
                  auVar425._0_4_ = auVar415._0_4_ * auVar415._0_4_;
                  auVar425._4_4_ = auVar415._4_4_ * auVar415._4_4_;
                  auVar425._8_4_ = auVar415._8_4_ * auVar415._8_4_;
                  auVar425._12_4_ = auVar415._12_4_ * auVar415._12_4_;
                  auVar392 = vfmadd213ps_fma(auVar255,auVar415,auVar106);
                  auVar392 = vfmadd213ps_fma(auVar392,auVar415,auVar277);
                  auVar367._8_4_ = 0x3d2aa9c1;
                  auVar367._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar367._12_4_ = 0x3d2aa9c1;
                  auVar392 = vfmadd213ps_fma(auVar392,auVar415,auVar367);
                  auVar368._8_4_ = 0x3e2aaaaa;
                  auVar368._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar368._12_4_ = 0x3e2aaaaa;
                  auVar392 = vfmadd213ps_fma(auVar392,auVar415,auVar368);
                  auVar392 = vfmadd213ps_fma(auVar392,auVar415,auVar334);
                  auVar392 = vfmadd213ps_fma(auVar392,auVar425,auVar415);
                  auVar194._0_4_ = auVar392._0_4_ + fVar81;
                  auVar194._4_4_ = auVar392._4_4_ + fVar80;
                  auVar194._8_4_ = auVar392._8_4_ + fVar2;
                  auVar194._12_4_ = auVar392._12_4_ + fVar253;
                  auVar121._0_4_ = (int)auVar122._0_4_;
                  auVar121._4_4_ = (int)auVar122._4_4_;
                  auVar121._8_4_ = (int)auVar122._8_4_;
                  auVar121._12_4_ = (int)auVar122._12_4_;
                  auVar122 = vpslld_avx(auVar121,0x17);
                  auVar122 = vpaddd_avx(auVar122,auVar414);
                  auVar172 = vfmadd213ps_fma(auVar122,auVar194,auVar414);
                  auVar195._8_4_ = 0x800000;
                  auVar195._0_8_ = 0x80000000800000;
                  auVar195._12_4_ = 0x800000;
                  auVar122 = vmaxps_avx(auVar172,auVar195);
                  auVar392 = vpsrld_avx(auVar122,0x17);
                  auVar369._8_4_ = 0xffffff82;
                  auVar369._0_8_ = 0xffffff82ffffff82;
                  auVar369._12_4_ = 0xffffff82;
                  auVar392 = vpaddd_avx(auVar392,auVar369);
                  auVar370._8_4_ = 0x807fffff;
                  auVar370._0_8_ = 0x807fffff807fffff;
                  auVar370._12_4_ = 0x807fffff;
                  auVar122 = vandps_avx(auVar122,auVar370);
                  auVar83 = vorps_avx(auVar122,auVar334);
                  auVar415 = vcvtdq2ps_avx(auVar392);
                  auVar371._8_4_ = 0x3f3504f3;
                  auVar371._0_8_ = 0x3f3504f33f3504f3;
                  auVar371._12_4_ = 0x3f3504f3;
                  auVar392 = vcmpps_avx(auVar83,auVar371,1);
                  auVar122 = vandps_avx(auVar392,auVar83);
                  auVar196._0_4_ = auVar122._0_4_ + auVar83._0_4_ + -1.0;
                  auVar196._4_4_ = auVar122._4_4_ + auVar83._4_4_ + -1.0;
                  auVar196._8_4_ = auVar122._8_4_ + auVar83._8_4_ + -1.0;
                  auVar196._12_4_ = auVar122._12_4_ + auVar83._12_4_ + -1.0;
                  auVar122 = vandps_avx(auVar392,auVar414);
                  auVar392 = vsubps_avx(auVar415,auVar122);
                  auVar403._0_4_ = auVar196._0_4_ * auVar196._0_4_;
                  auVar403._4_4_ = auVar196._4_4_ * auVar196._4_4_;
                  auVar403._8_4_ = auVar196._8_4_ * auVar196._8_4_;
                  auVar403._12_4_ = auVar196._12_4_ * auVar196._12_4_;
                  auVar426._8_4_ = 0x3d9021bb;
                  auVar426._0_8_ = 0x3d9021bb3d9021bb;
                  auVar426._12_4_ = 0x3d9021bb;
                  auVar298._8_4_ = 0xbdebd1b8;
                  auVar298._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar298._12_4_ = 0xbdebd1b8;
                  auVar122 = vfmadd213ps_fma(auVar426,auVar196,auVar298);
                  auVar299._8_4_ = 0x3def251a;
                  auVar299._0_8_ = 0x3def251a3def251a;
                  auVar299._12_4_ = 0x3def251a;
                  auVar122 = vfmadd213ps_fma(auVar122,auVar196,auVar299);
                  auVar300._8_4_ = 0xbdfe5d4f;
                  auVar300._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar300._12_4_ = 0xbdfe5d4f;
                  auVar122 = vfmadd213ps_fma(auVar122,auVar196,auVar300);
                  auVar301._8_4_ = 0x3e11e9bf;
                  auVar301._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar301._12_4_ = 0x3e11e9bf;
                  auVar122 = vfmadd213ps_fma(auVar122,auVar196,auVar301);
                  auVar302._8_4_ = 0xbe2aae50;
                  auVar302._0_8_ = 0xbe2aae50be2aae50;
                  auVar302._12_4_ = 0xbe2aae50;
                  auVar122 = vfmadd213ps_fma(auVar122,auVar196,auVar302);
                  auVar303._8_4_ = 0x3e4cceac;
                  auVar303._0_8_ = 0x3e4cceac3e4cceac;
                  auVar303._12_4_ = 0x3e4cceac;
                  auVar122 = vfmadd213ps_fma(auVar122,auVar196,auVar303);
                  auVar304._8_4_ = 0xbe7ffffc;
                  auVar304._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar304._12_4_ = 0xbe7ffffc;
                  auVar122 = vfmadd213ps_fma(auVar122,auVar196,auVar304);
                  auVar305._8_4_ = 0x3eaaaaaa;
                  auVar305._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar305._12_4_ = 0x3eaaaaaa;
                  auVar122 = vfmadd213ps_fma(auVar122,auVar196,auVar305);
                  auVar306._0_4_ = auVar122._0_4_ * auVar403._0_4_ * auVar196._0_4_;
                  auVar306._4_4_ = auVar122._4_4_ * auVar403._4_4_ * auVar196._4_4_;
                  auVar306._8_4_ = auVar122._8_4_ * auVar403._8_4_ * auVar196._8_4_;
                  auVar306._12_4_ = auVar122._12_4_ * auVar403._12_4_ * auVar196._12_4_;
                  auVar427._8_4_ = 0xb95e8083;
                  auVar427._0_8_ = 0xb95e8083b95e8083;
                  auVar427._12_4_ = 0xb95e8083;
                  auVar122 = vfmadd231ps_fma(auVar306,auVar392,auVar427);
                  auVar415 = vfmsub231ps_fma(auVar122,auVar334,auVar403);
                  auVar384 = ZEXT1664(auVar105);
                  auVar400 = ZEXT1664(auVar256);
                  auVar413 = ZEXT1664(auVar106);
                  auVar460 = ZEXT1664(auVar277);
                  auVar103 = ZEXT1664(auVar255);
                  auVar377 = ZEXT1664(auVar387);
                  auVar31._12_4_ = 0;
                  auVar31._0_12_ = ZEXT412(0);
                  auVar171 = ZEXT1264(ZEXT412(0)) << 0x20;
                  auVar122 = vcmpps_avx(auVar172,auVar31 << 0x20,2);
                  auVar415 = vsubps_avx(auVar415,auVar196);
                  auVar392 = vfnmadd231ps_fma(auVar415,auVar387,auVar392);
                  auVar197._0_4_ = auVar392._0_4_ + auVar392._0_4_;
                  auVar197._4_4_ = auVar392._4_4_ + auVar392._4_4_;
                  auVar197._8_4_ = auVar392._8_4_ + auVar392._8_4_;
                  auVar197._12_4_ = auVar392._12_4_ + auVar392._12_4_;
                  auVar307._8_4_ = 0x7fffffff;
                  auVar307._0_8_ = 0x7fffffff7fffffff;
                  auVar307._12_4_ = 0x7fffffff;
                  auVar122 = vblendvps_avx(auVar197,auVar307,auVar122);
                  auVar122 = vminps_avx(auVar297,auVar122);
                  auVar392 = vmaxps_avx(auVar105,auVar122);
                  auVar122 = vfmadd213ps_fma(auVar256,auVar392,auVar334);
                  auVar308._0_4_ = (int)auVar122._0_4_;
                  auVar308._4_4_ = (int)auVar122._4_4_;
                  auVar308._8_4_ = (int)auVar122._8_4_;
                  auVar308._12_4_ = (int)auVar122._12_4_;
                  auVar105 = vcvtdq2ps_avx(auVar308);
                  auVar122 = vcmpps_avx(auVar122,auVar105,1);
                  auVar122 = vandps_avx(auVar122,auVar414);
                  auVar122 = vsubps_avx(auVar105,auVar122);
                  auVar387 = vfmsub231ps_fma(auVar392,auVar122,auVar387);
                  auVar309._8_4_ = 0xb95e8083;
                  auVar309._0_8_ = 0xb95e8083b95e8083;
                  auVar309._12_4_ = 0xb95e8083;
                  auVar387 = vfnmsub231ps_fma(auVar387,auVar122,auVar309);
                  auVar310._0_4_ = auVar387._0_4_ * auVar387._0_4_;
                  auVar310._4_4_ = auVar387._4_4_ * auVar387._4_4_;
                  auVar310._8_4_ = auVar387._8_4_ * auVar387._8_4_;
                  auVar310._12_4_ = auVar387._12_4_ * auVar387._12_4_;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar387,auVar106);
                  auVar255 = vfmadd213ps_fma(auVar255,auVar387,auVar277);
                  auVar372._8_4_ = 0x3d2aa9c1;
                  auVar372._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar372._12_4_ = 0x3d2aa9c1;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar387,auVar372);
                  auVar332 = ZEXT1664(auVar414);
                  auVar88._8_4_ = 0x3e2aaaaa;
                  auVar88._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar88._12_4_ = 0x3e2aaaaa;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar387,auVar88);
                  auVar255 = vfmadd213ps_fma(auVar255,auVar387,auVar334);
                  auVar255 = vfmadd213ps_fma(auVar255,auVar310,auVar387);
                  auVar311._0_4_ = auVar255._0_4_ + fVar81;
                  auVar311._4_4_ = auVar255._4_4_ + fVar80;
                  auVar311._8_4_ = auVar255._8_4_ + fVar2;
                  auVar311._12_4_ = auVar255._12_4_ + fVar253;
                  auVar123._0_4_ = (int)auVar122._0_4_;
                  auVar123._4_4_ = (int)auVar122._4_4_;
                  auVar123._8_4_ = (int)auVar122._8_4_;
                  auVar123._12_4_ = (int)auVar122._12_4_;
                  auVar255 = vpslld_avx(auVar123,0x17);
                  auVar255 = vpaddd_avx(auVar255,auVar414);
                  auVar414 = vfmadd213ps_fma(auVar255,auVar311,auVar414);
                  auVar255 = vrcpps_avx(auVar414);
                  auVar312._0_4_ = auVar255._0_4_ + auVar255._0_4_;
                  auVar312._4_4_ = auVar255._4_4_ + auVar255._4_4_;
                  auVar312._8_4_ = auVar255._8_4_ + auVar255._8_4_;
                  auVar312._12_4_ = auVar255._12_4_ + auVar255._12_4_;
                  auVar89._8_4_ = 0x40000000;
                  auVar89._0_8_ = 0x4000000040000000;
                  auVar89._12_4_ = 0x40000000;
                  auVar414 = vfmsub213ps_fma(auVar414,auVar312,auVar89);
                  auVar255 = vfnmadd213ps_fma(auVar414,auVar255,auVar312);
                  auVar128 = vfmsub213ps_fma(auVar255,auVar113,auVar113);
                  break;
                case 6:
                  uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                  auVar127._4_4_ = uVar82;
                  auVar127._0_4_ = uVar82;
                  auVar127._8_4_ = uVar82;
                  auVar127._12_4_ = uVar82;
                  uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                  auVar200._4_4_ = uVar82;
                  auVar200._0_4_ = uVar82;
                  auVar200._8_4_ = uVar82;
                  auVar200._12_4_ = uVar82;
                  auVar113 = vfmadd231ps_fma(auVar200,auVar113,auVar127);
                  auVar113 = vmaxps_avx(auVar122,auVar113);
                  auVar113 = vminps_avx(auVar113,auVar414);
                  auVar128._0_4_ = auVar468._0_4_ * auVar113._0_4_;
                  auVar128._4_4_ = auVar468._4_4_ * auVar113._4_4_;
                  auVar128._8_4_ = auVar468._8_4_ * auVar113._8_4_;
                  auVar128._12_4_ = auVar468._12_4_ * auVar113._12_4_;
                }
                auVar113 = auVar128;
              }
              *(undefined1 (*) [16])local_220 = auVar113;
              local_220 = local_220 + 2;
              iVar45 = iVar45 + 1;
            }
          }
        }
      }
      if (((int)local_160 == 1) && (_elempack == 4)) {
        p_Var56 = local_150[-3];
        uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
        uVar8 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
        iVar78 = *(int *)(&this->field_0xdc + (long)p_Var56);
        iVar79 = *(int *)(&this->field_0xe0 + (long)p_Var56);
        iVar57 = *(int *)(&this->field_0xe4 + (long)p_Var56);
        iVar52 = *(int *)(&this->field_0xe8 + (long)p_Var56);
        iVar58 = *(int *)(&this->field_0x114 + (long)p_Var56);
        lVar61 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
        uVar60 = 0;
        uVar54 = 0;
        if (0 < (int)uVar7) {
          uVar54 = (ulong)uVar7;
        }
        uVar74 = 0;
        if (0 < (int)uVar8) {
          uVar74 = (ulong)uVar8;
        }
        uVar64 = (ulong)(uint)local_1a8.c;
        if (local_1a8.c < 1) {
          uVar64 = uVar60;
        }
        auVar332 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar103 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar464._8_4_ = 0xc2b0c0a5;
        auVar464._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar464._12_4_ = 0xc2b0c0a5;
        auVar477._8_4_ = 0x3ab743ce;
        auVar477._0_8_ = 0x3ab743ce3ab743ce;
        auVar477._12_4_ = 0x3ab743ce;
        for (; uVar60 != uVar64; uVar60 = uVar60 + 1) {
          local_220 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * uVar60 * local_1a8.elemsize);
          iVar69 = bottom_blob->w;
          iVar76 = bottom_blob->h;
          uVar48 = 0;
          uVar53 = bottom_blob->c;
          if (bottom_blob->c < 1) {
            uVar53 = uVar48;
          }
          uVar59 = local_1a8.w;
          if (local_1a8.w < 1) {
            uVar59 = 0;
          }
          uVar63 = local_1a8.h;
          if (local_1a8.h < 1) {
            uVar63 = 0;
          }
          for (; uVar48 != uVar63; uVar48 = uVar48 + 1) {
            iVar45 = (1 - uVar7) * iVar78;
            for (uVar67 = 0; uVar67 != uVar59; uVar67 = uVar67 + 1) {
              if (lVar61 == 0) {
                auVar113 = ZEXT816(0) << 0x40;
              }
              else {
                auVar113 = *(undefined1 (*) [16])(lVar61 + uVar60 * 0x10);
              }
              auVar377 = ZEXT1664(auVar113);
              pvVar71 = (void *)((this->weight_data_tm).cstep * uVar60 *
                                 (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data
                                );
              for (uVar55 = 0; uVar55 != uVar53; uVar55 = uVar55 + 1) {
                pvVar66 = pvVar71;
                for (uVar68 = 0; uVar68 != uVar74; uVar68 = uVar68 + 1) {
                  iVar42 = (((int)uVar68 - uVar8) + 1) * iVar79 + uVar48;
                  if (((-1 < iVar42) && (iVar43 = iVar42 / iVar52, iVar42 % iVar52 == 0)) &&
                     (iVar43 < iVar76)) {
                    iVar42 = iVar45;
                    for (lVar49 = 0; uVar54 * 0x10 != lVar49; lVar49 = lVar49 + 0x10) {
                      if (((-1 < iVar42) && (iVar44 = iVar42 / iVar57, iVar42 % iVar57 == 0)) &&
                         (iVar44 < iVar69)) {
                        uVar82 = *(undefined4 *)
                                  ((long)bottom_blob->data +
                                  (long)iVar44 * 4 +
                                  (long)iVar43 * (long)bottom_blob->w * bottom_blob->elemsize +
                                  bottom_blob->cstep * bottom_blob->elemsize * uVar55);
                        auVar129._4_4_ = uVar82;
                        auVar129._0_4_ = uVar82;
                        auVar129._8_4_ = uVar82;
                        auVar129._12_4_ = uVar82;
                        auVar113 = vfmadd231ps_fma(auVar377._0_16_,auVar129,
                                                   *(undefined1 (*) [16])((long)pvVar66 + lVar49));
                        auVar377 = ZEXT1664(auVar113);
                      }
                      iVar42 = iVar42 + iVar78;
                    }
                  }
                  pvVar66 = (void *)((long)pvVar66 + (long)(int)uVar7 * 0x10);
                }
                pvVar71 = (void *)((long)pvVar71 + (long)(int)(uVar7 * uVar8 * 4) * 4);
              }
              auVar113 = auVar377._0_16_;
              auVar136 = auVar113;
              if (iVar58 - 1U < 6) {
                auVar136 = vmaxps_avx(auVar113,_DAT_004eb480);
                auVar255 = auVar103._0_16_;
                auVar414 = auVar332._0_16_;
                switch(iVar58) {
                case 2:
                  auVar113 = vminps_avx(auVar113,_DAT_004eb480);
                  uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                  auVar394._4_4_ = uVar82;
                  auVar394._0_4_ = uVar82;
                  auVar394._8_4_ = uVar82;
                  auVar394._12_4_ = uVar82;
                  auVar136 = vfmadd231ps_fma(auVar136,auVar113,auVar394);
                  break;
                case 3:
                  uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                  auVar132._4_4_ = uVar82;
                  auVar132._0_4_ = uVar82;
                  auVar132._8_4_ = uVar82;
                  auVar132._12_4_ = uVar82;
                  uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                  auVar396._4_4_ = uVar82;
                  auVar396._0_4_ = uVar82;
                  auVar396._8_4_ = uVar82;
                  auVar396._12_4_ = uVar82;
                  auVar113 = vmaxps_avx(auVar113,auVar132);
                  auVar136 = vminps_avx(auVar396,auVar113);
                  break;
                case 4:
                  auVar133._0_8_ = auVar377._0_8_ ^ 0x8000000080000000;
                  auVar133._8_4_ = -auVar377._8_4_;
                  auVar133._12_4_ = -auVar377._12_4_;
                  auVar206._8_4_ = 0x42b0c0a5;
                  auVar206._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar206._12_4_ = 0x42b0c0a5;
                  auVar113 = vminps_avx(auVar133,auVar206);
                  auVar207._8_4_ = 0xc2b0c0a5;
                  auVar207._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar207._12_4_ = 0xc2b0c0a5;
                  auVar122 = vmaxps_avx(auVar113,auVar207);
                  auVar397._8_4_ = 0x3fb8aa3b;
                  auVar397._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar397._12_4_ = 0x3fb8aa3b;
                  auVar113 = vfmadd213ps_fma(auVar397,auVar122,auVar414);
                  auVar491._0_4_ = (int)auVar113._0_4_;
                  auVar491._4_4_ = (int)auVar113._4_4_;
                  auVar491._8_4_ = (int)auVar113._8_4_;
                  auVar491._12_4_ = (int)auVar113._12_4_;
                  auVar387 = vcvtdq2ps_avx(auVar491);
                  auVar113 = vcmpps_avx(auVar113,auVar387,1);
                  auVar113 = vandps_avx(auVar113,auVar255);
                  auVar113 = vsubps_avx(auVar387,auVar113);
                  auVar208._8_4_ = 0x3f318000;
                  auVar208._0_8_ = 0x3f3180003f318000;
                  auVar208._12_4_ = 0x3f318000;
                  auVar387 = vfmsub231ps_fma(auVar122,auVar113,auVar208);
                  auVar209._8_4_ = 0x395e8083;
                  auVar209._0_8_ = 0x395e8083395e8083;
                  auVar209._12_4_ = 0x395e8083;
                  auVar122 = vfmsub231ps_fma(auVar387,auVar113,auVar209);
                  auVar492._0_4_ = auVar122._0_4_ * auVar122._0_4_;
                  auVar492._4_4_ = auVar122._4_4_ * auVar122._4_4_;
                  auVar492._8_4_ = auVar122._8_4_ * auVar122._8_4_;
                  auVar492._12_4_ = auVar122._12_4_ * auVar122._12_4_;
                  auVar433._8_4_ = 0x39506967;
                  auVar433._0_8_ = 0x3950696739506967;
                  auVar433._12_4_ = 0x39506967;
                  auVar210._8_4_ = 0x3ab743ce;
                  auVar210._0_8_ = 0x3ab743ce3ab743ce;
                  auVar210._12_4_ = 0x3ab743ce;
                  auVar387 = vfmadd213ps_fma(auVar433,auVar122,auVar210);
                  auVar211._8_4_ = 0x3c088908;
                  auVar211._0_8_ = 0x3c0889083c088908;
                  auVar211._12_4_ = 0x3c088908;
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar211);
                  auVar212._8_4_ = 0x3d2aa9c1;
                  auVar212._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar212._12_4_ = 0x3d2aa9c1;
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar212);
                  auVar213._8_4_ = 0x3e2aaaaa;
                  auVar213._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar213._12_4_ = 0x3e2aaaaa;
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar213);
                  auVar414 = vfmadd213ps_fma(auVar387,auVar122,auVar414);
                  auVar414 = vfmadd213ps_fma(auVar414,auVar492,auVar122);
                  auVar434._0_4_ = auVar414._0_4_ + auVar103._0_4_;
                  auVar434._4_4_ = auVar414._4_4_ + auVar103._4_4_;
                  auVar434._8_4_ = auVar414._8_4_ + auVar103._8_4_;
                  auVar434._12_4_ = auVar414._12_4_ + auVar103._12_4_;
                  auVar134._0_4_ = (int)auVar113._0_4_;
                  auVar134._4_4_ = (int)auVar113._4_4_;
                  auVar134._8_4_ = (int)auVar113._8_4_;
                  auVar134._12_4_ = (int)auVar113._12_4_;
                  auVar113 = vpslld_avx(auVar134,0x17);
                  auVar113 = vpaddd_avx(auVar113,auVar255);
                  auVar414 = vfmadd213ps_fma(auVar113,auVar434,auVar255);
                  auVar113 = vrcpps_avx(auVar414);
                  auVar255 = vfmsub213ps_fma(auVar414,auVar113,auVar255);
                  auVar136 = vfnmadd132ps_fma(auVar255,auVar113,auVar113);
                  break;
                case 5:
                  auVar446._8_4_ = 0x42b0c0a5;
                  auVar446._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar446._12_4_ = 0x42b0c0a5;
                  auVar387 = vminps_avx(auVar113,auVar446);
                  auVar105 = vmaxps_avx(auVar464,auVar387);
                  auVar470._8_4_ = 0x3fb8aa3b;
                  auVar470._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar470._12_4_ = 0x3fb8aa3b;
                  auVar387 = vfmadd213ps_fma(auVar470,auVar105,auVar414);
                  auVar429._0_4_ = (int)auVar387._0_4_;
                  auVar429._4_4_ = (int)auVar387._4_4_;
                  auVar429._8_4_ = (int)auVar387._8_4_;
                  auVar429._12_4_ = (int)auVar387._12_4_;
                  auVar122 = vcvtdq2ps_avx(auVar429);
                  auVar387 = vcmpps_avx(auVar387,auVar122,1);
                  auVar387 = vandps_avx(auVar387,auVar255);
                  auVar387 = vsubps_avx(auVar122,auVar387);
                  auVar92._8_4_ = 0x3f318000;
                  auVar92._0_8_ = 0x3f3180003f318000;
                  auVar92._12_4_ = 0x3f318000;
                  auVar122 = vfmsub231ps_fma(auVar105,auVar387,auVar92);
                  auVar201._8_4_ = 0xb95e8083;
                  auVar201._0_8_ = 0xb95e8083b95e8083;
                  auVar201._12_4_ = 0xb95e8083;
                  auVar105 = vfnmsub231ps_fma(auVar122,auVar387,auVar201);
                  auVar430._0_4_ = auVar105._0_4_ * auVar105._0_4_;
                  auVar430._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                  auVar430._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                  auVar430._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                  auVar447._8_4_ = 0x39506967;
                  auVar447._0_8_ = 0x3950696739506967;
                  auVar447._12_4_ = 0x39506967;
                  auVar122 = vfmadd213ps_fma(auVar447,auVar105,auVar477);
                  auVar258._8_4_ = 0x3c088908;
                  auVar258._0_8_ = 0x3c0889083c088908;
                  auVar258._12_4_ = 0x3c088908;
                  auVar122 = vfmadd213ps_fma(auVar122,auVar105,auVar258);
                  auVar373._8_4_ = 0x3d2aa9c1;
                  auVar373._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar373._12_4_ = 0x3d2aa9c1;
                  auVar122 = vfmadd213ps_fma(auVar122,auVar105,auVar373);
                  auVar313._8_4_ = 0x3e2aaaaa;
                  auVar313._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar313._12_4_ = 0x3e2aaaaa;
                  auVar122 = vfmadd213ps_fma(auVar122,auVar105,auVar313);
                  auVar122 = vfmadd213ps_fma(auVar122,auVar105,auVar414);
                  auVar122 = vfmadd213ps_fma(auVar122,auVar430,auVar105);
                  auVar202._0_4_ = auVar122._0_4_ + auVar103._0_4_;
                  auVar202._4_4_ = auVar122._4_4_ + auVar103._4_4_;
                  auVar202._8_4_ = auVar122._8_4_ + auVar103._8_4_;
                  auVar202._12_4_ = auVar122._12_4_ + auVar103._12_4_;
                  auVar130._0_4_ = (int)auVar387._0_4_;
                  auVar130._4_4_ = (int)auVar387._4_4_;
                  auVar130._8_4_ = (int)auVar387._8_4_;
                  auVar130._12_4_ = (int)auVar387._12_4_;
                  auVar387 = vpslld_avx(auVar130,0x17);
                  auVar387 = vpaddd_avx(auVar387,auVar255);
                  auVar106 = vfmadd213ps_fma(auVar387,auVar202,auVar255);
                  auVar203._8_4_ = 0x800000;
                  auVar203._0_8_ = 0x80000000800000;
                  auVar203._12_4_ = 0x800000;
                  auVar387 = vmaxps_avx(auVar106,auVar203);
                  auVar122 = vpsrld_avx(auVar387,0x17);
                  auVar314._8_4_ = 0xffffff82;
                  auVar314._0_8_ = 0xffffff82ffffff82;
                  auVar314._12_4_ = 0xffffff82;
                  auVar122 = vpaddd_avx(auVar122,auVar314);
                  auVar315._8_4_ = 0x807fffff;
                  auVar315._0_8_ = 0x807fffff807fffff;
                  auVar315._12_4_ = 0x807fffff;
                  auVar387 = vandps_avx(auVar387,auVar315);
                  auVar256 = vorps_avx(auVar387,auVar414);
                  auVar105 = vcvtdq2ps_avx(auVar122);
                  auVar316._8_4_ = 0x3f3504f3;
                  auVar316._0_8_ = 0x3f3504f33f3504f3;
                  auVar316._12_4_ = 0x3f3504f3;
                  auVar122 = vcmpps_avx(auVar256,auVar316,1);
                  auVar387 = vandps_avx(auVar122,auVar256);
                  auVar204._0_4_ = auVar256._0_4_ + -1.0 + auVar387._0_4_;
                  auVar204._4_4_ = auVar256._4_4_ + -1.0 + auVar387._4_4_;
                  auVar204._8_4_ = auVar256._8_4_ + -1.0 + auVar387._8_4_;
                  auVar204._12_4_ = auVar256._12_4_ + -1.0 + auVar387._12_4_;
                  auVar255 = vandps_avx(auVar122,auVar255);
                  auVar387 = vsubps_avx(auVar105,auVar255);
                  auVar395._0_4_ = auVar204._0_4_ * auVar204._0_4_;
                  auVar395._4_4_ = auVar204._4_4_ * auVar204._4_4_;
                  auVar395._8_4_ = auVar204._8_4_ * auVar204._8_4_;
                  auVar395._12_4_ = auVar204._12_4_ * auVar204._12_4_;
                  auVar431._8_4_ = 0x3d9021bb;
                  auVar431._0_8_ = 0x3d9021bb3d9021bb;
                  auVar431._12_4_ = 0x3d9021bb;
                  auVar335._8_4_ = 0xbdebd1b8;
                  auVar335._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar335._12_4_ = 0xbdebd1b8;
                  auVar255 = vfmadd213ps_fma(auVar431,auVar204,auVar335);
                  auVar336._8_4_ = 0x3def251a;
                  auVar336._0_8_ = 0x3def251a3def251a;
                  auVar336._12_4_ = 0x3def251a;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar204,auVar336);
                  auVar337._8_4_ = 0xbdfe5d4f;
                  auVar337._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar337._12_4_ = 0xbdfe5d4f;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar204,auVar337);
                  auVar338._8_4_ = 0x3e11e9bf;
                  auVar338._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar338._12_4_ = 0x3e11e9bf;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar204,auVar338);
                  auVar339._8_4_ = 0xbe2aae50;
                  auVar339._0_8_ = 0xbe2aae50be2aae50;
                  auVar339._12_4_ = 0xbe2aae50;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar204,auVar339);
                  auVar340._8_4_ = 0x3e4cceac;
                  auVar340._0_8_ = 0x3e4cceac3e4cceac;
                  auVar340._12_4_ = 0x3e4cceac;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar204,auVar340);
                  auVar341._8_4_ = 0xbe7ffffc;
                  auVar341._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar341._12_4_ = 0xbe7ffffc;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar204,auVar341);
                  auVar342._8_4_ = 0x3eaaaaaa;
                  auVar342._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar342._12_4_ = 0x3eaaaaaa;
                  auVar255 = vfmadd213ps_fma(auVar255,auVar204,auVar342);
                  auVar404._0_4_ = auVar395._0_4_ * auVar204._0_4_ * auVar255._0_4_;
                  auVar404._4_4_ = auVar395._4_4_ * auVar204._4_4_ * auVar255._4_4_;
                  auVar404._8_4_ = auVar395._8_4_ * auVar204._8_4_ * auVar255._8_4_;
                  auVar404._12_4_ = auVar395._12_4_ * auVar204._12_4_ * auVar255._12_4_;
                  auVar432._8_4_ = 0xb95e8083;
                  auVar432._0_8_ = 0xb95e8083b95e8083;
                  auVar432._12_4_ = 0xb95e8083;
                  auVar255 = vfmadd231ps_fma(auVar404,auVar387,auVar432);
                  auVar122 = vfmsub231ps_fma(auVar255,auVar414,auVar395);
                  auVar255 = vcmpps_avx(auVar106,ZEXT816(0) << 0x20,2);
                  auVar122 = vsubps_avx(auVar122,auVar204);
                  auVar448._8_4_ = 0x42b0c0a5;
                  auVar448._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar448._12_4_ = 0x42b0c0a5;
                  auVar374._8_4_ = 0x3f800000;
                  auVar374._0_8_ = 0x3f8000003f800000;
                  auVar374._12_4_ = 0x3f800000;
                  auVar387 = vfnmadd231ps_fma(auVar122,auVar92,auVar387);
                  auVar205._0_4_ = auVar387._0_4_ + auVar387._0_4_;
                  auVar205._4_4_ = auVar387._4_4_ + auVar387._4_4_;
                  auVar205._8_4_ = auVar387._8_4_ + auVar387._8_4_;
                  auVar205._12_4_ = auVar387._12_4_ + auVar387._12_4_;
                  auVar317._8_4_ = 0x7fffffff;
                  auVar317._0_8_ = 0x7fffffff7fffffff;
                  auVar317._12_4_ = 0x7fffffff;
                  auVar255 = vblendvps_avx(auVar205,auVar317,auVar255);
                  auVar255 = vminps_avx(auVar448,auVar255);
                  auVar122 = vmaxps_avx(auVar464,auVar255);
                  auVar255 = vfmadd213ps_fma(auVar470,auVar122,auVar414);
                  auVar318._0_4_ = (int)auVar255._0_4_;
                  auVar318._4_4_ = (int)auVar255._4_4_;
                  auVar318._8_4_ = (int)auVar255._8_4_;
                  auVar318._12_4_ = (int)auVar255._12_4_;
                  auVar387 = vcvtdq2ps_avx(auVar318);
                  auVar255 = vcmpps_avx(auVar255,auVar387,1);
                  auVar255 = vandps_avx(auVar255,auVar374);
                  auVar255 = vsubps_avx(auVar387,auVar255);
                  auVar387 = vfmsub231ps_fma(auVar122,auVar255,auVar92);
                  auVar93._8_4_ = 0xb95e8083;
                  auVar93._0_8_ = 0xb95e8083b95e8083;
                  auVar93._12_4_ = 0xb95e8083;
                  auVar122 = vfnmsub231ps_fma(auVar387,auVar255,auVar93);
                  auVar319._0_4_ = auVar122._0_4_ * auVar122._0_4_;
                  auVar319._4_4_ = auVar122._4_4_ * auVar122._4_4_;
                  auVar319._8_4_ = auVar122._8_4_ * auVar122._8_4_;
                  auVar319._12_4_ = auVar122._12_4_ * auVar122._12_4_;
                  auVar387 = vfmadd213ps_fma(auVar447,auVar122,auVar477);
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar258);
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar373);
                  auVar94._8_4_ = 0x3e2aaaaa;
                  auVar94._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar94._12_4_ = 0x3e2aaaaa;
                  auVar387 = vfmadd213ps_fma(auVar387,auVar122,auVar94);
                  auVar332 = ZEXT1664(auVar414);
                  auVar414 = vfmadd213ps_fma(auVar387,auVar122,auVar414);
                  auVar414 = vfmadd213ps_fma(auVar414,auVar319,auVar122);
                  auVar320._0_4_ = auVar414._0_4_ + 1.0;
                  auVar320._4_4_ = auVar414._4_4_ + 1.0;
                  auVar320._8_4_ = auVar414._8_4_ + 1.0;
                  auVar320._12_4_ = auVar414._12_4_ + 1.0;
                  auVar131._0_4_ = (int)auVar255._0_4_;
                  auVar131._4_4_ = (int)auVar255._4_4_;
                  auVar131._8_4_ = (int)auVar255._8_4_;
                  auVar131._12_4_ = (int)auVar255._12_4_;
                  auVar255 = vpslld_avx(auVar131,0x17);
                  auVar255 = vpaddd_avx(auVar255,auVar374);
                  auVar103 = ZEXT1664(auVar374);
                  auVar414 = vfmadd213ps_fma(auVar255,auVar320,auVar374);
                  auVar255 = vrcpps_avx(auVar414);
                  auVar321._0_4_ = auVar255._0_4_ + auVar255._0_4_;
                  auVar321._4_4_ = auVar255._4_4_ + auVar255._4_4_;
                  auVar321._8_4_ = auVar255._8_4_ + auVar255._8_4_;
                  auVar321._12_4_ = auVar255._12_4_ + auVar255._12_4_;
                  auVar259._8_4_ = 0x40000000;
                  auVar259._0_8_ = 0x4000000040000000;
                  auVar259._12_4_ = 0x40000000;
                  auVar414 = vfmsub213ps_fma(auVar414,auVar321,auVar259);
                  auVar255 = vfnmadd213ps_fma(auVar414,auVar255,auVar321);
                  auVar136 = vfmsub213ps_fma(auVar255,auVar113,auVar113);
                  break;
                case 6:
                  uVar82 = **(undefined4 **)(&this->field_0x118 + (long)p_Var56);
                  auVar135._4_4_ = uVar82;
                  auVar135._0_4_ = uVar82;
                  auVar135._8_4_ = uVar82;
                  auVar135._12_4_ = uVar82;
                  uVar82 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var56))[1];
                  auVar214._4_4_ = uVar82;
                  auVar214._0_4_ = uVar82;
                  auVar214._8_4_ = uVar82;
                  auVar214._12_4_ = uVar82;
                  auVar113 = vfmadd231ps_fma(auVar214,auVar113,auVar135);
                  auVar113 = vmaxps_avx(auVar113,_DAT_004eb480);
                  auVar113 = vminps_avx(auVar113,auVar255);
                  auVar136._0_4_ = auVar377._0_4_ * auVar113._0_4_;
                  auVar136._4_4_ = auVar377._4_4_ * auVar113._4_4_;
                  auVar136._8_4_ = auVar377._8_4_ * auVar113._8_4_;
                  auVar136._12_4_ = auVar377._12_4_ * auVar113._12_4_;
                }
              }
              *(undefined1 (*) [16])local_220 = auVar136;
              local_220 = local_220 + 2;
              iVar45 = iVar45 + 1;
            }
          }
        }
      }
      if (((int)local_160 == 4) && (_elempack == 1)) {
        p_Var56 = local_150[-3];
        uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var56);
        uVar8 = *(uint *)(&this->field_0xd8 + (long)p_Var56);
        iVar78 = *(int *)(&this->field_0xdc + (long)p_Var56);
        iVar79 = *(int *)(&this->field_0x114 + (long)p_Var56);
        local_128 = local_1a8.elemsize * local_1a8.cstep;
        uVar60 = 0;
        uVar54 = 0;
        if (0 < (int)uVar7) {
          uVar54 = (ulong)uVar7;
        }
        uVar74 = 0;
        if (0 < (int)uVar8) {
          uVar74 = (ulong)uVar8;
        }
        uVar64 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar64 = uVar60;
        }
        uVar53 = local_1a8.w;
        if (local_1a8.w < 1) {
          uVar53 = 0;
        }
        uVar48 = local_1a8.h;
        if (local_1a8.h < 1) {
          uVar48 = 0;
        }
        local_120 = (ulong)(uint)local_1a8.c;
        if (local_1a8.c < 1) {
          local_120 = uVar60;
        }
        iVar57 = *(int *)(&this->field_0xe0 + (long)p_Var56);
        iVar52 = *(int *)(&this->field_0xe4 + (long)p_Var56);
        iVar58 = *(int *)(&this->field_0xe8 + (long)p_Var56);
        lVar61 = *(long *)(&this->field_0x1a8 + (long)p_Var56);
        local_130 = (Allocator *)local_1a8.data;
        iVar69 = bottom_blob->w;
        iVar76 = bottom_blob->h;
        for (; uVar60 != local_120; uVar60 = uVar60 + 1) {
          local_1f0 = (Allocator *)((long)&local_130->_vptr_Allocator + local_128 * uVar60);
          for (uVar59 = 0; uVar59 != uVar48; uVar59 = uVar59 + 1) {
            pfVar70 = *(float **)(&this->field_0x118 + (long)p_Var56);
            sVar11 = (this->weight_data_tm).cstep;
            sVar12 = (this->weight_data_tm).elemsize;
            pvVar71 = (this->weight_data_tm).data;
            iVar45 = (1 - uVar7) * iVar78;
            for (uVar63 = 0; uVar63 != uVar53; uVar63 = uVar63 + 1) {
              if (lVar61 == 0) {
                fVar81 = 0.0;
              }
              else {
                fVar81 = *(float *)(lVar61 + uVar60 * 4);
              }
              auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
              pvVar66 = (void *)(sVar11 * uVar60 * sVar12 + (long)pvVar71);
              for (uVar55 = 0; uVar55 != uVar64; uVar55 = uVar55 + 1) {
                pvVar72 = pvVar66;
                for (uVar68 = 0; uVar68 != uVar74; uVar68 = uVar68 + 1) {
                  iVar42 = (((int)uVar68 - uVar8) + 1) * iVar57 + uVar59;
                  if (((-1 < iVar42) && (iVar43 = iVar42 / iVar58, iVar42 % iVar58 == 0)) &&
                     (iVar43 < iVar76)) {
                    iVar42 = iVar45;
                    for (lVar49 = 0; uVar54 * 0x10 != lVar49; lVar49 = lVar49 + 0x10) {
                      if (((-1 < iVar42) && (iVar44 = iVar42 / iVar52, iVar42 % iVar52 == 0)) &&
                         (iVar44 < iVar69)) {
                        auVar113 = vfmadd231ps_fma(auVar103._0_16_,
                                                   *(undefined1 (*) [16])
                                                    ((long)bottom_blob->data +
                                                    (long)(iVar44 << 2) * 4 +
                                                    (long)iVar43 *
                                                    (long)bottom_blob->w * bottom_blob->elemsize +
                                                    bottom_blob->cstep * bottom_blob->elemsize *
                                                    uVar55),*(undefined1 (*) [16])
                                                             ((long)pvVar72 + lVar49));
                        auVar103 = ZEXT1664(auVar113);
                      }
                      iVar42 = iVar42 + iVar78;
                    }
                  }
                  pvVar72 = (void *)((long)pvVar72 + (long)(int)uVar7 * 0x10);
                }
                pvVar66 = (void *)((long)pvVar66 + (long)(int)(uVar7 * uVar8 * 4) * 4);
              }
              auVar113 = vshufpd_avx(auVar103._0_16_,auVar103._0_16_,1);
              auVar137._0_4_ = auVar113._0_4_ + auVar103._0_4_;
              auVar137._4_4_ = auVar113._4_4_ + auVar103._4_4_;
              auVar137._8_4_ = auVar113._8_4_ + auVar103._8_4_;
              auVar137._12_4_ = auVar113._12_4_ + auVar103._12_4_;
              auVar113 = vmovshdup_avx(auVar137);
              fVar81 = auVar113._0_4_ + fVar81 + auVar137._0_4_;
              auVar113 = ZEXT416((uint)fVar81);
              fVar80 = fVar81;
              if (iVar79 - 1U < 6) {
                switch(iVar79) {
                case 1:
                  auVar113 = vmaxss_avx(ZEXT416((uint)fVar81),ZEXT416(0));
                  fVar80 = auVar113._0_4_;
                  break;
                case 2:
                  auVar95._0_12_ = ZEXT812(0);
                  auVar95._12_4_ = 0;
                  auVar113 = vcmpss_avx(auVar95,ZEXT416((uint)fVar81),1);
                  auVar216._8_4_ = 0x3f800000;
                  auVar216._0_8_ = 0x3f8000003f800000;
                  auVar216._12_4_ = 0x3f800000;
                  auVar113 = vblendvps_avx(ZEXT416((uint)*pfVar70),auVar216,auVar113);
                  fVar80 = auVar113._0_4_ * fVar81;
                  break;
                case 3:
                  auVar113 = vmaxss_avx(auVar113,ZEXT416((uint)*pfVar70));
                  fVar80 = auVar113._0_4_;
                  if (pfVar70[1] < auVar113._0_4_) {
                    fVar80 = pfVar70[1];
                  }
                  break;
                case 4:
                  auVar113 = vminss_avx(auVar113,ZEXT416(0x42b0c0a5));
                  auVar138._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
                  auVar138._8_4_ = auVar113._8_4_ ^ 0x80000000;
                  auVar138._12_4_ = auVar113._12_4_ ^ 0x80000000;
                  auVar113 = vcmpss_avx(auVar113,ZEXT416(0xc2b0c0a5),1);
                  auVar215._8_4_ = 0x42b0c0a5;
                  auVar215._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar215._12_4_ = 0x42b0c0a5;
                  auVar113 = vblendvps_avx(auVar138,auVar215,auVar113);
                  fVar81 = expf(auVar113._0_4_);
                  fVar80 = 1.0 / (fVar81 + 1.0);
                  break;
                case 5:
                  fVar80 = expf(fVar81);
                  fVar80 = logf(fVar80 + 1.0);
                  fVar80 = tanhf(fVar80);
                  fVar80 = fVar80 * fVar81;
                  break;
                case 6:
                  fVar2 = *pfVar70;
                  fVar253 = -pfVar70[1] / fVar2;
                  fVar80 = 0.0;
                  if ((fVar253 <= fVar81) && (fVar80 = fVar81, fVar81 <= fVar253 + 1.0 / fVar2)) {
                    auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar113,
                                               ZEXT416((uint)pfVar70[1]));
                    fVar80 = auVar113._0_4_ * fVar81;
                  }
                }
              }
              *(float *)&local_1f0->_vptr_Allocator = fVar80;
              local_1f0 = (Allocator *)((long)&local_1f0->_vptr_Allocator + 4);
              iVar45 = iVar45 + 1;
            }
          }
        }
      }
      pvVar71 = local_1a8.data;
      if (((int)local_160 == 1) && (_elempack == 1)) {
        pp_Var10 = this->_vptr_Deconvolution_x86_fma;
        lVar61 = local_1a8.cstep * local_1a8.elemsize;
        iVar78 = bottom_blob->w;
        iVar79 = bottom_blob->h;
        lVar49 = (long)local_1a8.w;
        uVar60 = 0;
        uVar54 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar54 = uVar60;
        }
        uVar74 = 0;
        if (0 < local_1a8.w) {
          uVar74 = (ulong)(uint)local_1a8.w;
        }
        uVar64 = (ulong)(uint)local_1a8.h;
        if (local_1a8.h < 1) {
          uVar64 = uVar60;
        }
        local_140 = local_140 << 2;
        for (; (long)uVar60 < (long)*(int *)(&this->field_0xd0 + (long)pp_Var10[-3]);
            uVar60 = uVar60 + 1) {
          local_1f8 = (Allocator *)((long)(_func_int ***)pvVar71 + lVar61 * uVar60);
          for (iVar57 = 0; iVar57 != (int)uVar64; iVar57 = iVar57 + 1) {
            pp_Var13 = this->_vptr_Deconvolution_x86_fma;
            sVar11 = (this->weight_data_tm).cstep;
            sVar12 = (this->weight_data_tm).elemsize;
            iVar52 = iVar57 - local_158;
            pvVar66 = (this->weight_data_tm).data;
            for (uVar55 = 0; uVar55 != uVar74; uVar55 = uVar55 + 1) {
              p_Var56 = pp_Var13[-3];
              if (*(int *)(&this->field_0x10c + (long)p_Var56) == 0) {
                auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              else {
                auVar103 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var56) +
                                            uVar60 * 4));
              }
              pvVar72 = (void *)(sVar11 * uVar60 * sVar12 + (long)pvVar66);
              for (uVar68 = 0; uVar68 != uVar54; uVar68 = uVar68 + 1) {
                p_Var14 = this->_vptr_Deconvolution_x86_fma[-3];
                iVar69 = 0;
                iVar58 = *(int *)(&this->field_0xd8 + (long)p_Var14);
                if (*(int *)(&this->field_0xd8 + (long)p_Var14) < 1) {
                  iVar58 = iVar69;
                }
                for (; iVar69 != iVar58; iVar69 = iVar69 + 1) {
                  iVar76 = *(int *)(&this->field_0xe0 + (long)p_Var14) * iVar69 + iVar52;
                  if (((-1 < iVar76) &&
                      (iVar45 = iVar76 / *(int *)(&this->field_0xe8 + (long)p_Var14),
                      iVar76 % *(int *)(&this->field_0xe8 + (long)p_Var14) == 0)) &&
                     (iVar45 < iVar79)) {
                    uVar7 = *(uint *)(&this->field_0xd4 + (long)p_Var14);
                    uVar65 = 0;
                    if (0 < (int)uVar7) {
                      uVar65 = (ulong)uVar7;
                    }
                    for (uVar62 = 0; uVar65 != uVar62; uVar62 = uVar62 + 1) {
                      iVar76 = *(int *)(&this->field_0xdc + (long)p_Var14) * (int)uVar62 +
                               ((int)uVar55 - local_154);
                      if (((-1 < iVar76) &&
                          (iVar42 = iVar76 / *(int *)(&this->field_0xe4 + (long)p_Var14),
                          iVar76 % *(int *)(&this->field_0xe4 + (long)p_Var14) == 0)) &&
                         (iVar42 < iVar78)) {
                        auVar113 = vfmadd231ss_fma(auVar103._0_16_,
                                                   ZEXT416(*(uint *)((long)pvVar72 +
                                                                    uVar62 * 4 +
                                                                    (long)(int)(uVar7 * iVar69) * 4)
                                                          ),ZEXT416(*(uint *)((long)bottom_blob->
                                                                                    data +
                                                                             (long)iVar42 * 4 +
                                                                             (long)iVar45 *
                                                                             (long)bottom_blob->w *
                                                                             bottom_blob->elemsize +
                                                                             bottom_blob->cstep *
                                                                             bottom_blob->elemsize *
                                                                             uVar68)));
                        auVar103 = ZEXT1664(auVar113);
                      }
                    }
                  }
                }
                pvVar72 = (void *)((long)pvVar72 + local_140);
              }
              auVar113 = auVar103._0_16_;
              fVar80 = auVar103._0_4_;
              fVar81 = fVar80;
              switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var56)) {
              case 1:
                auVar113 = vmaxss_avx(auVar113,ZEXT416(0));
                fVar81 = auVar113._0_4_;
                break;
              case 2:
                auVar113 = vcmpss_avx(ZEXT816(0) << 0x40,auVar113,1);
                auVar218._8_4_ = 0x3f800000;
                auVar218._0_8_ = 0x3f8000003f800000;
                auVar218._12_4_ = 0x3f800000;
                auVar113 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var56)),
                                         auVar218,auVar113);
                fVar81 = auVar113._0_4_ * fVar80;
                break;
              case 3:
                fVar80 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var56))[1];
                auVar113 = vmaxss_avx(auVar113,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                  (long)p_Var56)));
                fVar81 = auVar113._0_4_;
                if (fVar80 < auVar113._0_4_) {
                  fVar81 = fVar80;
                }
                break;
              case 4:
                auVar113 = vminss_avx(auVar113,ZEXT416(0x42b0c0a5));
                auVar139._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
                auVar139._8_4_ = auVar113._8_4_ ^ 0x80000000;
                auVar139._12_4_ = auVar113._12_4_ ^ 0x80000000;
                auVar113 = vcmpss_avx(auVar113,ZEXT416(0xc2b0c0a5),1);
                auVar217._8_4_ = 0x42b0c0a5;
                auVar217._0_8_ = 0x42b0c0a542b0c0a5;
                auVar217._12_4_ = 0x42b0c0a5;
                auVar113 = vblendvps_avx(auVar139,auVar217,auVar113);
                fVar81 = expf(auVar113._0_4_);
                fVar81 = 1.0 / (fVar81 + 1.0);
                break;
              case 5:
                fVar81 = expf(fVar80);
                fVar81 = logf(fVar81 + 1.0);
                fVar81 = tanhf(fVar81);
                fVar81 = fVar81 * fVar80;
                break;
              case 6:
                fVar2 = **(float **)(&this->field_0x118 + (long)p_Var56);
                fVar253 = (*(float **)(&this->field_0x118 + (long)p_Var56))[1];
                fVar254 = -fVar253 / fVar2;
                fVar81 = 0.0;
                if ((fVar254 <= fVar80) && (fVar81 = fVar80, fVar80 <= fVar254 + 1.0 / fVar2)) {
                  auVar113 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar113,ZEXT416((uint)fVar253));
                  fVar81 = auVar113._0_4_ * fVar80;
                }
              }
              *(float *)((long)&local_1f8->_vptr_Allocator + uVar55 * 4) = fVar81;
            }
            local_1f8 = (Allocator *)((long)&local_1f8->_vptr_Allocator + lVar49 * 4);
          }
        }
      }
    }
    pMVar41 = local_138;
    Deconvolution::cut_padding
              ((Deconvolution *)
               ((long)&this->_vptr_Deconvolution_x86_fma +
               (long)this->_vptr_Deconvolution_x86_fma[-3]),&local_1a8,local_138,local_148);
    if ((pMVar41->data == (void *)0x0) || (iVar57 = 0, (long)pMVar41->c * pMVar41->cstep == 0)) {
      iVar57 = -100;
    }
  }
  piVar9 = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        free(local_1a8.data);
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar57;
}

Assistant:

int Deconvolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}